

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersectorK<8,4>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [16];
  undefined1 (*pauVar10) [28];
  undefined1 (*pauVar11) [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Primitive PVar31;
  uint uVar32;
  uint uVar33;
  Geometry *pGVar34;
  __int_type_conflict _Var35;
  RTCFilterFunctionN p_Var36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [28];
  undefined1 auVar143 [12];
  undefined1 auVar144 [28];
  undefined1 auVar145 [28];
  uint uVar146;
  int iVar147;
  RTCIntersectArguments *pRVar148;
  ulong uVar149;
  uint uVar150;
  long lVar151;
  long lVar152;
  long lVar153;
  bool bVar154;
  long lVar155;
  ulong uVar156;
  long lVar157;
  undefined1 auVar159 [16];
  float fVar158;
  undefined1 auVar160 [16];
  float fVar173;
  float fVar175;
  float fVar180;
  float fVar181;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar177;
  undefined1 auVar164 [32];
  float fVar174;
  float fVar176;
  float fVar178;
  float fVar179;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar182;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [64];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar199;
  float fVar200;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar201;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar202;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar214;
  float fVar216;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar215;
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar213 [32];
  float fVar220;
  float fVar221;
  float fVar242;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar222;
  float fVar239;
  float fVar243;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar238;
  float fVar240;
  float fVar244;
  float fVar247;
  float fVar250;
  float fVar251;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar241;
  float fVar245;
  float fVar246;
  float fVar248;
  float fVar249;
  float fVar252;
  float fVar253;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [64];
  float fVar254;
  float fVar255;
  float fVar264;
  float fVar266;
  float fVar268;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar265;
  float fVar267;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  float fVar273;
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  float fVar274;
  float fVar285;
  float fVar287;
  undefined1 auVar276 [16];
  float fVar291;
  float fVar292;
  float fVar293;
  undefined1 auVar277 [32];
  float fVar275;
  float fVar286;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar294;
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  float fVar295;
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar296;
  float fVar297;
  undefined1 auVar298 [16];
  float fVar305;
  float fVar307;
  float fVar311;
  float fVar312;
  float fVar313;
  undefined1 auVar299 [32];
  float fVar309;
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  float fVar306;
  float fVar308;
  float fVar310;
  float fVar314;
  undefined1 auVar304 [32];
  undefined1 auVar315 [16];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar325 [16];
  undefined4 uVar324;
  float fVar332;
  float fVar334;
  float fVar335;
  float fVar336;
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  float fVar333;
  undefined1 auVar331 [32];
  float fVar345;
  float fVar346;
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  float fVar347;
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [64];
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar359;
  float fVar361;
  float fVar363;
  float fVar364;
  float fVar365;
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  float fVar360;
  float fVar362;
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [64];
  float fVar366;
  float fVar373;
  float fVar374;
  float fVar375;
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  float in_register_0000151c;
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  float fVar385;
  float fVar390;
  float fVar391;
  float fVar392;
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  float fVar393;
  float fVar394;
  float fVar398;
  float fVar400;
  float fVar402;
  float fVar404;
  float fVar405;
  float fVar406;
  float in_register_0000159c;
  undefined1 auVar395 [32];
  float fVar399;
  float fVar401;
  float fVar403;
  undefined1 auVar396 [32];
  undefined1 auVar397 [64];
  undefined1 auVar407 [16];
  float in_register_000015dc;
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  bool local_88d;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined8 local_860;
  undefined8 uStack_858;
  ulong local_848;
  float local_840;
  float fStack_83c;
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  undefined1 auStack_7f8 [8];
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  undefined8 uStack_778;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined1 auStack_750 [8];
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6d0 [8];
  undefined8 uStack_6c8;
  undefined8 *local_6c0;
  Precalculations *local_6b8;
  RTCFilterFunctionNArguments local_6b0;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [8];
  undefined8 uStack_658;
  undefined1 auStack_650 [8];
  float fStack_648;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [8];
  undefined8 uStack_5d8;
  undefined1 auStack_5d0 [16];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  LinearSpace3fa *local_570;
  Primitive *local_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  RTCHitN local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [8];
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  uint local_260;
  uint local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined1 local_200 [32];
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar189 [24];
  
  PVar31 = prim[1];
  uVar149 = (ulong)(byte)PVar31;
  lVar152 = uVar149 * 0x25;
  fVar221 = *(float *)(prim + lVar152 + 0x12);
  auVar204 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar204 = vinsertps_avx(auVar204,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar225 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar225 = vinsertps_avx(auVar225,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar204 = vsubps_avx(auVar204,*(undefined1 (*) [16])(prim + lVar152 + 6));
  auVar183._0_4_ = fVar221 * auVar204._0_4_;
  auVar183._4_4_ = fVar221 * auVar204._4_4_;
  auVar183._8_4_ = fVar221 * auVar204._8_4_;
  auVar183._12_4_ = fVar221 * auVar204._12_4_;
  auVar276._0_4_ = fVar221 * auVar225._0_4_;
  auVar276._4_4_ = fVar221 * auVar225._4_4_;
  auVar276._8_4_ = fVar221 * auVar225._8_4_;
  auVar276._12_4_ = fVar221 * auVar225._12_4_;
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar149 * 4 + 6)));
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar149 * 4 + 10)));
  auVar161._16_16_ = auVar225;
  auVar161._0_16_ = auVar204;
  lVar151 = uVar149 * 5;
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar151 + 6)));
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar151 + 10)));
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar210._16_16_ = auVar225;
  auVar210._0_16_ = auVar204;
  auVar37 = vcvtdq2ps_avx(auVar210);
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar149 * 6 + 6)));
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar149 * 6 + 10)));
  auVar228._16_16_ = auVar225;
  auVar228._0_16_ = auVar204;
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar149 * 0xf + 6)));
  auVar38 = vcvtdq2ps_avx(auVar228);
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar149 * 0xf + 10)));
  auVar229._16_16_ = auVar225;
  auVar229._0_16_ = auVar204;
  lVar157 = (ulong)(byte)PVar31 * 0x10;
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar157 + 6)));
  auVar282 = vcvtdq2ps_avx(auVar229);
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar157 + 10)));
  auVar299._16_16_ = auVar225;
  auVar299._0_16_ = auVar204;
  auVar39 = vcvtdq2ps_avx(auVar299);
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar157 + uVar149 + 6)));
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar157 + uVar149 + 10)));
  auVar316._16_16_ = auVar225;
  auVar316._0_16_ = auVar204;
  auVar40 = vcvtdq2ps_avx(auVar316);
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar149 * 0x1a + 6)));
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar149 * 0x1a + 10)));
  auVar326._16_16_ = auVar225;
  auVar326._0_16_ = auVar204;
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar149 * 0x1b + 6)));
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar149 * 0x1b + 10)));
  auVar41 = vcvtdq2ps_avx(auVar326);
  auVar337._16_16_ = auVar225;
  auVar337._0_16_ = auVar204;
  auVar42 = vcvtdq2ps_avx(auVar337);
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar149 * 0x1c + 6)));
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar149 * 0x1c + 10)));
  auVar351._16_16_ = auVar225;
  auVar351._0_16_ = auVar204;
  auVar43 = vcvtdq2ps_avx(auVar351);
  auVar204 = vshufps_avx(auVar276,auVar276,0);
  auVar225 = vshufps_avx(auVar276,auVar276,0x55);
  auVar226 = vshufps_avx(auVar276,auVar276,0xaa);
  fVar221 = auVar226._0_4_;
  fVar239 = auVar226._4_4_;
  fVar238 = auVar226._8_4_;
  fVar243 = auVar226._12_4_;
  fVar240 = auVar225._0_4_;
  fVar250 = auVar225._4_4_;
  fVar242 = auVar225._8_4_;
  fVar350 = auVar225._12_4_;
  fVar244 = auVar204._0_4_;
  fVar247 = auVar204._4_4_;
  fVar251 = auVar204._8_4_;
  fVar254 = auVar204._12_4_;
  auVar376._0_4_ = fVar244 * auVar161._0_4_ + fVar240 * auVar37._0_4_ + fVar221 * auVar38._0_4_;
  auVar376._4_4_ = fVar247 * auVar161._4_4_ + fVar250 * auVar37._4_4_ + fVar239 * auVar38._4_4_;
  auVar376._8_4_ = fVar251 * auVar161._8_4_ + fVar242 * auVar37._8_4_ + fVar238 * auVar38._8_4_;
  auVar376._12_4_ = fVar254 * auVar161._12_4_ + fVar350 * auVar37._12_4_ + fVar243 * auVar38._12_4_;
  auVar376._16_4_ = fVar244 * auVar161._16_4_ + fVar240 * auVar37._16_4_ + fVar221 * auVar38._16_4_;
  auVar376._20_4_ = fVar247 * auVar161._20_4_ + fVar250 * auVar37._20_4_ + fVar239 * auVar38._20_4_;
  auVar376._24_4_ = fVar251 * auVar161._24_4_ + fVar242 * auVar37._24_4_ + fVar238 * auVar38._24_4_;
  auVar376._28_4_ = fVar350 + in_register_000015dc + in_register_0000151c;
  auVar367._0_4_ = fVar244 * auVar282._0_4_ + fVar240 * auVar39._0_4_ + fVar221 * auVar40._0_4_;
  auVar367._4_4_ = fVar247 * auVar282._4_4_ + fVar250 * auVar39._4_4_ + fVar239 * auVar40._4_4_;
  auVar367._8_4_ = fVar251 * auVar282._8_4_ + fVar242 * auVar39._8_4_ + fVar238 * auVar40._8_4_;
  auVar367._12_4_ = fVar254 * auVar282._12_4_ + fVar350 * auVar39._12_4_ + fVar243 * auVar40._12_4_;
  auVar367._16_4_ = fVar244 * auVar282._16_4_ + fVar240 * auVar39._16_4_ + fVar221 * auVar40._16_4_;
  auVar367._20_4_ = fVar247 * auVar282._20_4_ + fVar250 * auVar39._20_4_ + fVar239 * auVar40._20_4_;
  auVar367._24_4_ = fVar251 * auVar282._24_4_ + fVar242 * auVar39._24_4_ + fVar238 * auVar40._24_4_;
  auVar367._28_4_ = fVar350 + in_register_000015dc + in_register_0000159c;
  auVar277._0_4_ = fVar244 * auVar41._0_4_ + fVar240 * auVar42._0_4_ + auVar43._0_4_ * fVar221;
  auVar277._4_4_ = fVar247 * auVar41._4_4_ + fVar250 * auVar42._4_4_ + auVar43._4_4_ * fVar239;
  auVar277._8_4_ = fVar251 * auVar41._8_4_ + fVar242 * auVar42._8_4_ + auVar43._8_4_ * fVar238;
  auVar277._12_4_ = fVar254 * auVar41._12_4_ + fVar350 * auVar42._12_4_ + auVar43._12_4_ * fVar243;
  auVar277._16_4_ = fVar244 * auVar41._16_4_ + fVar240 * auVar42._16_4_ + auVar43._16_4_ * fVar221;
  auVar277._20_4_ = fVar247 * auVar41._20_4_ + fVar250 * auVar42._20_4_ + auVar43._20_4_ * fVar239;
  auVar277._24_4_ = fVar251 * auVar41._24_4_ + fVar242 * auVar42._24_4_ + auVar43._24_4_ * fVar238;
  auVar277._28_4_ = fVar254 + fVar350 + fVar243;
  auVar204 = vshufps_avx(auVar183,auVar183,0);
  auVar225 = vshufps_avx(auVar183,auVar183,0x55);
  auVar226 = vshufps_avx(auVar183,auVar183,0xaa);
  fVar239 = auVar226._0_4_;
  fVar238 = auVar226._4_4_;
  fVar243 = auVar226._8_4_;
  fVar240 = auVar226._12_4_;
  fVar247 = auVar225._0_4_;
  fVar251 = auVar225._4_4_;
  fVar254 = auVar225._8_4_;
  fVar264 = auVar225._12_4_;
  fVar250 = auVar204._0_4_;
  fVar242 = auVar204._4_4_;
  fVar350 = auVar204._8_4_;
  fVar244 = auVar204._12_4_;
  fVar221 = auVar161._28_4_;
  auVar211._0_4_ = fVar250 * auVar161._0_4_ + fVar247 * auVar37._0_4_ + fVar239 * auVar38._0_4_;
  auVar211._4_4_ = fVar242 * auVar161._4_4_ + fVar251 * auVar37._4_4_ + fVar238 * auVar38._4_4_;
  auVar211._8_4_ = fVar350 * auVar161._8_4_ + fVar254 * auVar37._8_4_ + fVar243 * auVar38._8_4_;
  auVar211._12_4_ = fVar244 * auVar161._12_4_ + fVar264 * auVar37._12_4_ + fVar240 * auVar38._12_4_;
  auVar211._16_4_ = fVar250 * auVar161._16_4_ + fVar247 * auVar37._16_4_ + fVar239 * auVar38._16_4_;
  auVar211._20_4_ = fVar242 * auVar161._20_4_ + fVar251 * auVar37._20_4_ + fVar238 * auVar38._20_4_;
  auVar211._24_4_ = fVar350 * auVar161._24_4_ + fVar254 * auVar37._24_4_ + fVar243 * auVar38._24_4_;
  auVar211._28_4_ = fVar221 + auVar37._28_4_ + auVar38._28_4_;
  auVar190._0_4_ = fVar250 * auVar282._0_4_ + fVar247 * auVar39._0_4_ + fVar239 * auVar40._0_4_;
  auVar190._4_4_ = fVar242 * auVar282._4_4_ + fVar251 * auVar39._4_4_ + fVar238 * auVar40._4_4_;
  auVar190._8_4_ = fVar350 * auVar282._8_4_ + fVar254 * auVar39._8_4_ + fVar243 * auVar40._8_4_;
  auVar190._12_4_ = fVar244 * auVar282._12_4_ + fVar264 * auVar39._12_4_ + fVar240 * auVar40._12_4_;
  auVar190._16_4_ = fVar250 * auVar282._16_4_ + fVar247 * auVar39._16_4_ + fVar239 * auVar40._16_4_;
  auVar190._20_4_ = fVar242 * auVar282._20_4_ + fVar251 * auVar39._20_4_ + fVar238 * auVar40._20_4_;
  auVar190._24_4_ = fVar350 * auVar282._24_4_ + fVar254 * auVar39._24_4_ + fVar243 * auVar40._24_4_;
  auVar190._28_4_ = fVar221 + auVar38._28_4_ + auVar40._28_4_;
  auVar162._0_4_ = fVar250 * auVar41._0_4_ + fVar247 * auVar42._0_4_ + auVar43._0_4_ * fVar239;
  auVar162._4_4_ = fVar242 * auVar41._4_4_ + fVar251 * auVar42._4_4_ + auVar43._4_4_ * fVar238;
  auVar162._8_4_ = fVar350 * auVar41._8_4_ + fVar254 * auVar42._8_4_ + auVar43._8_4_ * fVar243;
  auVar162._12_4_ = fVar244 * auVar41._12_4_ + fVar264 * auVar42._12_4_ + auVar43._12_4_ * fVar240;
  auVar162._16_4_ = fVar250 * auVar41._16_4_ + fVar247 * auVar42._16_4_ + auVar43._16_4_ * fVar239;
  auVar162._20_4_ = fVar242 * auVar41._20_4_ + fVar251 * auVar42._20_4_ + auVar43._20_4_ * fVar238;
  auVar162._24_4_ = fVar350 * auVar41._24_4_ + fVar254 * auVar42._24_4_ + auVar43._24_4_ * fVar243;
  auVar162._28_4_ = fVar221 + auVar39._28_4_ + fVar240;
  auVar317._8_4_ = 0x7fffffff;
  auVar317._0_8_ = 0x7fffffff7fffffff;
  auVar317._12_4_ = 0x7fffffff;
  auVar317._16_4_ = 0x7fffffff;
  auVar317._20_4_ = 0x7fffffff;
  auVar317._24_4_ = 0x7fffffff;
  auVar317._28_4_ = 0x7fffffff;
  auVar230._8_4_ = 0x219392ef;
  auVar230._0_8_ = 0x219392ef219392ef;
  auVar230._12_4_ = 0x219392ef;
  auVar230._16_4_ = 0x219392ef;
  auVar230._20_4_ = 0x219392ef;
  auVar230._24_4_ = 0x219392ef;
  auVar230._28_4_ = 0x219392ef;
  auVar161 = vandps_avx(auVar376,auVar317);
  auVar161 = vcmpps_avx(auVar161,auVar230,1);
  auVar37 = vblendvps_avx(auVar376,auVar230,auVar161);
  auVar161 = vandps_avx(auVar367,auVar317);
  auVar161 = vcmpps_avx(auVar161,auVar230,1);
  auVar38 = vblendvps_avx(auVar367,auVar230,auVar161);
  auVar161 = vandps_avx(auVar277,auVar317);
  auVar161 = vcmpps_avx(auVar161,auVar230,1);
  auVar161 = vblendvps_avx(auVar277,auVar230,auVar161);
  auVar282 = vrcpps_avx(auVar37);
  fVar221 = auVar282._0_4_;
  fVar238 = auVar282._4_4_;
  auVar39._4_4_ = auVar37._4_4_ * fVar238;
  auVar39._0_4_ = auVar37._0_4_ * fVar221;
  fVar240 = auVar282._8_4_;
  auVar39._8_4_ = auVar37._8_4_ * fVar240;
  fVar242 = auVar282._12_4_;
  auVar39._12_4_ = auVar37._12_4_ * fVar242;
  fVar244 = auVar282._16_4_;
  auVar39._16_4_ = auVar37._16_4_ * fVar244;
  fVar247 = auVar282._20_4_;
  auVar39._20_4_ = auVar37._20_4_ * fVar247;
  fVar251 = auVar282._24_4_;
  auVar39._24_4_ = auVar37._24_4_ * fVar251;
  auVar39._28_4_ = auVar37._28_4_;
  auVar318._8_4_ = 0x3f800000;
  auVar318._0_8_ = &DAT_3f8000003f800000;
  auVar318._12_4_ = 0x3f800000;
  auVar318._16_4_ = 0x3f800000;
  auVar318._20_4_ = 0x3f800000;
  auVar318._24_4_ = 0x3f800000;
  auVar318._28_4_ = 0x3f800000;
  auVar40 = vsubps_avx(auVar318,auVar39);
  fVar221 = fVar221 + fVar221 * auVar40._0_4_;
  fVar238 = fVar238 + fVar238 * auVar40._4_4_;
  fVar240 = fVar240 + fVar240 * auVar40._8_4_;
  fVar242 = fVar242 + fVar242 * auVar40._12_4_;
  fVar244 = fVar244 + fVar244 * auVar40._16_4_;
  fVar247 = fVar247 + fVar247 * auVar40._20_4_;
  fVar251 = fVar251 + fVar251 * auVar40._24_4_;
  auVar39 = vrcpps_avx(auVar38);
  fVar254 = auVar39._0_4_;
  fVar264 = auVar39._4_4_;
  auVar37._4_4_ = fVar264 * auVar38._4_4_;
  auVar37._0_4_ = fVar254 * auVar38._0_4_;
  fVar266 = auVar39._8_4_;
  auVar37._8_4_ = fVar266 * auVar38._8_4_;
  fVar268 = auVar39._12_4_;
  auVar37._12_4_ = fVar268 * auVar38._12_4_;
  fVar270 = auVar39._16_4_;
  auVar37._16_4_ = fVar270 * auVar38._16_4_;
  fVar271 = auVar39._20_4_;
  auVar37._20_4_ = fVar271 * auVar38._20_4_;
  fVar272 = auVar39._24_4_;
  auVar37._24_4_ = fVar272 * auVar38._24_4_;
  auVar37._28_4_ = auVar38._28_4_;
  auVar38 = vsubps_avx(auVar318,auVar37);
  fVar254 = fVar254 + fVar254 * auVar38._0_4_;
  fVar264 = fVar264 + fVar264 * auVar38._4_4_;
  fVar266 = fVar266 + fVar266 * auVar38._8_4_;
  fVar268 = fVar268 + fVar268 * auVar38._12_4_;
  fVar270 = fVar270 + fVar270 * auVar38._16_4_;
  fVar271 = fVar271 + fVar271 * auVar38._20_4_;
  fVar272 = fVar272 + fVar272 * auVar38._24_4_;
  auVar37 = vrcpps_avx(auVar161);
  fVar274 = auVar37._0_4_;
  fVar285 = auVar37._4_4_;
  auVar41._4_4_ = fVar285 * auVar161._4_4_;
  auVar41._0_4_ = fVar274 * auVar161._0_4_;
  fVar287 = auVar37._8_4_;
  auVar41._8_4_ = fVar287 * auVar161._8_4_;
  fVar289 = auVar37._12_4_;
  auVar41._12_4_ = fVar289 * auVar161._12_4_;
  fVar291 = auVar37._16_4_;
  auVar41._16_4_ = fVar291 * auVar161._16_4_;
  fVar292 = auVar37._20_4_;
  auVar41._20_4_ = fVar292 * auVar161._20_4_;
  fVar293 = auVar37._24_4_;
  auVar41._24_4_ = fVar293 * auVar161._24_4_;
  auVar41._28_4_ = auVar161._28_4_;
  auVar161 = vsubps_avx(auVar318,auVar41);
  fVar274 = fVar274 + fVar274 * auVar161._0_4_;
  fVar285 = fVar285 + fVar285 * auVar161._4_4_;
  fVar287 = fVar287 + fVar287 * auVar161._8_4_;
  fVar289 = fVar289 + fVar289 * auVar161._12_4_;
  fVar291 = fVar291 + fVar291 * auVar161._16_4_;
  fVar292 = fVar292 + fVar292 * auVar161._20_4_;
  fVar293 = fVar293 + fVar293 * auVar161._24_4_;
  auVar204 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar152 + 0x16)) *
                           *(float *)(prim + lVar152 + 0x1a)));
  auVar44 = vshufps_avx(auVar204,auVar204,0);
  auVar204._8_8_ = 0;
  auVar204._0_8_ = *(ulong *)(prim + uVar149 * 7 + 6);
  auVar204 = vpmovsxwd_avx(auVar204);
  auVar225._8_8_ = 0;
  auVar225._0_8_ = *(ulong *)(prim + uVar149 * 7 + 0xe);
  auVar225 = vpmovsxwd_avx(auVar225);
  auVar319._16_16_ = auVar225;
  auVar319._0_16_ = auVar204;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = *(ulong *)(prim + uVar149 * 0xb + 6);
  auVar204 = vpmovsxwd_avx(auVar226);
  auVar161 = vcvtdq2ps_avx(auVar319);
  auVar227._8_8_ = 0;
  auVar227._0_8_ = *(ulong *)(prim + uVar149 * 0xb + 0xe);
  auVar225 = vpmovsxwd_avx(auVar227);
  auVar327._16_16_ = auVar225;
  auVar327._0_16_ = auVar204;
  auVar37 = vcvtdq2ps_avx(auVar327);
  auVar37 = vsubps_avx(auVar37,auVar161);
  fVar239 = auVar44._0_4_;
  fVar243 = auVar44._4_4_;
  fVar250 = auVar44._8_4_;
  fVar350 = auVar44._12_4_;
  auVar320._0_4_ = auVar37._0_4_ * fVar239 + auVar161._0_4_;
  auVar320._4_4_ = auVar37._4_4_ * fVar243 + auVar161._4_4_;
  auVar320._8_4_ = auVar37._8_4_ * fVar250 + auVar161._8_4_;
  auVar320._12_4_ = auVar37._12_4_ * fVar350 + auVar161._12_4_;
  auVar320._16_4_ = auVar37._16_4_ * fVar239 + auVar161._16_4_;
  auVar320._20_4_ = auVar37._20_4_ * fVar243 + auVar161._20_4_;
  auVar320._24_4_ = auVar37._24_4_ * fVar250 + auVar161._24_4_;
  auVar320._28_4_ = auVar37._28_4_ + auVar161._28_4_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar149 * 9 + 6);
  auVar204 = vpmovsxwd_avx(auVar44);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar149 * 9 + 0xe);
  auVar225 = vpmovsxwd_avx(auVar12);
  auVar328._16_16_ = auVar225;
  auVar328._0_16_ = auVar204;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar149 * 0xd + 6);
  auVar204 = vpmovsxwd_avx(auVar13);
  auVar161 = vcvtdq2ps_avx(auVar328);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar149 * 0xd + 0xe);
  auVar225 = vpmovsxwd_avx(auVar14);
  auVar338._16_16_ = auVar225;
  auVar338._0_16_ = auVar204;
  auVar37 = vcvtdq2ps_avx(auVar338);
  auVar37 = vsubps_avx(auVar37,auVar161);
  auVar329._0_4_ = auVar161._0_4_ + auVar37._0_4_ * fVar239;
  auVar329._4_4_ = auVar161._4_4_ + auVar37._4_4_ * fVar243;
  auVar329._8_4_ = auVar161._8_4_ + auVar37._8_4_ * fVar250;
  auVar329._12_4_ = auVar161._12_4_ + auVar37._12_4_ * fVar350;
  auVar329._16_4_ = auVar161._16_4_ + auVar37._16_4_ * fVar239;
  auVar329._20_4_ = auVar161._20_4_ + auVar37._20_4_ * fVar243;
  auVar329._24_4_ = auVar161._24_4_ + auVar37._24_4_ * fVar250;
  auVar329._28_4_ = auVar161._28_4_ + auVar37._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar149 * 0x12 + 6);
  auVar204 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar149 * 0x12 + 0xe);
  auVar225 = vpmovsxwd_avx(auVar16);
  auVar339._16_16_ = auVar225;
  auVar339._0_16_ = auVar204;
  uVar156 = (ulong)(uint)((int)lVar151 << 2);
  lVar152 = uVar149 * 2 + uVar156;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + lVar152 + 6);
  auVar204 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar152 + 0xe);
  auVar225 = vpmovsxwd_avx(auVar18);
  auVar161 = vcvtdq2ps_avx(auVar339);
  auVar352._16_16_ = auVar225;
  auVar352._0_16_ = auVar204;
  auVar37 = vcvtdq2ps_avx(auVar352);
  auVar37 = vsubps_avx(auVar37,auVar161);
  auVar340._0_4_ = auVar161._0_4_ + auVar37._0_4_ * fVar239;
  auVar340._4_4_ = auVar161._4_4_ + auVar37._4_4_ * fVar243;
  auVar340._8_4_ = auVar161._8_4_ + auVar37._8_4_ * fVar250;
  auVar340._12_4_ = auVar161._12_4_ + auVar37._12_4_ * fVar350;
  auVar340._16_4_ = auVar161._16_4_ + auVar37._16_4_ * fVar239;
  auVar340._20_4_ = auVar161._20_4_ + auVar37._20_4_ * fVar243;
  auVar340._24_4_ = auVar161._24_4_ + auVar37._24_4_ * fVar250;
  auVar340._28_4_ = auVar161._28_4_ + auVar37._28_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar156 + 6);
  auVar204 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar156 + 0xe);
  auVar225 = vpmovsxwd_avx(auVar20);
  auVar353._16_16_ = auVar225;
  auVar353._0_16_ = auVar204;
  auVar161 = vcvtdq2ps_avx(auVar353);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar149 * 0x18 + 6);
  auVar204 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar149 * 0x18 + 0xe);
  auVar225 = vpmovsxwd_avx(auVar22);
  auVar368._16_16_ = auVar225;
  auVar368._0_16_ = auVar204;
  auVar37 = vcvtdq2ps_avx(auVar368);
  auVar37 = vsubps_avx(auVar37,auVar161);
  auVar354._0_4_ = auVar161._0_4_ + auVar37._0_4_ * fVar239;
  auVar354._4_4_ = auVar161._4_4_ + auVar37._4_4_ * fVar243;
  auVar354._8_4_ = auVar161._8_4_ + auVar37._8_4_ * fVar250;
  auVar354._12_4_ = auVar161._12_4_ + auVar37._12_4_ * fVar350;
  auVar354._16_4_ = auVar161._16_4_ + auVar37._16_4_ * fVar239;
  auVar354._20_4_ = auVar161._20_4_ + auVar37._20_4_ * fVar243;
  auVar354._24_4_ = auVar161._24_4_ + auVar37._24_4_ * fVar250;
  auVar354._28_4_ = auVar161._28_4_ + auVar37._28_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar149 * 0x1d + 6);
  auVar204 = vpmovsxwd_avx(auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar149 * 0x1d + 0xe);
  auVar225 = vpmovsxwd_avx(auVar24);
  auVar369._16_16_ = auVar225;
  auVar369._0_16_ = auVar204;
  lVar152 = uVar149 + (ulong)(byte)PVar31 * 0x20;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + lVar152 + 6);
  auVar204 = vpmovsxwd_avx(auVar25);
  auVar161 = vcvtdq2ps_avx(auVar369);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + lVar152 + 0xe);
  auVar225 = vpmovsxwd_avx(auVar26);
  auVar377._16_16_ = auVar225;
  auVar377._0_16_ = auVar204;
  auVar37 = vcvtdq2ps_avx(auVar377);
  auVar37 = vsubps_avx(auVar37,auVar161);
  lVar152 = (ulong)(byte)PVar31 * 0x20 - uVar149;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + lVar152 + 6);
  auVar204 = vpmovsxwd_avx(auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + lVar152 + 0xe);
  auVar225 = vpmovsxwd_avx(auVar28);
  auVar370._0_4_ = auVar161._0_4_ + auVar37._0_4_ * fVar239;
  auVar370._4_4_ = auVar161._4_4_ + auVar37._4_4_ * fVar243;
  auVar370._8_4_ = auVar161._8_4_ + auVar37._8_4_ * fVar250;
  auVar370._12_4_ = auVar161._12_4_ + auVar37._12_4_ * fVar350;
  auVar370._16_4_ = auVar161._16_4_ + auVar37._16_4_ * fVar239;
  auVar370._20_4_ = auVar161._20_4_ + auVar37._20_4_ * fVar243;
  auVar370._24_4_ = auVar161._24_4_ + auVar37._24_4_ * fVar250;
  auVar370._28_4_ = auVar161._28_4_ + auVar37._28_4_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar149 * 0x23 + 6);
  auVar226 = vpmovsxwd_avx(auVar29);
  auVar386._16_16_ = auVar225;
  auVar386._0_16_ = auVar204;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar149 * 0x23 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar30);
  auVar378._16_16_ = auVar204;
  auVar378._0_16_ = auVar226;
  auVar161 = vcvtdq2ps_avx(auVar386);
  auVar37 = vcvtdq2ps_avx(auVar378);
  auVar37 = vsubps_avx(auVar37,auVar161);
  auVar379._0_4_ = auVar161._0_4_ + auVar37._0_4_ * fVar239;
  auVar379._4_4_ = auVar161._4_4_ + auVar37._4_4_ * fVar243;
  auVar379._8_4_ = auVar161._8_4_ + auVar37._8_4_ * fVar250;
  auVar379._12_4_ = auVar161._12_4_ + auVar37._12_4_ * fVar350;
  auVar379._16_4_ = auVar161._16_4_ + auVar37._16_4_ * fVar239;
  auVar379._20_4_ = auVar161._20_4_ + auVar37._20_4_ * fVar243;
  auVar379._24_4_ = auVar161._24_4_ + auVar37._24_4_ * fVar250;
  auVar379._28_4_ = auVar161._28_4_ + fVar350;
  auVar161 = vsubps_avx(auVar320,auVar211);
  auVar298._0_4_ = fVar221 * auVar161._0_4_;
  auVar298._4_4_ = fVar238 * auVar161._4_4_;
  auVar298._8_4_ = fVar240 * auVar161._8_4_;
  auVar298._12_4_ = fVar242 * auVar161._12_4_;
  auVar42._16_4_ = fVar244 * auVar161._16_4_;
  auVar42._0_16_ = auVar298;
  auVar42._20_4_ = fVar247 * auVar161._20_4_;
  auVar42._24_4_ = fVar251 * auVar161._24_4_;
  auVar42._28_4_ = auVar161._28_4_;
  auVar161 = vsubps_avx(auVar329,auVar211);
  auVar223._0_4_ = fVar221 * auVar161._0_4_;
  auVar223._4_4_ = fVar238 * auVar161._4_4_;
  auVar223._8_4_ = fVar240 * auVar161._8_4_;
  auVar223._12_4_ = fVar242 * auVar161._12_4_;
  auVar43._16_4_ = fVar244 * auVar161._16_4_;
  auVar43._0_16_ = auVar223;
  auVar43._20_4_ = fVar247 * auVar161._20_4_;
  auVar43._24_4_ = fVar251 * auVar161._24_4_;
  auVar43._28_4_ = auVar282._28_4_ + auVar40._28_4_;
  auVar161 = vsubps_avx(auVar340,auVar190);
  auVar203._0_4_ = fVar254 * auVar161._0_4_;
  auVar203._4_4_ = fVar264 * auVar161._4_4_;
  auVar203._8_4_ = fVar266 * auVar161._8_4_;
  auVar203._12_4_ = fVar268 * auVar161._12_4_;
  auVar282._16_4_ = fVar270 * auVar161._16_4_;
  auVar282._0_16_ = auVar203;
  auVar282._20_4_ = fVar271 * auVar161._20_4_;
  auVar282._24_4_ = fVar272 * auVar161._24_4_;
  auVar282._28_4_ = auVar161._28_4_;
  auVar161 = vsubps_avx(auVar354,auVar190);
  auVar256._0_4_ = fVar254 * auVar161._0_4_;
  auVar256._4_4_ = fVar264 * auVar161._4_4_;
  auVar256._8_4_ = fVar266 * auVar161._8_4_;
  auVar256._12_4_ = fVar268 * auVar161._12_4_;
  auVar40._16_4_ = fVar270 * auVar161._16_4_;
  auVar40._0_16_ = auVar256;
  auVar40._20_4_ = fVar271 * auVar161._20_4_;
  auVar40._24_4_ = fVar272 * auVar161._24_4_;
  auVar40._28_4_ = auVar39._28_4_ + auVar38._28_4_;
  auVar161 = vsubps_avx(auVar370,auVar162);
  auVar184._0_4_ = fVar274 * auVar161._0_4_;
  auVar184._4_4_ = fVar285 * auVar161._4_4_;
  auVar184._8_4_ = fVar287 * auVar161._8_4_;
  auVar184._12_4_ = fVar289 * auVar161._12_4_;
  auVar38._16_4_ = fVar291 * auVar161._16_4_;
  auVar38._0_16_ = auVar184;
  auVar38._20_4_ = fVar292 * auVar161._20_4_;
  auVar38._24_4_ = fVar293 * auVar161._24_4_;
  auVar38._28_4_ = auVar161._28_4_;
  auVar161 = vsubps_avx(auVar379,auVar162);
  auVar159._0_4_ = fVar274 * auVar161._0_4_;
  auVar159._4_4_ = fVar285 * auVar161._4_4_;
  auVar159._8_4_ = fVar287 * auVar161._8_4_;
  auVar159._12_4_ = fVar289 * auVar161._12_4_;
  auVar45._16_4_ = fVar291 * auVar161._16_4_;
  auVar45._0_16_ = auVar159;
  auVar45._20_4_ = fVar292 * auVar161._20_4_;
  auVar45._24_4_ = fVar293 * auVar161._24_4_;
  auVar45._28_4_ = auVar161._28_4_;
  auVar204 = vpminsd_avx(auVar42._16_16_,auVar43._16_16_);
  auVar225 = vpminsd_avx(auVar298,auVar223);
  auVar330._16_16_ = auVar204;
  auVar330._0_16_ = auVar225;
  auVar204 = vpminsd_avx(auVar282._16_16_,auVar40._16_16_);
  auVar225 = vpminsd_avx(auVar203,auVar256);
  auVar371._16_16_ = auVar204;
  auVar371._0_16_ = auVar225;
  auVar161 = vmaxps_avx(auVar330,auVar371);
  auVar204 = vpminsd_avx(auVar38._16_16_,auVar45._16_16_);
  auVar225 = vpminsd_avx(auVar184,auVar159);
  auVar387._16_16_ = auVar204;
  auVar387._0_16_ = auVar225;
  uVar324 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar395._4_4_ = uVar324;
  auVar395._0_4_ = uVar324;
  auVar395._8_4_ = uVar324;
  auVar395._12_4_ = uVar324;
  auVar395._16_4_ = uVar324;
  auVar395._20_4_ = uVar324;
  auVar395._24_4_ = uVar324;
  auVar395._28_4_ = uVar324;
  auVar37 = vmaxps_avx(auVar387,auVar395);
  auVar161 = vmaxps_avx(auVar161,auVar37);
  local_80._4_4_ = auVar161._4_4_ * 0.99999964;
  local_80._0_4_ = auVar161._0_4_ * 0.99999964;
  local_80._8_4_ = auVar161._8_4_ * 0.99999964;
  local_80._12_4_ = auVar161._12_4_ * 0.99999964;
  local_80._16_4_ = auVar161._16_4_ * 0.99999964;
  local_80._20_4_ = auVar161._20_4_ * 0.99999964;
  local_80._24_4_ = auVar161._24_4_ * 0.99999964;
  local_80._28_4_ = auVar161._28_4_;
  auVar204 = vpmaxsd_avx(auVar42._16_16_,auVar43._16_16_);
  auVar225 = vpmaxsd_avx(auVar298,auVar223);
  auVar231._16_16_ = auVar204;
  auVar231._0_16_ = auVar225;
  auVar204 = vpmaxsd_avx(auVar282._16_16_,auVar40._16_16_);
  auVar225 = vpmaxsd_avx(auVar203,auVar256);
  auVar212._16_16_ = auVar204;
  auVar212._0_16_ = auVar225;
  auVar161 = vminps_avx(auVar231,auVar212);
  auVar204 = vpmaxsd_avx(auVar38._16_16_,auVar45._16_16_);
  auVar225 = vpmaxsd_avx(auVar184,auVar159);
  auVar163._16_16_ = auVar204;
  auVar163._0_16_ = auVar225;
  uVar324 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar191._4_4_ = uVar324;
  auVar191._0_4_ = uVar324;
  auVar191._8_4_ = uVar324;
  auVar191._12_4_ = uVar324;
  auVar191._16_4_ = uVar324;
  auVar191._20_4_ = uVar324;
  auVar191._24_4_ = uVar324;
  auVar191._28_4_ = uVar324;
  auVar37 = vminps_avx(auVar163,auVar191);
  auVar161 = vminps_avx(auVar161,auVar37);
  auVar46._4_4_ = auVar161._4_4_ * 1.0000004;
  auVar46._0_4_ = auVar161._0_4_ * 1.0000004;
  auVar46._8_4_ = auVar161._8_4_ * 1.0000004;
  auVar46._12_4_ = auVar161._12_4_ * 1.0000004;
  auVar46._16_4_ = auVar161._16_4_ * 1.0000004;
  auVar46._20_4_ = auVar161._20_4_ * 1.0000004;
  auVar46._24_4_ = auVar161._24_4_ * 1.0000004;
  auVar46._28_4_ = auVar161._28_4_;
  auVar161 = vcmpps_avx(local_80,auVar46,2);
  auVar204 = vpshufd_avx(ZEXT116((byte)PVar31),0);
  auVar192._16_16_ = auVar204;
  auVar192._0_16_ = auVar204;
  auVar37 = vcvtdq2ps_avx(auVar192);
  auVar37 = vcmpps_avx(_DAT_02020f40,auVar37,1);
  auVar161 = vandps_avx(auVar161,auVar37);
  uVar146 = vmovmskps_avx(auVar161);
  local_88d = uVar146 != 0;
  if (local_88d) {
    uVar146 = uVar146 & 0xff;
    local_560 = mm_lookupmask_ps._16_8_;
    uStack_558 = mm_lookupmask_ps._24_8_;
    uStack_550 = mm_lookupmask_ps._16_8_;
    uStack_548 = mm_lookupmask_ps._24_8_;
    local_570 = pre->ray_space + k;
    local_6c0 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_6b8 = pre;
    local_568 = prim;
    do {
      lVar152 = 0;
      if (uVar146 != 0) {
        for (; (uVar146 >> lVar152 & 1) == 0; lVar152 = lVar152 + 1) {
        }
      }
      uVar150 = *(uint *)(local_568 + 2);
      local_848 = (ulong)uVar150;
      uVar32 = *(uint *)(local_568 + lVar152 * 4 + 6);
      pGVar34 = (context->scene->geometries).items[local_848].ptr;
      local_5f0._0_8_ = CONCAT44(0,uVar32);
      uVar149 = (ulong)*(uint *)(*(long *)&pGVar34->field_0x58 +
                                CONCAT44(0,uVar32) *
                                pGVar34[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar221 = (pGVar34->time_range).lower;
      fVar221 = pGVar34->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar221) /
                ((pGVar34->time_range).upper - fVar221));
      auVar204 = vroundss_avx(ZEXT416((uint)fVar221),ZEXT416((uint)fVar221),9);
      auVar204 = vminss_avx(auVar204,ZEXT416((uint)(pGVar34->fnumTimeSegments + -1.0)));
      auVar204 = vmaxss_avx(ZEXT816(0) << 0x20,auVar204);
      fVar221 = fVar221 - auVar204._0_4_;
      _Var35 = pGVar34[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar153 = (long)(int)auVar204._0_4_ * 0x38;
      lVar152 = *(long *)(_Var35 + 0x10 + lVar153);
      lVar151 = *(long *)(_Var35 + 0x38 + lVar153);
      lVar157 = *(long *)(_Var35 + 0x48 + lVar153);
      auVar204 = vshufps_avx(ZEXT416((uint)fVar221),ZEXT416((uint)fVar221),0);
      pfVar1 = (float *)(lVar151 + uVar149 * lVar157);
      fVar239 = auVar204._0_4_;
      fVar238 = auVar204._4_4_;
      fVar243 = auVar204._8_4_;
      fVar240 = auVar204._12_4_;
      pfVar2 = (float *)(lVar151 + (uVar149 + 1) * lVar157);
      lVar155 = (uVar149 + 2) * lVar157;
      pfVar3 = (float *)(lVar151 + lVar155);
      pfVar4 = (float *)(lVar151 + lVar157 * (uVar149 + 3));
      lVar151 = *(long *)(_Var35 + lVar153);
      auVar204 = vshufps_avx(ZEXT416((uint)(1.0 - fVar221)),ZEXT416((uint)(1.0 - fVar221)),0);
      pfVar5 = (float *)(lVar151 + lVar152 * uVar149);
      fVar221 = auVar204._0_4_;
      fVar250 = auVar204._4_4_;
      fVar242 = auVar204._8_4_;
      fVar350 = auVar204._12_4_;
      pfVar6 = (float *)(lVar151 + lVar152 * (uVar149 + 1));
      pfVar7 = (float *)(lVar151 + lVar152 * (uVar149 + 2));
      pfVar8 = (float *)(lVar151 + lVar152 * (uVar149 + 3));
      uVar33 = (uint)pGVar34[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar152 = (long)(int)uVar33 * 0x44;
      local_6d0 = (undefined1  [8])
                  CONCAT44(fVar238 * pfVar1[1] + fVar250 * pfVar5[1],
                           fVar239 * *pfVar1 + fVar221 * *pfVar5);
      uStack_6c8._0_4_ = fVar243 * pfVar1[2] + fVar242 * pfVar5[2];
      uStack_6c8._4_4_ = fVar240 * pfVar1[3] + fVar350 * pfVar5[3];
      local_4d0._0_8_ =
           CONCAT44(fVar250 * pfVar6[1] + fVar238 * pfVar2[1],fVar221 * *pfVar6 + fVar239 * *pfVar2)
      ;
      local_4d0._8_4_ = fVar242 * pfVar6[2] + fVar243 * pfVar2[2];
      local_4d0._12_4_ = fVar350 * pfVar6[3] + fVar240 * pfVar2[3];
      local_840 = fVar221 * *pfVar7 + fVar239 * *pfVar3;
      fStack_83c = fVar250 * pfVar7[1] + fVar238 * pfVar3[1];
      auVar407._0_8_ = CONCAT44(fStack_83c,local_840);
      auVar407._8_4_ = fVar242 * pfVar7[2] + fVar243 * pfVar3[2];
      auVar407._12_4_ = fVar350 * pfVar7[3] + fVar240 * pfVar3[3];
      local_4f0._0_8_ =
           CONCAT44(fVar250 * pfVar8[1] + fVar238 * pfVar4[1],fVar221 * *pfVar8 + fVar239 * *pfVar4)
      ;
      local_4f0._8_4_ = fVar242 * pfVar8[2] + fVar243 * pfVar4[2];
      local_4f0._12_4_ = fVar350 * pfVar8[3] + fVar240 * pfVar4[3];
      auVar204 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar227 = vinsertps_avx(auVar204,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar226 = vsubps_avx(_local_6d0,auVar227);
      auVar204 = vshufps_avx(auVar226,auVar226,0);
      auVar225 = vshufps_avx(auVar226,auVar226,0x55);
      auVar226 = vshufps_avx(auVar226,auVar226,0xaa);
      fVar221 = (local_570->vx).field_0.m128[0];
      fVar239 = (local_570->vx).field_0.m128[1];
      fVar238 = (local_570->vx).field_0.m128[2];
      fVar243 = (local_570->vx).field_0.m128[3];
      fVar240 = (local_570->vy).field_0.m128[0];
      fVar250 = (local_570->vy).field_0.m128[1];
      fVar242 = (local_570->vy).field_0.m128[2];
      fVar350 = (local_570->vy).field_0.m128[3];
      fVar244 = (local_570->vz).field_0.m128[0];
      fVar247 = (local_570->vz).field_0.m128[1];
      fVar251 = (local_570->vz).field_0.m128[2];
      fVar254 = (local_570->vz).field_0.m128[3];
      auVar224._0_4_ =
           auVar204._0_4_ * fVar221 + auVar225._0_4_ * fVar240 + fVar244 * auVar226._0_4_;
      auVar224._4_4_ =
           auVar204._4_4_ * fVar239 + auVar225._4_4_ * fVar250 + fVar247 * auVar226._4_4_;
      auVar224._8_4_ =
           auVar204._8_4_ * fVar238 + auVar225._8_4_ * fVar242 + fVar251 * auVar226._8_4_;
      auVar224._12_4_ =
           auVar204._12_4_ * fVar243 + auVar225._12_4_ * fVar350 + fVar254 * auVar226._12_4_;
      auVar204 = vblendps_avx(auVar224,_local_6d0,8);
      auVar44 = vsubps_avx(local_4d0,auVar227);
      auVar225 = vshufps_avx(auVar44,auVar44,0);
      auVar226 = vshufps_avx(auVar44,auVar44,0x55);
      auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
      auVar315._0_4_ = auVar225._0_4_ * fVar221 + auVar226._0_4_ * fVar240 + fVar244 * auVar44._0_4_
      ;
      auVar315._4_4_ = auVar225._4_4_ * fVar239 + auVar226._4_4_ * fVar250 + fVar247 * auVar44._4_4_
      ;
      auVar315._8_4_ = auVar225._8_4_ * fVar238 + auVar226._8_4_ * fVar242 + fVar251 * auVar44._8_4_
      ;
      auVar315._12_4_ =
           auVar225._12_4_ * fVar243 + auVar226._12_4_ * fVar350 + fVar254 * auVar44._12_4_;
      auVar225 = vblendps_avx(auVar315,local_4d0,8);
      auVar12 = vsubps_avx(auVar407,auVar227);
      auVar226 = vshufps_avx(auVar12,auVar12,0);
      auVar44 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar325._0_4_ = auVar226._0_4_ * fVar221 + auVar44._0_4_ * fVar240 + auVar12._0_4_ * fVar244;
      auVar325._4_4_ = auVar226._4_4_ * fVar239 + auVar44._4_4_ * fVar250 + auVar12._4_4_ * fVar247;
      auVar325._8_4_ = auVar226._8_4_ * fVar238 + auVar44._8_4_ * fVar242 + auVar12._8_4_ * fVar251;
      auVar325._12_4_ =
           auVar226._12_4_ * fVar243 + auVar44._12_4_ * fVar350 + auVar12._12_4_ * fVar254;
      auVar226 = vblendps_avx(auVar325,auVar407,8);
      auVar12 = vsubps_avx(local_4f0,auVar227);
      auVar227 = vshufps_avx(auVar12,auVar12,0);
      auVar44 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar185._0_4_ = auVar227._0_4_ * fVar221 + auVar44._0_4_ * fVar240 + fVar244 * auVar12._0_4_;
      auVar185._4_4_ = auVar227._4_4_ * fVar239 + auVar44._4_4_ * fVar250 + fVar247 * auVar12._4_4_;
      auVar185._8_4_ = auVar227._8_4_ * fVar238 + auVar44._8_4_ * fVar242 + fVar251 * auVar12._8_4_;
      auVar185._12_4_ =
           auVar227._12_4_ * fVar243 + auVar44._12_4_ * fVar350 + fVar254 * auVar12._12_4_;
      auVar227 = vblendps_avx(auVar185,local_4f0,8);
      auVar257._8_4_ = 0x7fffffff;
      auVar257._0_8_ = 0x7fffffff7fffffff;
      auVar257._12_4_ = 0x7fffffff;
      auVar204 = vandps_avx(auVar204,auVar257);
      auVar225 = vandps_avx(auVar225,auVar257);
      auVar44 = vmaxps_avx(auVar204,auVar225);
      auVar204 = vandps_avx(auVar226,auVar257);
      auVar225 = vandps_avx(auVar227,auVar257);
      auVar204 = vmaxps_avx(auVar204,auVar225);
      auVar204 = vmaxps_avx(auVar44,auVar204);
      auVar225 = vmovshdup_avx(auVar204);
      auVar225 = vmaxss_avx(auVar225,auVar204);
      auVar204 = vshufpd_avx(auVar204,auVar204,1);
      auVar204 = vmaxss_avx(auVar204,auVar225);
      fVar350 = *(float *)(catmullrom_basis0 + lVar152 + 0x908);
      fVar244 = *(float *)(catmullrom_basis0 + lVar152 + 0x90c);
      fVar247 = *(float *)(catmullrom_basis0 + lVar152 + 0x910);
      fVar251 = *(float *)(catmullrom_basis0 + lVar152 + 0x914);
      fVar254 = *(float *)(catmullrom_basis0 + lVar152 + 0x918);
      fVar264 = *(float *)(catmullrom_basis0 + lVar152 + 0x91c);
      fVar266 = *(float *)(catmullrom_basis0 + lVar152 + 0x920);
      local_820._0_16_ = auVar325;
      auVar225 = vshufps_avx(auVar325,auVar325,0);
      register0x00001250 = auVar225;
      _local_620 = auVar225;
      auVar226 = vshufps_avx(auVar325,auVar325,0x55);
      register0x00001290 = auVar226;
      _local_640 = auVar226;
      fVar221 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar152 + 0xd8c);
      fVar239 = *(float *)(catmullrom_basis0 + lVar152 + 0xd90);
      fVar238 = *(float *)(catmullrom_basis0 + lVar152 + 0xd94);
      fVar243 = *(float *)(catmullrom_basis0 + lVar152 + 0xd98);
      fVar240 = *(float *)(catmullrom_basis0 + lVar152 + 0xd9c);
      fVar250 = *(float *)(catmullrom_basis0 + lVar152 + 0xda0);
      fVar242 = *(float *)(catmullrom_basis0 + lVar152 + 0xda4);
      auVar142 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar152 + 0xd8c);
      auVar227 = vshufps_avx(auVar185,auVar185,0);
      register0x00001210 = auVar227;
      _local_540 = auVar227;
      fVar295 = auVar227._0_4_;
      fVar173 = auVar227._4_4_;
      fVar175 = auVar227._8_4_;
      fVar177 = auVar227._12_4_;
      fVar310 = auVar225._0_4_;
      fVar311 = auVar225._4_4_;
      fVar312 = auVar225._8_4_;
      fVar313 = auVar225._12_4_;
      auVar225 = vshufps_avx(auVar185,auVar185,0x55);
      register0x000014d0 = auVar225;
      _local_720 = auVar225;
      fVar366 = auVar225._0_4_;
      fVar373 = auVar225._4_4_;
      fVar374 = auVar225._8_4_;
      fVar375 = auVar225._12_4_;
      fVar314 = auVar226._0_4_;
      fVar214 = auVar226._4_4_;
      fVar216 = auVar226._8_4_;
      fVar218 = auVar226._12_4_;
      auVar225 = vshufps_avx(auVar407,auVar407,0xff);
      register0x00001450 = auVar225;
      _local_a0 = auVar225;
      auVar226 = vshufps_avx(local_4f0,local_4f0,0xff);
      register0x00001390 = auVar226;
      _local_140 = auVar226;
      fVar296 = auVar226._0_4_;
      fVar305 = auVar226._4_4_;
      fVar307 = auVar226._8_4_;
      fVar309 = auVar226._12_4_;
      fVar199 = auVar225._0_4_;
      fVar345 = auVar225._4_4_;
      fVar346 = auVar225._8_4_;
      auVar226 = vshufps_avx(auVar315,auVar315,0);
      register0x00001310 = auVar226;
      _local_680 = auVar226;
      fVar268 = *(float *)(catmullrom_basis0 + lVar152 + 0x484);
      fVar270 = *(float *)(catmullrom_basis0 + lVar152 + 0x488);
      fVar271 = *(float *)(catmullrom_basis0 + lVar152 + 0x48c);
      fVar272 = *(float *)(catmullrom_basis0 + lVar152 + 0x490);
      fVar274 = *(float *)(catmullrom_basis0 + lVar152 + 0x494);
      fVar285 = *(float *)(catmullrom_basis0 + lVar152 + 0x498);
      fVar287 = *(float *)(catmullrom_basis0 + lVar152 + 0x49c);
      fVar255 = auVar226._0_4_;
      fVar265 = auVar226._4_4_;
      fVar267 = auVar226._8_4_;
      fVar269 = auVar226._12_4_;
      auVar226 = vshufps_avx(auVar315,auVar315,0x55);
      register0x000015d0 = auVar226;
      _local_700 = auVar226;
      fVar201 = auVar226._0_4_;
      fVar297 = auVar226._4_4_;
      fVar306 = auVar226._8_4_;
      fVar308 = auVar226._12_4_;
      auVar226 = vshufps_avx(local_4d0,local_4d0,0xff);
      register0x00001590 = auVar226;
      _local_160 = auVar226;
      fVar393 = auVar226._0_4_;
      fVar398 = auVar226._4_4_;
      fVar400 = auVar226._8_4_;
      fVar402 = auVar226._12_4_;
      auVar226 = vshufps_avx(auVar224,auVar224,0);
      register0x00001350 = auVar226;
      _local_460 = auVar226;
      pauVar9 = (undefined1 (*) [16])(catmullrom_basis0 + lVar152);
      fVar289 = *(float *)*pauVar9;
      fVar291 = *(float *)(catmullrom_basis0 + lVar152 + 4);
      fVar292 = *(float *)(catmullrom_basis0 + lVar152 + 8);
      auVar143 = *(undefined1 (*) [12])*pauVar9;
      fVar293 = *(float *)(catmullrom_basis0 + lVar152 + 0xc);
      fStack_310 = *(float *)(catmullrom_basis0 + lVar152 + 0x10);
      fStack_30c = *(float *)(catmullrom_basis0 + lVar152 + 0x14);
      fStack_308 = *(float *)(catmullrom_basis0 + lVar152 + 0x18);
      uStack_304 = *(undefined4 *)(catmullrom_basis0 + lVar152 + 0x1c);
      fVar275 = auVar226._0_4_;
      fVar286 = auVar226._4_4_;
      fVar288 = auVar226._8_4_;
      fVar290 = auVar226._12_4_;
      auVar321._0_4_ = fVar275 * fVar289 + fVar255 * fVar268 + fVar310 * fVar350 + fVar295 * fVar221
      ;
      auVar321._4_4_ = fVar286 * fVar291 + fVar265 * fVar270 + fVar311 * fVar244 + fVar173 * fVar239
      ;
      auVar321._8_4_ = fVar288 * fVar292 + fVar267 * fVar271 + fVar312 * fVar247 + fVar175 * fVar238
      ;
      auVar321._12_4_ =
           fVar290 * fVar293 + fVar269 * fVar272 + fVar313 * fVar251 + fVar177 * fVar243;
      auVar321._16_4_ =
           fVar275 * fStack_310 + fVar255 * fVar274 + fVar310 * fVar254 + fVar295 * fVar240;
      auVar321._20_4_ =
           fVar286 * fStack_30c + fVar265 * fVar285 + fVar311 * fVar264 + fVar173 * fVar250;
      auVar321._24_4_ =
           fVar288 * fStack_308 + fVar267 * fVar287 + fVar312 * fVar266 + fVar175 * fVar242;
      auVar321._28_4_ = fVar290 + fVar313 + fVar177 + 0.0;
      auVar226 = vshufps_avx(auVar224,auVar224,0x55);
      register0x00001290 = auVar226;
      _local_120 = auVar226;
      fVar202 = auVar226._0_4_;
      fVar215 = auVar226._4_4_;
      fVar217 = auVar226._8_4_;
      fVar219 = auVar226._12_4_;
      auVar380._0_4_ = fVar202 * fVar289 + fVar201 * fVar268 + fVar314 * fVar350 + fVar366 * fVar221
      ;
      auVar380._4_4_ = fVar215 * fVar291 + fVar297 * fVar270 + fVar214 * fVar244 + fVar373 * fVar239
      ;
      auVar380._8_4_ = fVar217 * fVar292 + fVar306 * fVar271 + fVar216 * fVar247 + fVar374 * fVar238
      ;
      auVar380._12_4_ =
           fVar219 * fVar293 + fVar308 * fVar272 + fVar218 * fVar251 + fVar375 * fVar243;
      auVar380._16_4_ =
           fVar202 * fStack_310 + fVar201 * fVar274 + fVar314 * fVar254 + fVar366 * fVar240;
      auVar380._20_4_ =
           fVar215 * fStack_30c + fVar297 * fVar285 + fVar214 * fVar264 + fVar373 * fVar250;
      auVar380._24_4_ =
           fVar217 * fStack_308 + fVar306 * fVar287 + fVar216 * fVar266 + fVar374 * fVar242;
      auVar380._28_4_ = fVar218 + 0.0 + 0.0 + 0.0;
      auVar226 = vpermilps_avx(_local_6d0,0xff);
      register0x00001490 = auVar226;
      _local_c0 = auVar226;
      fVar348 = auVar226._0_4_;
      fVar359 = auVar226._4_4_;
      fVar361 = auVar226._8_4_;
      auVar164._0_4_ = fVar393 * fVar268 + fVar199 * fVar350 + fVar296 * fVar221 + fVar348 * fVar289
      ;
      auVar164._4_4_ = fVar398 * fVar270 + fVar345 * fVar244 + fVar305 * fVar239 + fVar359 * fVar291
      ;
      auVar164._8_4_ = fVar400 * fVar271 + fVar346 * fVar247 + fVar307 * fVar238 + fVar361 * fVar292
      ;
      auVar164._12_4_ =
           fVar402 * fVar272 + auVar225._12_4_ * fVar251 + fVar309 * fVar243 +
           auVar226._12_4_ * fVar293;
      auVar164._16_4_ =
           fVar393 * fVar274 + fVar199 * fVar254 + fVar296 * fVar240 + fVar348 * fStack_310;
      auVar164._20_4_ =
           fVar398 * fVar285 + fVar345 * fVar264 + fVar305 * fVar250 + fVar359 * fStack_30c;
      auVar164._24_4_ =
           fVar400 * fVar287 + fVar346 * fVar266 + fVar307 * fVar242 + fVar361 * fStack_308;
      auVar164._28_4_ = 0;
      fVar289 = *(float *)(catmullrom_basis1 + lVar152 + 0x908);
      fVar291 = *(float *)(catmullrom_basis1 + lVar152 + 0x90c);
      fVar292 = *(float *)(catmullrom_basis1 + lVar152 + 0x910);
      fVar332 = *(float *)(catmullrom_basis1 + lVar152 + 0x914);
      fVar246 = *(float *)(catmullrom_basis1 + lVar152 + 0x918);
      fVar364 = *(float *)(catmullrom_basis1 + lVar152 + 0x91c);
      fVar333 = *(float *)(catmullrom_basis1 + lVar152 + 0x920);
      fVar334 = *(float *)(catmullrom_basis1 + lVar152 + 0xd8c);
      fVar249 = *(float *)(catmullrom_basis1 + lVar152 + 0xd90);
      fVar365 = *(float *)(catmullrom_basis1 + lVar152 + 0xd94);
      fVar335 = *(float *)(catmullrom_basis1 + lVar152 + 0xd98);
      fVar336 = *(float *)(catmullrom_basis1 + lVar152 + 0xd9c);
      fVar253 = *(float *)(catmullrom_basis1 + lVar152 + 0xda0);
      fVar200 = *(float *)(catmullrom_basis1 + lVar152 + 0xda4);
      fVar404 = *(float *)(catmullrom_basis1 + lVar152 + 0x484);
      fVar405 = *(float *)(catmullrom_basis1 + lVar152 + 0x488);
      fVar406 = *(float *)(catmullrom_basis1 + lVar152 + 0x48c);
      fVar179 = *(float *)(catmullrom_basis1 + lVar152 + 0x490);
      fVar180 = *(float *)(catmullrom_basis1 + lVar152 + 0x494);
      fVar181 = *(float *)(catmullrom_basis1 + lVar152 + 0x498);
      fVar220 = *(float *)(catmullrom_basis1 + lVar152 + 0x49c);
      fVar222 = *(float *)(catmullrom_basis1 + lVar152);
      fVar273 = *(float *)(catmullrom_basis1 + lVar152 + 4);
      fVar241 = *(float *)(catmullrom_basis1 + lVar152 + 8);
      fVar182 = *(float *)(catmullrom_basis1 + lVar152 + 0xc);
      fVar245 = *(float *)(catmullrom_basis1 + lVar152 + 0x10);
      fVar248 = *(float *)(catmullrom_basis1 + lVar152 + 0x14);
      fVar252 = *(float *)(catmullrom_basis1 + lVar152 + 0x18);
      auVar258._0_4_ = fVar275 * fVar222 + fVar255 * fVar404 + fVar289 * fVar310 + fVar334 * fVar295
      ;
      auVar258._4_4_ = fVar286 * fVar273 + fVar265 * fVar405 + fVar291 * fVar311 + fVar249 * fVar173
      ;
      auVar258._8_4_ = fVar288 * fVar241 + fVar267 * fVar406 + fVar292 * fVar312 + fVar365 * fVar175
      ;
      auVar258._12_4_ =
           fVar290 * fVar182 + fVar269 * fVar179 + fVar332 * fVar313 + fVar335 * fVar177;
      auVar258._16_4_ =
           fVar275 * fVar245 + fVar255 * fVar180 + fVar246 * fVar310 + fVar336 * fVar295;
      auVar258._20_4_ =
           fVar286 * fVar248 + fVar265 * fVar181 + fVar364 * fVar311 + fVar253 * fVar173;
      auVar258._24_4_ =
           fVar288 * fVar252 + fVar267 * fVar220 + fVar333 * fVar312 + fVar200 * fVar175;
      auVar258._28_4_ = fVar402 + fVar290 + 0.0 + 0.0;
      auVar232._0_4_ = fVar202 * fVar222 + fVar201 * fVar404 + fVar289 * fVar314 + fVar366 * fVar334
      ;
      auVar232._4_4_ = fVar215 * fVar273 + fVar297 * fVar405 + fVar291 * fVar214 + fVar373 * fVar249
      ;
      auVar232._8_4_ = fVar217 * fVar241 + fVar306 * fVar406 + fVar292 * fVar216 + fVar374 * fVar365
      ;
      auVar232._12_4_ =
           fVar219 * fVar182 + fVar308 * fVar179 + fVar332 * fVar218 + fVar375 * fVar335;
      auVar232._16_4_ =
           fVar202 * fVar245 + fVar201 * fVar180 + fVar246 * fVar314 + fVar366 * fVar336;
      auVar232._20_4_ =
           fVar215 * fVar248 + fVar297 * fVar181 + fVar364 * fVar214 + fVar373 * fVar253;
      auVar232._24_4_ =
           fVar217 * fVar252 + fVar306 * fVar220 + fVar333 * fVar216 + fVar374 * fVar200;
      auVar232._28_4_ = fVar219 + fVar290 + 0.0 + 0.0;
      local_7e0._0_4_ =
           fVar393 * fVar404 + fVar199 * fVar289 + fVar334 * fVar296 + fVar348 * fVar222;
      local_7e0._4_4_ =
           fVar398 * fVar405 + fVar345 * fVar291 + fVar249 * fVar305 + fVar359 * fVar273;
      local_7e0._8_4_ =
           fVar400 * fVar406 + fVar346 * fVar292 + fVar365 * fVar307 + fVar361 * fVar241;
      local_7e0._12_4_ =
           fVar402 * fVar179 + auVar225._12_4_ * fVar332 + fVar335 * fVar309 +
           auVar226._12_4_ * fVar182;
      local_7e0._16_4_ =
           fVar393 * fVar180 + fVar199 * fVar246 + fVar336 * fVar296 + fVar348 * fVar245;
      local_7e0._20_4_ =
           fVar398 * fVar181 + fVar345 * fVar364 + fVar253 * fVar305 + fVar359 * fVar248;
      local_7e0._24_4_ =
           fVar400 * fVar220 + fVar346 * fVar333 + fVar200 * fVar307 + fVar361 * fVar252;
      local_7e0._28_4_ = fVar309 + fVar290 + 0.0 + fVar219;
      local_360 = vsubps_avx(auVar258,auVar321);
      auVar38 = vsubps_avx(auVar232,auVar380);
      fVar221 = local_360._0_4_;
      fVar239 = local_360._4_4_;
      auVar47._4_4_ = auVar380._4_4_ * fVar239;
      auVar47._0_4_ = auVar380._0_4_ * fVar221;
      fVar238 = local_360._8_4_;
      auVar47._8_4_ = auVar380._8_4_ * fVar238;
      fVar243 = local_360._12_4_;
      auVar47._12_4_ = auVar380._12_4_ * fVar243;
      fVar240 = local_360._16_4_;
      auVar47._16_4_ = auVar380._16_4_ * fVar240;
      fVar250 = local_360._20_4_;
      auVar47._20_4_ = auVar380._20_4_ * fVar250;
      fVar242 = local_360._24_4_;
      auVar47._24_4_ = auVar380._24_4_ * fVar242;
      auVar47._28_4_ = fVar219;
      fVar296 = auVar38._0_4_;
      fVar305 = auVar38._4_4_;
      auVar48._4_4_ = fVar305 * auVar321._4_4_;
      auVar48._0_4_ = fVar296 * auVar321._0_4_;
      fVar307 = auVar38._8_4_;
      auVar48._8_4_ = fVar307 * auVar321._8_4_;
      fVar309 = auVar38._12_4_;
      auVar48._12_4_ = fVar309 * auVar321._12_4_;
      fVar199 = auVar38._16_4_;
      auVar48._16_4_ = fVar199 * auVar321._16_4_;
      fVar345 = auVar38._20_4_;
      auVar48._20_4_ = fVar345 * auVar321._20_4_;
      fVar346 = auVar38._24_4_;
      auVar48._24_4_ = fVar346 * auVar321._24_4_;
      auVar48._28_4_ = auVar232._28_4_;
      auVar37 = vsubps_avx(auVar47,auVar48);
      auVar161 = vmaxps_avx(auVar164,local_7e0);
      auVar49._4_4_ = auVar161._4_4_ * auVar161._4_4_ * (fVar239 * fVar239 + fVar305 * fVar305);
      auVar49._0_4_ = auVar161._0_4_ * auVar161._0_4_ * (fVar221 * fVar221 + fVar296 * fVar296);
      auVar49._8_4_ = auVar161._8_4_ * auVar161._8_4_ * (fVar238 * fVar238 + fVar307 * fVar307);
      auVar49._12_4_ = auVar161._12_4_ * auVar161._12_4_ * (fVar243 * fVar243 + fVar309 * fVar309);
      auVar49._16_4_ = auVar161._16_4_ * auVar161._16_4_ * (fVar240 * fVar240 + fVar199 * fVar199);
      auVar49._20_4_ = auVar161._20_4_ * auVar161._20_4_ * (fVar250 * fVar250 + fVar345 * fVar345);
      auVar49._24_4_ = auVar161._24_4_ * auVar161._24_4_ * (fVar242 * fVar242 + fVar346 * fVar346);
      auVar49._28_4_ = auVar258._28_4_ + auVar232._28_4_;
      auVar50._4_4_ = auVar37._4_4_ * auVar37._4_4_;
      auVar50._0_4_ = auVar37._0_4_ * auVar37._0_4_;
      auVar50._8_4_ = auVar37._8_4_ * auVar37._8_4_;
      auVar50._12_4_ = auVar37._12_4_ * auVar37._12_4_;
      auVar50._16_4_ = auVar37._16_4_ * auVar37._16_4_;
      auVar50._20_4_ = auVar37._20_4_ * auVar37._20_4_;
      auVar50._24_4_ = auVar37._24_4_ * auVar37._24_4_;
      auVar50._28_4_ = auVar37._28_4_;
      auVar161 = vcmpps_avx(auVar50,auVar49,2);
      auVar225 = ZEXT416((uint)(float)(int)uVar33);
      local_480._0_16_ = auVar225;
      auVar225 = vshufps_avx(auVar225,auVar225,0);
      auVar233._16_16_ = auVar225;
      auVar233._0_16_ = auVar225;
      auVar37 = vcmpps_avx(_DAT_02020f40,auVar233,1);
      auVar237 = ZEXT3264(auVar37);
      auVar225 = vpermilps_avx(auVar224,0xaa);
      register0x00001490 = auVar225;
      _local_180 = auVar225;
      auVar226 = vpermilps_avx(auVar315,0xaa);
      register0x00001550 = auVar226;
      _local_300 = auVar226;
      auVar227 = vpermilps_avx(auVar325,0xaa);
      register0x00001590 = auVar227;
      _local_e0 = auVar227;
      auVar44 = vpermilps_avx(auVar185,0xaa);
      register0x00001310 = auVar44;
      _local_520 = auVar44;
      auVar282 = auVar37 & auVar161;
      _local_800 = ZEXT416(*(uint *)(ray + k * 4 + 0x30));
      auVar204 = ZEXT416((uint)(auVar204._0_4_ * 4.7683716e-07));
      fVar221 = fVar366;
      fVar239 = fVar373;
      fVar238 = fVar374;
      fVar243 = fVar375;
      fVar240 = fVar201;
      fVar250 = fVar297;
      fVar242 = fVar306;
      local_4e0 = auVar407;
      if ((((((((auVar282 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar282 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar282 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar282 >> 0x7f,0) == '\0') &&
            (auVar282 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar282 >> 0xbf,0) == '\0') &&
          (auVar282 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar282[0x1f]) {
        bVar154 = false;
        auVar397 = ZEXT3264(_local_680);
      }
      else {
        auVar161 = vandps_avx(auVar161,auVar37);
        fVar349 = auVar225._0_4_;
        fVar360 = auVar225._4_4_;
        fVar362 = auVar225._8_4_;
        fVar363 = auVar225._12_4_;
        fVar385 = auVar226._0_4_;
        fVar390 = auVar226._4_4_;
        fVar391 = auVar226._8_4_;
        fVar392 = auVar226._12_4_;
        fVar394 = auVar227._0_4_;
        fVar399 = auVar227._4_4_;
        fVar401 = auVar227._8_4_;
        fVar403 = auVar227._12_4_;
        fVar296 = auVar44._0_4_;
        fVar305 = auVar44._4_4_;
        fVar307 = auVar44._8_4_;
        fVar309 = auVar44._12_4_;
        fVar199 = auVar37._28_4_ +
                  *(float *)(catmullrom_basis1 + lVar152 + 0x924) +
                  *(float *)(catmullrom_basis1 + lVar152 + 0x4a0);
        local_340._0_4_ =
             fVar349 * fVar222 + fVar385 * fVar404 + fVar394 * fVar289 + fVar334 * fVar296;
        local_340._4_4_ =
             fVar360 * fVar273 + fVar390 * fVar405 + fVar399 * fVar291 + fVar249 * fVar305;
        fStack_338 = fVar362 * fVar241 + fVar391 * fVar406 + fVar401 * fVar292 + fVar365 * fVar307;
        fStack_334 = fVar363 * fVar182 + fVar392 * fVar179 + fVar403 * fVar332 + fVar335 * fVar309;
        fStack_330 = fVar349 * fVar245 + fVar385 * fVar180 + fVar394 * fVar246 + fVar336 * fVar296;
        fStack_32c = fVar360 * fVar248 + fVar390 * fVar181 + fVar399 * fVar364 + fVar253 * fVar305;
        fStack_328 = fVar362 * fVar252 + fVar391 * fVar220 + fVar401 * fVar333 + fVar200 * fVar307;
        fStack_324 = auVar161._28_4_ + fVar199;
        local_320._0_4_ = auVar143._0_4_;
        local_320._4_4_ = auVar143._4_4_;
        fStack_318 = auVar143._8_4_;
        local_780._0_4_ = auVar142._0_4_;
        local_780._4_4_ = auVar142._4_4_;
        uStack_778._0_4_ = auVar142._8_4_;
        uStack_778._4_4_ = auVar142._12_4_;
        fStack_770 = auVar142._16_4_;
        fStack_76c = auVar142._20_4_;
        fStack_768 = auVar142._24_4_;
        fVar158 = fVar349 * (float)local_320._0_4_ +
                  fVar385 * fVar268 + fVar394 * fVar350 + fVar296 * (float)local_780._0_4_;
        fVar174 = fVar360 * (float)local_320._4_4_ +
                  fVar390 * fVar270 + fVar399 * fVar244 + fVar305 * (float)local_780._4_4_;
        fVar176 = fVar362 * fStack_318 +
                  fVar391 * fVar271 + fVar401 * fVar247 + fVar307 * (float)uStack_778;
        fVar178 = fVar363 * fVar293 +
                  fVar392 * fVar272 + fVar403 * fVar251 + fVar309 * uStack_778._4_4_;
        fStack_830 = fVar349 * fStack_310 +
                     fVar385 * fVar274 + fVar394 * fVar254 + fVar296 * fStack_770;
        fStack_82c = fVar360 * fStack_30c +
                     fVar390 * fVar285 + fVar399 * fVar264 + fVar305 * fStack_76c;
        fStack_828 = fVar362 * fStack_308 +
                     fVar391 * fVar287 + fVar401 * fVar266 + fVar307 * fStack_768;
        fStack_824 = fStack_324 + fVar199 + auVar161._28_4_ + auVar37._28_4_;
        fVar350 = *(float *)(catmullrom_basis0 + lVar152 + 0x1210);
        fVar244 = *(float *)(catmullrom_basis0 + lVar152 + 0x1214);
        fVar247 = *(float *)(catmullrom_basis0 + lVar152 + 0x1218);
        fVar251 = *(float *)(catmullrom_basis0 + lVar152 + 0x121c);
        fVar254 = *(float *)(catmullrom_basis0 + lVar152 + 0x1220);
        fVar264 = *(float *)(catmullrom_basis0 + lVar152 + 0x1224);
        fVar266 = *(float *)(catmullrom_basis0 + lVar152 + 0x1228);
        fVar268 = *(float *)(catmullrom_basis0 + lVar152 + 0x1694);
        fVar270 = *(float *)(catmullrom_basis0 + lVar152 + 0x1698);
        fVar271 = *(float *)(catmullrom_basis0 + lVar152 + 0x169c);
        fVar272 = *(float *)(catmullrom_basis0 + lVar152 + 0x16a0);
        fVar274 = *(float *)(catmullrom_basis0 + lVar152 + 0x16a4);
        fVar285 = *(float *)(catmullrom_basis0 + lVar152 + 0x16a8);
        fVar287 = *(float *)(catmullrom_basis0 + lVar152 + 0x16ac);
        fVar289 = *(float *)(catmullrom_basis0 + lVar152 + 0x1b18);
        fVar291 = *(float *)(catmullrom_basis0 + lVar152 + 0x1b1c);
        fVar292 = *(float *)(catmullrom_basis0 + lVar152 + 0x1b20);
        fVar293 = *(float *)(catmullrom_basis0 + lVar152 + 0x1b24);
        fVar332 = *(float *)(catmullrom_basis0 + lVar152 + 0x1b28);
        fVar246 = *(float *)(catmullrom_basis0 + lVar152 + 0x1b2c);
        fVar364 = *(float *)(catmullrom_basis0 + lVar152 + 0x1b30);
        fVar333 = *(float *)(catmullrom_basis0 + lVar152 + 0x1f9c);
        fVar334 = *(float *)(catmullrom_basis0 + lVar152 + 0x1fa0);
        fVar249 = *(float *)(catmullrom_basis0 + lVar152 + 0x1fa4);
        fVar365 = *(float *)(catmullrom_basis0 + lVar152 + 0x1fa8);
        fVar335 = *(float *)(catmullrom_basis0 + lVar152 + 0x1fac);
        fVar336 = *(float *)(catmullrom_basis0 + lVar152 + 0x1fb0);
        fVar253 = *(float *)(catmullrom_basis0 + lVar152 + 0x1fb4);
        local_820._0_16_ = auVar204;
        fVar294 = *(float *)(catmullrom_basis1 + lVar152 + 0x4a0) + 0.0;
        fVar200 = *(float *)(catmullrom_basis0 + lVar152 + 0x1b34) +
                  *(float *)(catmullrom_basis0 + lVar152 + 0x1fb8);
        fVar347 = *(float *)(catmullrom_basis0 + lVar152 + 0x16b0) + fVar200;
        auVar193._0_4_ =
             fVar202 * fVar350 + fVar314 * fVar289 + fVar366 * fVar333 + fVar201 * fVar268;
        auVar193._4_4_ =
             fVar215 * fVar244 + fVar214 * fVar291 + fVar373 * fVar334 + fVar297 * fVar270;
        auVar193._8_4_ =
             fVar217 * fVar247 + fVar216 * fVar292 + fVar374 * fVar249 + fVar306 * fVar271;
        auVar193._12_4_ =
             fVar219 * fVar251 + fVar218 * fVar293 + fVar375 * fVar365 + fVar308 * fVar272;
        auVar193._16_4_ =
             fVar202 * fVar254 + fVar314 * fVar332 + fVar366 * fVar335 + fVar201 * fVar274;
        auVar193._20_4_ =
             fVar215 * fVar264 + fVar214 * fVar246 + fVar373 * fVar336 + fVar297 * fVar285;
        auVar193._24_4_ =
             fVar217 * fVar266 + fVar216 * fVar364 + fVar374 * fVar253 + fVar306 * fVar287;
        auVar193._28_4_ = fVar200 + *(float *)(catmullrom_basis1 + lVar152 + 0x1c) + 0.0 + fVar294;
        auVar278._0_4_ =
             fVar385 * fVar268 + fVar394 * fVar289 + fVar296 * fVar333 + fVar349 * fVar350;
        auVar278._4_4_ =
             fVar390 * fVar270 + fVar399 * fVar291 + fVar305 * fVar334 + fVar360 * fVar244;
        auVar278._8_4_ =
             fVar391 * fVar271 + fVar401 * fVar292 + fVar307 * fVar249 + fVar362 * fVar247;
        auVar278._12_4_ =
             fVar392 * fVar272 + fVar403 * fVar293 + fVar309 * fVar365 + fVar363 * fVar251;
        auVar278._16_4_ =
             fVar385 * fVar274 + fVar394 * fVar332 + fVar296 * fVar335 + fVar349 * fVar254;
        auVar278._20_4_ =
             fVar390 * fVar285 + fVar399 * fVar246 + fVar305 * fVar336 + fVar360 * fVar264;
        auVar278._24_4_ =
             fVar391 * fVar287 + fVar401 * fVar364 + fVar307 * fVar253 + fVar362 * fVar266;
        auVar278._28_4_ = fVar347 + *(float *)(catmullrom_basis0 + lVar152 + 0x122c);
        fVar200 = *(float *)(catmullrom_basis1 + lVar152 + 0x1b18);
        fVar404 = *(float *)(catmullrom_basis1 + lVar152 + 0x1b1c);
        fVar405 = *(float *)(catmullrom_basis1 + lVar152 + 0x1b20);
        fVar406 = *(float *)(catmullrom_basis1 + lVar152 + 0x1b24);
        fVar179 = *(float *)(catmullrom_basis1 + lVar152 + 0x1b28);
        fVar180 = *(float *)(catmullrom_basis1 + lVar152 + 0x1b2c);
        fVar181 = *(float *)(catmullrom_basis1 + lVar152 + 0x1b30);
        fVar220 = *(float *)(catmullrom_basis1 + lVar152 + 0x1f9c);
        fVar222 = *(float *)(catmullrom_basis1 + lVar152 + 0x1fa0);
        fVar273 = *(float *)(catmullrom_basis1 + lVar152 + 0x1fa4);
        fVar241 = *(float *)(catmullrom_basis1 + lVar152 + 0x1fa8);
        fVar182 = *(float *)(catmullrom_basis1 + lVar152 + 0x1fac);
        fVar245 = *(float *)(catmullrom_basis1 + lVar152 + 0x1fb0);
        fVar248 = *(float *)(catmullrom_basis1 + lVar152 + 0x1fb4);
        fVar252 = *(float *)(catmullrom_basis1 + lVar152 + 0x1694);
        fVar199 = *(float *)(catmullrom_basis1 + lVar152 + 0x1698);
        fVar345 = *(float *)(catmullrom_basis1 + lVar152 + 0x169c);
        fVar346 = *(float *)(catmullrom_basis1 + lVar152 + 0x16a0);
        fVar348 = *(float *)(catmullrom_basis1 + lVar152 + 0x16a4);
        fVar359 = *(float *)(catmullrom_basis1 + lVar152 + 0x16a8);
        fVar361 = *(float *)(catmullrom_basis1 + lVar152 + 0x16ac);
        fVar393 = *(float *)(catmullrom_basis1 + lVar152 + 0x1210);
        fVar398 = *(float *)(catmullrom_basis1 + lVar152 + 0x1214);
        fVar400 = *(float *)(catmullrom_basis1 + lVar152 + 0x1218);
        fVar402 = *(float *)(catmullrom_basis1 + lVar152 + 0x121c);
        fVar130 = *(float *)(catmullrom_basis1 + lVar152 + 0x1220);
        fVar131 = *(float *)(catmullrom_basis1 + lVar152 + 0x1224);
        fVar132 = *(float *)(catmullrom_basis1 + lVar152 + 0x1228);
        auVar300._0_4_ =
             fVar275 * fVar393 + fVar255 * fVar252 + fVar310 * fVar200 + fVar295 * fVar220;
        auVar300._4_4_ =
             fVar286 * fVar398 + fVar265 * fVar199 + fVar311 * fVar404 + fVar173 * fVar222;
        auVar300._8_4_ =
             fVar288 * fVar400 + fVar267 * fVar345 + fVar312 * fVar405 + fVar175 * fVar273;
        auVar300._12_4_ =
             fVar290 * fVar402 + fVar269 * fVar346 + fVar313 * fVar406 + fVar177 * fVar241;
        auVar300._16_4_ =
             fVar275 * fVar130 + fVar255 * fVar348 + fVar310 * fVar179 + fVar295 * fVar182;
        auVar300._20_4_ =
             fVar286 * fVar131 + fVar265 * fVar359 + fVar311 * fVar180 + fVar173 * fVar245;
        auVar300._24_4_ =
             fVar288 * fVar132 + fVar267 * fVar361 + fVar312 * fVar181 + fVar175 * fVar248;
        auVar300._28_4_ = fVar363 + fVar363 + fVar347 + fVar177;
        auVar341._0_4_ =
             fVar202 * fVar393 + fVar201 * fVar252 + fVar314 * fVar200 + fVar366 * fVar220;
        auVar341._4_4_ =
             fVar215 * fVar398 + fVar297 * fVar199 + fVar214 * fVar404 + fVar373 * fVar222;
        auVar341._8_4_ =
             fVar217 * fVar400 + fVar306 * fVar345 + fVar216 * fVar405 + fVar374 * fVar273;
        auVar341._12_4_ =
             fVar219 * fVar402 + fVar308 * fVar346 + fVar218 * fVar406 + fVar375 * fVar241;
        auVar341._16_4_ =
             fVar202 * fVar130 + fVar201 * fVar348 + fVar314 * fVar179 + fVar366 * fVar182;
        auVar341._20_4_ =
             fVar215 * fVar131 + fVar297 * fVar359 + fVar214 * fVar180 + fVar373 * fVar245;
        auVar341._24_4_ =
             fVar217 * fVar132 + fVar306 * fVar361 + fVar216 * fVar181 + fVar374 * fVar248;
        auVar341._28_4_ = fVar363 + fVar363 + fVar363 + fVar347;
        auVar213._0_4_ =
             fVar349 * fVar393 + fVar385 * fVar252 + fVar394 * fVar200 + fVar220 * fVar296;
        auVar213._4_4_ =
             fVar360 * fVar398 + fVar390 * fVar199 + fVar399 * fVar404 + fVar222 * fVar305;
        auVar213._8_4_ =
             fVar362 * fVar400 + fVar391 * fVar345 + fVar401 * fVar405 + fVar273 * fVar307;
        auVar213._12_4_ =
             fVar363 * fVar402 + fVar392 * fVar346 + fVar403 * fVar406 + fVar241 * fVar309;
        auVar213._16_4_ =
             fVar349 * fVar130 + fVar385 * fVar348 + fVar394 * fVar179 + fVar182 * fVar296;
        auVar213._20_4_ =
             fVar360 * fVar131 + fVar390 * fVar359 + fVar399 * fVar180 + fVar245 * fVar305;
        auVar213._24_4_ =
             fVar362 * fVar132 + fVar391 * fVar361 + fVar401 * fVar181 + fVar248 * fVar307;
        auVar213._28_4_ =
             *(float *)(catmullrom_basis1 + lVar152 + 0x122c) +
             *(float *)(catmullrom_basis1 + lVar152 + 0x16b0) +
             *(float *)(catmullrom_basis1 + lVar152 + 0x1b34) +
             *(float *)(catmullrom_basis1 + lVar152 + 0x1fb8);
        auVar259._8_4_ = 0x7fffffff;
        auVar259._0_8_ = 0x7fffffff7fffffff;
        auVar259._12_4_ = 0x7fffffff;
        auVar259._16_4_ = 0x7fffffff;
        auVar259._20_4_ = 0x7fffffff;
        auVar259._24_4_ = 0x7fffffff;
        auVar259._28_4_ = 0x7fffffff;
        auVar139._4_4_ =
             fVar286 * fVar244 + fVar265 * fVar270 + fVar311 * fVar291 + fVar173 * fVar334;
        auVar139._0_4_ =
             fVar275 * fVar350 + fVar255 * fVar268 + fVar310 * fVar289 + fVar295 * fVar333;
        auVar139._8_4_ =
             fVar288 * fVar247 + fVar267 * fVar271 + fVar312 * fVar292 + fVar175 * fVar249;
        auVar139._12_4_ =
             fVar290 * fVar251 + fVar269 * fVar272 + fVar313 * fVar293 + fVar177 * fVar365;
        auVar139._16_4_ =
             fVar275 * fVar254 + fVar255 * fVar274 + fVar310 * fVar332 + fVar295 * fVar335;
        auVar139._20_4_ =
             fVar286 * fVar264 + fVar265 * fVar285 + fVar311 * fVar246 + fVar173 * fVar336;
        auVar139._24_4_ =
             fVar288 * fVar266 + fVar267 * fVar287 + fVar312 * fVar364 + fVar175 * fVar253;
        auVar139._28_4_ =
             *(float *)(catmullrom_basis0 + lVar152 + 0x16b0) +
             *(float *)(catmullrom_basis0 + lVar152 + 0x1fb8) + fVar294;
        auVar37 = vandps_avx(auVar139,auVar259);
        auVar282 = vandps_avx(auVar193,auVar259);
        auVar282 = vmaxps_avx(auVar37,auVar282);
        auVar37 = vandps_avx(auVar278,auVar259);
        auVar37 = vmaxps_avx(auVar282,auVar37);
        auVar204 = vpermilps_avx(auVar204,0);
        auVar279._16_16_ = auVar204;
        auVar279._0_16_ = auVar204;
        auVar37 = vcmpps_avx(auVar37,auVar279,1);
        auVar39 = vblendvps_avx(auVar139,local_360,auVar37);
        auVar40 = vblendvps_avx(auVar193,auVar38,auVar37);
        auVar37 = vandps_avx(auVar300,auVar259);
        auVar282 = vandps_avx(auVar341,auVar259);
        auVar41 = vmaxps_avx(auVar37,auVar282);
        auVar37 = vandps_avx(auVar213,auVar259);
        auVar37 = vmaxps_avx(auVar41,auVar37);
        auVar41 = vcmpps_avx(auVar37,auVar279,1);
        auVar37 = vblendvps_avx(auVar300,local_360,auVar41);
        auVar38 = vblendvps_avx(auVar341,auVar38,auVar41);
        fVar404 = auVar39._0_4_;
        fVar405 = auVar39._4_4_;
        fVar406 = auVar39._8_4_;
        fVar179 = auVar39._12_4_;
        fVar180 = auVar39._16_4_;
        fVar181 = auVar39._20_4_;
        fVar220 = auVar39._24_4_;
        fVar295 = -auVar39._28_4_;
        fVar222 = auVar37._0_4_;
        fVar273 = auVar37._4_4_;
        fVar241 = auVar37._8_4_;
        fVar182 = auVar37._12_4_;
        fVar245 = auVar37._16_4_;
        fVar248 = auVar37._20_4_;
        fVar252 = auVar37._24_4_;
        fVar350 = auVar40._0_4_;
        fVar254 = auVar40._4_4_;
        fVar270 = auVar40._8_4_;
        fVar285 = auVar40._12_4_;
        fVar292 = auVar40._16_4_;
        fVar364 = auVar40._20_4_;
        fVar365 = auVar40._24_4_;
        auVar165._0_4_ = fVar350 * fVar350 + fVar404 * fVar404;
        auVar165._4_4_ = fVar254 * fVar254 + fVar405 * fVar405;
        auVar165._8_4_ = fVar270 * fVar270 + fVar406 * fVar406;
        auVar165._12_4_ = fVar285 * fVar285 + fVar179 * fVar179;
        auVar165._16_4_ = fVar292 * fVar292 + fVar180 * fVar180;
        auVar165._20_4_ = fVar364 * fVar364 + fVar181 * fVar181;
        auVar165._24_4_ = fVar365 * fVar365 + fVar220 * fVar220;
        auVar165._28_4_ = auVar341._28_4_ + auVar39._28_4_;
        auVar39 = vrsqrtps_avx(auVar165);
        fVar244 = auVar39._0_4_;
        fVar247 = auVar39._4_4_;
        auVar51._4_4_ = fVar247 * 1.5;
        auVar51._0_4_ = fVar244 * 1.5;
        fVar251 = auVar39._8_4_;
        auVar51._8_4_ = fVar251 * 1.5;
        fVar264 = auVar39._12_4_;
        auVar51._12_4_ = fVar264 * 1.5;
        fVar266 = auVar39._16_4_;
        auVar51._16_4_ = fVar266 * 1.5;
        fVar268 = auVar39._20_4_;
        auVar51._20_4_ = fVar268 * 1.5;
        fVar271 = auVar39._24_4_;
        fVar200 = auVar282._28_4_;
        auVar51._24_4_ = fVar271 * 1.5;
        auVar51._28_4_ = fVar200;
        auVar52._4_4_ = fVar247 * fVar247 * fVar247 * auVar165._4_4_ * 0.5;
        auVar52._0_4_ = fVar244 * fVar244 * fVar244 * auVar165._0_4_ * 0.5;
        auVar52._8_4_ = fVar251 * fVar251 * fVar251 * auVar165._8_4_ * 0.5;
        auVar52._12_4_ = fVar264 * fVar264 * fVar264 * auVar165._12_4_ * 0.5;
        auVar52._16_4_ = fVar266 * fVar266 * fVar266 * auVar165._16_4_ * 0.5;
        auVar52._20_4_ = fVar268 * fVar268 * fVar268 * auVar165._20_4_ * 0.5;
        auVar52._24_4_ = fVar271 * fVar271 * fVar271 * auVar165._24_4_ * 0.5;
        auVar52._28_4_ = auVar165._28_4_;
        auVar282 = vsubps_avx(auVar51,auVar52);
        fVar244 = auVar282._0_4_;
        fVar264 = auVar282._4_4_;
        fVar271 = auVar282._8_4_;
        fVar287 = auVar282._12_4_;
        fVar293 = auVar282._16_4_;
        fVar333 = auVar282._20_4_;
        fVar335 = auVar282._24_4_;
        fVar247 = auVar38._0_4_;
        fVar266 = auVar38._4_4_;
        fVar272 = auVar38._8_4_;
        fVar289 = auVar38._12_4_;
        fVar332 = auVar38._16_4_;
        fVar334 = auVar38._20_4_;
        fVar336 = auVar38._24_4_;
        auVar166._0_4_ = fVar247 * fVar247 + fVar222 * fVar222;
        auVar166._4_4_ = fVar266 * fVar266 + fVar273 * fVar273;
        auVar166._8_4_ = fVar272 * fVar272 + fVar241 * fVar241;
        auVar166._12_4_ = fVar289 * fVar289 + fVar182 * fVar182;
        auVar166._16_4_ = fVar332 * fVar332 + fVar245 * fVar245;
        auVar166._20_4_ = fVar334 * fVar334 + fVar248 * fVar248;
        auVar166._24_4_ = fVar336 * fVar336 + fVar252 * fVar252;
        auVar166._28_4_ = auVar37._28_4_ + auVar282._28_4_;
        auVar37 = vrsqrtps_avx(auVar166);
        fVar251 = auVar37._0_4_;
        fVar268 = auVar37._4_4_;
        auVar53._4_4_ = fVar268 * 1.5;
        auVar53._0_4_ = fVar251 * 1.5;
        fVar274 = auVar37._8_4_;
        auVar53._8_4_ = fVar274 * 1.5;
        fVar291 = auVar37._12_4_;
        auVar53._12_4_ = fVar291 * 1.5;
        fVar246 = auVar37._16_4_;
        auVar53._16_4_ = fVar246 * 1.5;
        fVar249 = auVar37._20_4_;
        auVar53._20_4_ = fVar249 * 1.5;
        fVar253 = auVar37._24_4_;
        auVar53._24_4_ = fVar253 * 1.5;
        auVar53._28_4_ = fVar200;
        auVar54._4_4_ = fVar268 * fVar268 * fVar268 * auVar166._4_4_ * 0.5;
        auVar54._0_4_ = fVar251 * fVar251 * fVar251 * auVar166._0_4_ * 0.5;
        auVar54._8_4_ = fVar274 * fVar274 * fVar274 * auVar166._8_4_ * 0.5;
        auVar54._12_4_ = fVar291 * fVar291 * fVar291 * auVar166._12_4_ * 0.5;
        auVar54._16_4_ = fVar246 * fVar246 * fVar246 * auVar166._16_4_ * 0.5;
        auVar54._20_4_ = fVar249 * fVar249 * fVar249 * auVar166._20_4_ * 0.5;
        auVar54._24_4_ = fVar253 * fVar253 * fVar253 * auVar166._24_4_ * 0.5;
        auVar54._28_4_ = auVar166._28_4_;
        auVar37 = vsubps_avx(auVar53,auVar54);
        fVar251 = auVar37._0_4_;
        fVar268 = auVar37._4_4_;
        fVar274 = auVar37._8_4_;
        fVar291 = auVar37._12_4_;
        fVar246 = auVar37._16_4_;
        fVar249 = auVar37._20_4_;
        fVar253 = auVar37._24_4_;
        fVar350 = auVar164._0_4_ * fVar350 * fVar244;
        fVar254 = auVar164._4_4_ * fVar254 * fVar264;
        auVar55._4_4_ = fVar254;
        auVar55._0_4_ = fVar350;
        fVar270 = auVar164._8_4_ * fVar270 * fVar271;
        auVar55._8_4_ = fVar270;
        fVar285 = auVar164._12_4_ * fVar285 * fVar287;
        auVar55._12_4_ = fVar285;
        fVar292 = auVar164._16_4_ * fVar292 * fVar293;
        auVar55._16_4_ = fVar292;
        fVar364 = auVar164._20_4_ * fVar364 * fVar333;
        auVar55._20_4_ = fVar364;
        fVar365 = auVar164._24_4_ * fVar365 * fVar335;
        auVar55._24_4_ = fVar365;
        auVar55._28_4_ = fVar200;
        local_780._4_4_ = fVar254 + auVar321._4_4_;
        local_780._0_4_ = fVar350 + auVar321._0_4_;
        uStack_778._0_4_ = fVar270 + auVar321._8_4_;
        uStack_778._4_4_ = fVar285 + auVar321._12_4_;
        fStack_770 = fVar292 + auVar321._16_4_;
        fStack_76c = fVar364 + auVar321._20_4_;
        fStack_768 = fVar365 + auVar321._24_4_;
        fStack_764 = fVar200 + auVar321._28_4_;
        fVar285 = auVar164._0_4_ * fVar244 * -fVar404;
        fVar292 = auVar164._4_4_ * fVar264 * -fVar405;
        auVar56._4_4_ = fVar292;
        auVar56._0_4_ = fVar285;
        fVar364 = auVar164._8_4_ * fVar271 * -fVar406;
        auVar56._8_4_ = fVar364;
        fVar365 = auVar164._12_4_ * fVar287 * -fVar179;
        auVar56._12_4_ = fVar365;
        fStack_790 = auVar164._16_4_ * fVar293 * -fVar180;
        auVar56._16_4_ = fStack_790;
        fStack_78c = auVar164._20_4_ * fVar333 * -fVar181;
        auVar56._20_4_ = fStack_78c;
        fStack_788 = auVar164._24_4_ * fVar335 * -fVar220;
        auVar56._24_4_ = fStack_788;
        auVar56._28_4_ = fVar295;
        fStack_790 = auVar380._16_4_ + fStack_790;
        fStack_78c = auVar380._20_4_ + fStack_78c;
        fStack_788 = auVar380._24_4_ + fStack_788;
        fStack_784 = auVar380._28_4_ + fVar295;
        fVar350 = fVar244 * 0.0 * auVar164._0_4_;
        fVar244 = fVar264 * 0.0 * auVar164._4_4_;
        auVar57._4_4_ = fVar244;
        auVar57._0_4_ = fVar350;
        fVar254 = fVar271 * 0.0 * auVar164._8_4_;
        auVar57._8_4_ = fVar254;
        fVar264 = fVar287 * 0.0 * auVar164._12_4_;
        auVar57._12_4_ = fVar264;
        fVar270 = fVar293 * 0.0 * auVar164._16_4_;
        auVar57._16_4_ = fVar270;
        fVar271 = fVar333 * 0.0 * auVar164._20_4_;
        auVar57._20_4_ = fVar271;
        fVar287 = fVar335 * 0.0 * auVar164._24_4_;
        auVar57._24_4_ = fVar287;
        auVar57._28_4_ = fVar392;
        auVar137._4_4_ = fVar174;
        auVar137._0_4_ = fVar158;
        auVar137._8_4_ = fVar176;
        auVar137._12_4_ = fVar178;
        auVar137._16_4_ = fStack_830;
        auVar137._20_4_ = fStack_82c;
        auVar137._24_4_ = fStack_828;
        auVar137._28_4_ = fStack_824;
        auVar301._0_4_ = fVar158 + fVar350;
        auVar301._4_4_ = fVar174 + fVar244;
        auVar301._8_4_ = fVar176 + fVar254;
        auVar301._12_4_ = fVar178 + fVar264;
        auVar301._16_4_ = fStack_830 + fVar270;
        auVar301._20_4_ = fStack_82c + fVar271;
        auVar301._24_4_ = fStack_828 + fVar287;
        auVar301._28_4_ = fStack_824 + fVar392;
        fVar350 = local_7e0._0_4_ * fVar247 * fVar251;
        fVar244 = local_7e0._4_4_ * fVar266 * fVar268;
        auVar58._4_4_ = fVar244;
        auVar58._0_4_ = fVar350;
        fVar247 = local_7e0._8_4_ * fVar272 * fVar274;
        auVar58._8_4_ = fVar247;
        fVar254 = local_7e0._12_4_ * fVar289 * fVar291;
        auVar58._12_4_ = fVar254;
        fVar264 = local_7e0._16_4_ * fVar332 * fVar246;
        auVar58._16_4_ = fVar264;
        fVar266 = local_7e0._20_4_ * fVar334 * fVar249;
        auVar58._20_4_ = fVar266;
        fVar270 = local_7e0._24_4_ * fVar336 * fVar253;
        auVar58._24_4_ = fVar270;
        auVar58._28_4_ = auVar38._28_4_;
        auVar41 = vsubps_avx(auVar321,auVar55);
        auVar355._0_4_ = auVar258._0_4_ + fVar350;
        auVar355._4_4_ = auVar258._4_4_ + fVar244;
        auVar355._8_4_ = auVar258._8_4_ + fVar247;
        auVar355._12_4_ = auVar258._12_4_ + fVar254;
        auVar355._16_4_ = auVar258._16_4_ + fVar264;
        auVar355._20_4_ = auVar258._20_4_ + fVar266;
        auVar355._24_4_ = auVar258._24_4_ + fVar270;
        auVar355._28_4_ = auVar258._28_4_ + auVar38._28_4_;
        fVar350 = local_7e0._0_4_ * fVar251 * -fVar222;
        fVar244 = local_7e0._4_4_ * fVar268 * -fVar273;
        auVar59._4_4_ = fVar244;
        auVar59._0_4_ = fVar350;
        fVar247 = local_7e0._8_4_ * fVar274 * -fVar241;
        auVar59._8_4_ = fVar247;
        fVar254 = local_7e0._12_4_ * fVar291 * -fVar182;
        auVar59._12_4_ = fVar254;
        fVar264 = local_7e0._16_4_ * fVar246 * -fVar245;
        auVar59._16_4_ = fVar264;
        fVar266 = local_7e0._20_4_ * fVar249 * -fVar248;
        auVar59._20_4_ = fVar266;
        fVar270 = local_7e0._24_4_ * fVar253 * -fVar252;
        auVar59._24_4_ = fVar270;
        auVar59._28_4_ = fVar403;
        auVar42 = vsubps_avx(auVar380,auVar56);
        auVar372._0_4_ = fVar350 + auVar232._0_4_;
        auVar372._4_4_ = fVar244 + auVar232._4_4_;
        auVar372._8_4_ = fVar247 + auVar232._8_4_;
        auVar372._12_4_ = fVar254 + auVar232._12_4_;
        auVar372._16_4_ = fVar264 + auVar232._16_4_;
        auVar372._20_4_ = fVar266 + auVar232._20_4_;
        auVar372._24_4_ = fVar270 + auVar232._24_4_;
        auVar372._28_4_ = fVar403 + auVar232._28_4_;
        fVar350 = fVar251 * 0.0 * local_7e0._0_4_;
        fVar244 = fVar268 * 0.0 * local_7e0._4_4_;
        auVar60._4_4_ = fVar244;
        auVar60._0_4_ = fVar350;
        fVar247 = fVar274 * 0.0 * local_7e0._8_4_;
        auVar60._8_4_ = fVar247;
        fVar251 = fVar291 * 0.0 * local_7e0._12_4_;
        auVar60._12_4_ = fVar251;
        fVar254 = fVar246 * 0.0 * local_7e0._16_4_;
        auVar60._16_4_ = fVar254;
        fVar264 = fVar249 * 0.0 * local_7e0._20_4_;
        auVar60._20_4_ = fVar264;
        fVar266 = fVar253 * 0.0 * local_7e0._24_4_;
        auVar60._24_4_ = fVar266;
        auVar60._28_4_ = fVar295;
        auVar45 = vsubps_avx(auVar137,auVar57);
        auVar408._0_4_ = (float)local_340._0_4_ + fVar350;
        auVar408._4_4_ = (float)local_340._4_4_ + fVar244;
        auVar408._8_4_ = fStack_338 + fVar247;
        auVar408._12_4_ = fStack_334 + fVar251;
        auVar408._16_4_ = fStack_330 + fVar254;
        auVar408._20_4_ = fStack_32c + fVar264;
        auVar408._24_4_ = fStack_328 + fVar266;
        auVar408._28_4_ = fStack_324 + fVar295;
        auVar37 = vsubps_avx(auVar258,auVar58);
        auVar38 = vsubps_avx(auVar232,auVar59);
        auVar282 = vsubps_avx(_local_340,auVar60);
        auVar39 = vsubps_avx(auVar372,auVar42);
        auVar40 = vsubps_avx(auVar408,auVar45);
        auVar61._4_4_ = auVar45._4_4_ * auVar39._4_4_;
        auVar61._0_4_ = auVar45._0_4_ * auVar39._0_4_;
        auVar61._8_4_ = auVar45._8_4_ * auVar39._8_4_;
        auVar61._12_4_ = auVar45._12_4_ * auVar39._12_4_;
        auVar61._16_4_ = auVar45._16_4_ * auVar39._16_4_;
        auVar61._20_4_ = auVar45._20_4_ * auVar39._20_4_;
        auVar61._24_4_ = auVar45._24_4_ * auVar39._24_4_;
        auVar61._28_4_ = fVar403;
        auVar62._4_4_ = auVar42._4_4_ * auVar40._4_4_;
        auVar62._0_4_ = auVar42._0_4_ * auVar40._0_4_;
        auVar62._8_4_ = auVar42._8_4_ * auVar40._8_4_;
        auVar62._12_4_ = auVar42._12_4_ * auVar40._12_4_;
        auVar62._16_4_ = auVar42._16_4_ * auVar40._16_4_;
        auVar62._20_4_ = auVar42._20_4_ * auVar40._20_4_;
        auVar62._24_4_ = auVar42._24_4_ * auVar40._24_4_;
        auVar62._28_4_ = auVar232._28_4_;
        auVar43 = vsubps_avx(auVar62,auVar61);
        auVar63._4_4_ = auVar41._4_4_ * auVar40._4_4_;
        auVar63._0_4_ = auVar41._0_4_ * auVar40._0_4_;
        auVar63._8_4_ = auVar41._8_4_ * auVar40._8_4_;
        auVar63._12_4_ = auVar41._12_4_ * auVar40._12_4_;
        auVar63._16_4_ = auVar41._16_4_ * auVar40._16_4_;
        auVar63._20_4_ = auVar41._20_4_ * auVar40._20_4_;
        auVar63._24_4_ = auVar41._24_4_ * auVar40._24_4_;
        auVar63._28_4_ = auVar40._28_4_;
        auVar46 = vsubps_avx(auVar355,auVar41);
        auVar64._4_4_ = auVar45._4_4_ * auVar46._4_4_;
        auVar64._0_4_ = auVar45._0_4_ * auVar46._0_4_;
        auVar64._8_4_ = auVar45._8_4_ * auVar46._8_4_;
        auVar64._12_4_ = auVar45._12_4_ * auVar46._12_4_;
        auVar64._16_4_ = auVar45._16_4_ * auVar46._16_4_;
        auVar64._20_4_ = auVar45._20_4_ * auVar46._20_4_;
        auVar64._24_4_ = auVar45._24_4_ * auVar46._24_4_;
        auVar64._28_4_ = auVar258._28_4_;
        auVar162 = vsubps_avx(auVar64,auVar63);
        auVar65._4_4_ = auVar46._4_4_ * auVar42._4_4_;
        auVar65._0_4_ = auVar46._0_4_ * auVar42._0_4_;
        auVar65._8_4_ = auVar46._8_4_ * auVar42._8_4_;
        auVar65._12_4_ = auVar46._12_4_ * auVar42._12_4_;
        auVar65._16_4_ = auVar46._16_4_ * auVar42._16_4_;
        auVar65._20_4_ = auVar46._20_4_ * auVar42._20_4_;
        auVar65._24_4_ = auVar46._24_4_ * auVar42._24_4_;
        auVar65._28_4_ = auVar40._28_4_;
        auVar66._4_4_ = auVar41._4_4_ * auVar39._4_4_;
        auVar66._0_4_ = auVar41._0_4_ * auVar39._0_4_;
        auVar66._8_4_ = auVar41._8_4_ * auVar39._8_4_;
        auVar66._12_4_ = auVar41._12_4_ * auVar39._12_4_;
        auVar66._16_4_ = auVar41._16_4_ * auVar39._16_4_;
        auVar66._20_4_ = auVar41._20_4_ * auVar39._20_4_;
        auVar66._24_4_ = auVar41._24_4_ * auVar39._24_4_;
        auVar66._28_4_ = auVar39._28_4_;
        auVar39 = vsubps_avx(auVar66,auVar65);
        auVar167._0_4_ = auVar43._0_4_ * 0.0 + auVar39._0_4_ + auVar162._0_4_ * 0.0;
        auVar167._4_4_ = auVar43._4_4_ * 0.0 + auVar39._4_4_ + auVar162._4_4_ * 0.0;
        auVar167._8_4_ = auVar43._8_4_ * 0.0 + auVar39._8_4_ + auVar162._8_4_ * 0.0;
        auVar167._12_4_ = auVar43._12_4_ * 0.0 + auVar39._12_4_ + auVar162._12_4_ * 0.0;
        auVar167._16_4_ = auVar43._16_4_ * 0.0 + auVar39._16_4_ + auVar162._16_4_ * 0.0;
        auVar167._20_4_ = auVar43._20_4_ * 0.0 + auVar39._20_4_ + auVar162._20_4_ * 0.0;
        auVar167._24_4_ = auVar43._24_4_ * 0.0 + auVar39._24_4_ + auVar162._24_4_ * 0.0;
        auVar167._28_4_ = auVar39._28_4_ + auVar39._28_4_ + auVar162._28_4_;
        auVar43 = vcmpps_avx(auVar167,ZEXT432(0) << 0x20,2);
        local_740 = vblendvps_avx(auVar37,_local_780,auVar43);
        auVar140._4_4_ = auVar380._4_4_ + fVar292;
        auVar140._0_4_ = auVar380._0_4_ + fVar285;
        auVar140._8_4_ = auVar380._8_4_ + fVar364;
        auVar140._12_4_ = auVar380._12_4_ + fVar365;
        auVar140._16_4_ = fStack_790;
        auVar140._20_4_ = fStack_78c;
        auVar140._24_4_ = fStack_788;
        auVar140._28_4_ = fStack_784;
        auVar37 = vblendvps_avx(auVar38,auVar140,auVar43);
        auVar38 = vblendvps_avx(auVar282,auVar301,auVar43);
        auVar282 = vblendvps_avx(auVar41,auVar355,auVar43);
        auVar39 = vblendvps_avx(auVar42,auVar372,auVar43);
        auVar40 = vblendvps_avx(auVar45,auVar408,auVar43);
        auVar41 = vblendvps_avx(auVar355,auVar41,auVar43);
        auVar42 = vblendvps_avx(auVar372,auVar42,auVar43);
        local_7c0._0_16_ = vpackssdw_avx(auVar161._0_16_,auVar161._16_16_);
        local_7c0._16_16_ = auVar161._16_16_;
        auVar161 = vblendvps_avx(auVar408,auVar45,auVar43);
        auVar41 = vsubps_avx(auVar41,local_740);
        auVar45 = vsubps_avx(auVar42,auVar37);
        auVar46 = vsubps_avx(auVar161,auVar38);
        auVar161 = vsubps_avx(auVar37,auVar39);
        fVar350 = auVar45._0_4_;
        fVar220 = auVar38._0_4_;
        fVar264 = auVar45._4_4_;
        fVar222 = auVar38._4_4_;
        auVar67._4_4_ = fVar222 * fVar264;
        auVar67._0_4_ = fVar220 * fVar350;
        fVar272 = auVar45._8_4_;
        fVar273 = auVar38._8_4_;
        auVar67._8_4_ = fVar273 * fVar272;
        fVar291 = auVar45._12_4_;
        fVar241 = auVar38._12_4_;
        auVar67._12_4_ = fVar241 * fVar291;
        fVar364 = auVar45._16_4_;
        fVar182 = auVar38._16_4_;
        auVar67._16_4_ = fVar182 * fVar364;
        fVar335 = auVar45._20_4_;
        fVar245 = auVar38._20_4_;
        auVar67._20_4_ = fVar245 * fVar335;
        fVar405 = auVar45._24_4_;
        fVar248 = auVar38._24_4_;
        auVar67._24_4_ = fVar248 * fVar405;
        auVar67._28_4_ = auVar42._28_4_;
        fVar244 = auVar37._0_4_;
        fVar312 = auVar46._0_4_;
        fVar266 = auVar37._4_4_;
        fVar313 = auVar46._4_4_;
        auVar68._4_4_ = fVar313 * fVar266;
        auVar68._0_4_ = fVar312 * fVar244;
        fVar274 = auVar37._8_4_;
        fVar314 = auVar46._8_4_;
        auVar68._8_4_ = fVar314 * fVar274;
        fVar292 = auVar37._12_4_;
        fVar202 = auVar46._12_4_;
        auVar68._12_4_ = fVar202 * fVar292;
        fVar333 = auVar37._16_4_;
        fVar214 = auVar46._16_4_;
        auVar68._16_4_ = fVar214 * fVar333;
        fVar336 = auVar37._20_4_;
        fVar215 = auVar46._20_4_;
        auVar68._20_4_ = fVar215 * fVar336;
        fVar406 = auVar37._24_4_;
        fVar216 = auVar46._24_4_;
        auVar68._24_4_ = fVar216 * fVar406;
        auVar68._28_4_ = auVar372._28_4_;
        auVar42 = vsubps_avx(auVar68,auVar67);
        fVar247 = local_740._0_4_;
        fVar268 = local_740._4_4_;
        auVar69._4_4_ = fVar313 * fVar268;
        auVar69._0_4_ = fVar312 * fVar247;
        fVar285 = local_740._8_4_;
        auVar69._8_4_ = fVar314 * fVar285;
        fVar293 = local_740._12_4_;
        auVar69._12_4_ = fVar202 * fVar293;
        fVar334 = local_740._16_4_;
        auVar69._16_4_ = fVar214 * fVar334;
        fVar253 = local_740._20_4_;
        auVar69._20_4_ = fVar215 * fVar253;
        fVar179 = local_740._24_4_;
        auVar69._24_4_ = fVar216 * fVar179;
        auVar69._28_4_ = auVar372._28_4_;
        fVar251 = auVar41._0_4_;
        auVar396._0_4_ = fVar220 * fVar251;
        fVar270 = auVar41._4_4_;
        auVar396._4_4_ = fVar222 * fVar270;
        fVar287 = auVar41._8_4_;
        auVar396._8_4_ = fVar273 * fVar287;
        fVar332 = auVar41._12_4_;
        auVar396._12_4_ = fVar241 * fVar332;
        fVar249 = auVar41._16_4_;
        auVar396._16_4_ = fVar182 * fVar249;
        fVar200 = auVar41._20_4_;
        auVar396._20_4_ = fVar245 * fVar200;
        fVar180 = auVar41._24_4_;
        auVar396._24_4_ = fVar248 * fVar180;
        auVar396._28_4_ = 0;
        auVar162 = vsubps_avx(auVar396,auVar69);
        auVar70._4_4_ = fVar266 * fVar270;
        auVar70._0_4_ = fVar244 * fVar251;
        auVar70._8_4_ = fVar274 * fVar287;
        auVar70._12_4_ = fVar292 * fVar332;
        auVar70._16_4_ = fVar333 * fVar249;
        auVar70._20_4_ = fVar336 * fVar200;
        auVar70._24_4_ = fVar406 * fVar180;
        auVar70._28_4_ = auVar372._28_4_;
        auVar71._4_4_ = fVar268 * fVar264;
        auVar71._0_4_ = fVar247 * fVar350;
        auVar71._8_4_ = fVar285 * fVar272;
        auVar71._12_4_ = fVar293 * fVar291;
        auVar71._16_4_ = fVar334 * fVar364;
        auVar71._20_4_ = fVar253 * fVar335;
        auVar71._24_4_ = fVar179 * fVar405;
        auVar71._28_4_ = auVar408._28_4_;
        auVar163 = vsubps_avx(auVar71,auVar70);
        auVar190 = vsubps_avx(auVar38,auVar40);
        fVar254 = auVar163._28_4_ + auVar162._28_4_;
        auVar194._0_4_ = auVar163._0_4_ + auVar162._0_4_ * 0.0 + auVar42._0_4_ * 0.0;
        auVar194._4_4_ = auVar163._4_4_ + auVar162._4_4_ * 0.0 + auVar42._4_4_ * 0.0;
        auVar194._8_4_ = auVar163._8_4_ + auVar162._8_4_ * 0.0 + auVar42._8_4_ * 0.0;
        auVar194._12_4_ = auVar163._12_4_ + auVar162._12_4_ * 0.0 + auVar42._12_4_ * 0.0;
        auVar194._16_4_ = auVar163._16_4_ + auVar162._16_4_ * 0.0 + auVar42._16_4_ * 0.0;
        auVar194._20_4_ = auVar163._20_4_ + auVar162._20_4_ * 0.0 + auVar42._20_4_ * 0.0;
        auVar194._24_4_ = auVar163._24_4_ + auVar162._24_4_ * 0.0 + auVar42._24_4_ * 0.0;
        auVar194._28_4_ = fVar254 + auVar42._28_4_;
        fVar252 = auVar161._0_4_;
        fVar295 = auVar161._4_4_;
        auVar72._4_4_ = fVar295 * auVar40._4_4_;
        auVar72._0_4_ = fVar252 * auVar40._0_4_;
        fVar173 = auVar161._8_4_;
        auVar72._8_4_ = fVar173 * auVar40._8_4_;
        fVar175 = auVar161._12_4_;
        auVar72._12_4_ = fVar175 * auVar40._12_4_;
        fVar177 = auVar161._16_4_;
        auVar72._16_4_ = fVar177 * auVar40._16_4_;
        fVar310 = auVar161._20_4_;
        auVar72._20_4_ = fVar310 * auVar40._20_4_;
        fVar311 = auVar161._24_4_;
        auVar72._24_4_ = fVar311 * auVar40._24_4_;
        auVar72._28_4_ = fVar254;
        fVar254 = auVar190._0_4_;
        fVar271 = auVar190._4_4_;
        auVar73._4_4_ = auVar39._4_4_ * fVar271;
        auVar73._0_4_ = auVar39._0_4_ * fVar254;
        fVar289 = auVar190._8_4_;
        auVar73._8_4_ = auVar39._8_4_ * fVar289;
        fVar246 = auVar190._12_4_;
        auVar73._12_4_ = auVar39._12_4_ * fVar246;
        fVar365 = auVar190._16_4_;
        auVar73._16_4_ = auVar39._16_4_ * fVar365;
        fVar404 = auVar190._20_4_;
        auVar73._20_4_ = auVar39._20_4_ * fVar404;
        fVar181 = auVar190._24_4_;
        auVar73._24_4_ = auVar39._24_4_ * fVar181;
        auVar73._28_4_ = auVar163._28_4_;
        auVar161 = vsubps_avx(auVar73,auVar72);
        auVar162 = vsubps_avx(local_740,auVar282);
        fVar217 = auVar162._0_4_;
        fVar218 = auVar162._4_4_;
        auVar74._4_4_ = fVar218 * auVar40._4_4_;
        auVar74._0_4_ = fVar217 * auVar40._0_4_;
        fVar219 = auVar162._8_4_;
        auVar74._8_4_ = fVar219 * auVar40._8_4_;
        fVar255 = auVar162._12_4_;
        auVar74._12_4_ = fVar255 * auVar40._12_4_;
        fVar265 = auVar162._16_4_;
        auVar74._16_4_ = fVar265 * auVar40._16_4_;
        fVar267 = auVar162._20_4_;
        auVar74._20_4_ = fVar267 * auVar40._20_4_;
        fVar269 = auVar162._24_4_;
        auVar74._24_4_ = fVar269 * auVar40._24_4_;
        auVar74._28_4_ = auVar40._28_4_;
        auVar75._4_4_ = auVar282._4_4_ * fVar271;
        auVar75._0_4_ = auVar282._0_4_ * fVar254;
        auVar75._8_4_ = auVar282._8_4_ * fVar289;
        auVar75._12_4_ = auVar282._12_4_ * fVar246;
        auVar75._16_4_ = auVar282._16_4_ * fVar365;
        auVar75._20_4_ = auVar282._20_4_ * fVar404;
        auVar75._24_4_ = auVar282._24_4_ * fVar181;
        auVar75._28_4_ = auVar42._28_4_;
        auVar42 = vsubps_avx(auVar74,auVar75);
        auVar76._4_4_ = auVar39._4_4_ * fVar218;
        auVar76._0_4_ = auVar39._0_4_ * fVar217;
        auVar76._8_4_ = auVar39._8_4_ * fVar219;
        auVar76._12_4_ = auVar39._12_4_ * fVar255;
        auVar76._16_4_ = auVar39._16_4_ * fVar265;
        auVar76._20_4_ = auVar39._20_4_ * fVar267;
        auVar76._24_4_ = auVar39._24_4_ * fVar269;
        auVar76._28_4_ = auVar40._28_4_;
        auVar77._4_4_ = auVar282._4_4_ * fVar295;
        auVar77._0_4_ = auVar282._0_4_ * fVar252;
        auVar77._8_4_ = auVar282._8_4_ * fVar173;
        auVar77._12_4_ = auVar282._12_4_ * fVar175;
        auVar77._16_4_ = auVar282._16_4_ * fVar177;
        auVar77._20_4_ = auVar282._20_4_ * fVar310;
        auVar77._24_4_ = auVar282._24_4_ * fVar311;
        auVar77._28_4_ = auVar282._28_4_;
        auVar282 = vsubps_avx(auVar77,auVar76);
        auVar198 = ZEXT864(0) << 0x20;
        auVar260._0_4_ = auVar161._0_4_ * 0.0 + auVar282._0_4_ + auVar42._0_4_ * 0.0;
        auVar260._4_4_ = auVar161._4_4_ * 0.0 + auVar282._4_4_ + auVar42._4_4_ * 0.0;
        auVar260._8_4_ = auVar161._8_4_ * 0.0 + auVar282._8_4_ + auVar42._8_4_ * 0.0;
        auVar260._12_4_ = auVar161._12_4_ * 0.0 + auVar282._12_4_ + auVar42._12_4_ * 0.0;
        auVar260._16_4_ = auVar161._16_4_ * 0.0 + auVar282._16_4_ + auVar42._16_4_ * 0.0;
        auVar260._20_4_ = auVar161._20_4_ * 0.0 + auVar282._20_4_ + auVar42._20_4_ * 0.0;
        auVar260._24_4_ = auVar161._24_4_ * 0.0 + auVar282._24_4_ + auVar42._24_4_ * 0.0;
        auVar260._28_4_ = auVar282._28_4_ + auVar282._28_4_ + auVar42._28_4_;
        auVar161 = vmaxps_avx(auVar194,auVar260);
        auVar161 = vcmpps_avx(auVar161,ZEXT832(0) << 0x20,2);
        auVar204 = vpackssdw_avx(auVar161._0_16_,auVar161._16_16_);
        auVar204 = vpand_avx(auVar204,local_7c0._0_16_);
        auVar225 = vpmovsxwd_avx(auVar204);
        auVar226 = vpunpckhwd_avx(auVar204,auVar204);
        auVar234._16_16_ = auVar226;
        auVar234._0_16_ = auVar225;
        if ((((((((auVar234 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar234 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar234 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar234 >> 0x7f,0) == '\0') &&
              (auVar234 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar226 >> 0x3f,0) == '\0') &&
            (auVar234 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar226[0xf]) {
LAB_012942ba:
          auVar172 = ZEXT3264(CONCAT824(uStack_548,
                                        CONCAT816(uStack_550,CONCAT88(uStack_558,local_560))));
          auVar237 = ZEXT3264(auVar234);
          auVar358 = ZEXT3264(local_5a0);
          auVar344 = ZEXT3264(local_5c0);
        }
        else {
          auVar78._4_4_ = fVar271 * fVar264;
          auVar78._0_4_ = fVar254 * fVar350;
          auVar78._8_4_ = fVar289 * fVar272;
          auVar78._12_4_ = fVar246 * fVar291;
          auVar78._16_4_ = fVar365 * fVar364;
          auVar78._20_4_ = fVar404 * fVar335;
          auVar78._24_4_ = fVar181 * fVar405;
          auVar78._28_4_ = auVar226._12_4_;
          auVar381._0_4_ = fVar252 * fVar312;
          auVar381._4_4_ = fVar295 * fVar313;
          auVar381._8_4_ = fVar173 * fVar314;
          auVar381._12_4_ = fVar175 * fVar202;
          auVar381._16_4_ = fVar177 * fVar214;
          auVar381._20_4_ = fVar310 * fVar215;
          auVar381._24_4_ = fVar311 * fVar216;
          auVar381._28_4_ = 0;
          auVar161 = vsubps_avx(auVar381,auVar78);
          auVar79._4_4_ = fVar218 * fVar313;
          auVar79._0_4_ = fVar217 * fVar312;
          auVar79._8_4_ = fVar219 * fVar314;
          auVar79._12_4_ = fVar255 * fVar202;
          auVar79._16_4_ = fVar265 * fVar214;
          auVar79._20_4_ = fVar267 * fVar215;
          auVar79._24_4_ = fVar269 * fVar216;
          auVar79._28_4_ = auVar46._28_4_;
          auVar80._4_4_ = fVar271 * fVar270;
          auVar80._0_4_ = fVar254 * fVar251;
          auVar80._8_4_ = fVar289 * fVar287;
          auVar80._12_4_ = fVar246 * fVar332;
          auVar80._16_4_ = fVar365 * fVar249;
          auVar80._20_4_ = fVar404 * fVar200;
          auVar80._24_4_ = fVar181 * fVar180;
          auVar80._28_4_ = auVar190._28_4_;
          auVar39 = vsubps_avx(auVar80,auVar79);
          auVar81._4_4_ = fVar295 * fVar270;
          auVar81._0_4_ = fVar252 * fVar251;
          auVar81._8_4_ = fVar173 * fVar287;
          auVar81._12_4_ = fVar175 * fVar332;
          auVar81._16_4_ = fVar177 * fVar249;
          auVar81._20_4_ = fVar310 * fVar200;
          auVar81._24_4_ = fVar311 * fVar180;
          auVar81._28_4_ = auVar194._28_4_;
          auVar82._4_4_ = fVar218 * fVar264;
          auVar82._0_4_ = fVar217 * fVar350;
          auVar82._8_4_ = fVar219 * fVar272;
          auVar82._12_4_ = fVar255 * fVar291;
          auVar82._16_4_ = fVar265 * fVar364;
          auVar82._20_4_ = fVar267 * fVar335;
          auVar82._24_4_ = fVar269 * fVar405;
          auVar82._28_4_ = auVar45._28_4_;
          auVar40 = vsubps_avx(auVar82,auVar81);
          auVar322._0_4_ = auVar161._0_4_ * 0.0 + auVar40._0_4_ + auVar39._0_4_ * 0.0;
          auVar322._4_4_ = auVar161._4_4_ * 0.0 + auVar40._4_4_ + auVar39._4_4_ * 0.0;
          auVar322._8_4_ = auVar161._8_4_ * 0.0 + auVar40._8_4_ + auVar39._8_4_ * 0.0;
          auVar322._12_4_ = auVar161._12_4_ * 0.0 + auVar40._12_4_ + auVar39._12_4_ * 0.0;
          auVar322._16_4_ = auVar161._16_4_ * 0.0 + auVar40._16_4_ + auVar39._16_4_ * 0.0;
          auVar322._20_4_ = auVar161._20_4_ * 0.0 + auVar40._20_4_ + auVar39._20_4_ * 0.0;
          auVar322._24_4_ = auVar161._24_4_ * 0.0 + auVar40._24_4_ + auVar39._24_4_ * 0.0;
          auVar322._28_4_ = auVar45._28_4_ + auVar40._28_4_ + auVar194._28_4_;
          auVar282 = vrcpps_avx(auVar322);
          fVar350 = auVar282._0_4_;
          fVar251 = auVar282._4_4_;
          auVar83._4_4_ = auVar322._4_4_ * fVar251;
          auVar83._0_4_ = auVar322._0_4_ * fVar350;
          fVar254 = auVar282._8_4_;
          auVar83._8_4_ = auVar322._8_4_ * fVar254;
          fVar264 = auVar282._12_4_;
          auVar83._12_4_ = auVar322._12_4_ * fVar264;
          fVar270 = auVar282._16_4_;
          auVar83._16_4_ = auVar322._16_4_ * fVar270;
          fVar271 = auVar282._20_4_;
          auVar83._20_4_ = auVar322._20_4_ * fVar271;
          fVar272 = auVar282._24_4_;
          auVar83._24_4_ = auVar322._24_4_ * fVar272;
          auVar83._28_4_ = auVar190._28_4_;
          auVar382._8_4_ = 0x3f800000;
          auVar382._0_8_ = &DAT_3f8000003f800000;
          auVar382._12_4_ = 0x3f800000;
          auVar382._16_4_ = 0x3f800000;
          auVar382._20_4_ = 0x3f800000;
          auVar382._24_4_ = 0x3f800000;
          auVar382._28_4_ = 0x3f800000;
          auVar42 = vsubps_avx(auVar382,auVar83);
          fVar350 = auVar42._0_4_ * fVar350 + fVar350;
          fVar251 = auVar42._4_4_ * fVar251 + fVar251;
          fVar254 = auVar42._8_4_ * fVar254 + fVar254;
          fVar264 = auVar42._12_4_ * fVar264 + fVar264;
          fVar270 = auVar42._16_4_ * fVar270 + fVar270;
          fVar271 = auVar42._20_4_ * fVar271 + fVar271;
          fVar272 = auVar42._24_4_ * fVar272 + fVar272;
          auVar84._4_4_ =
               (auVar161._4_4_ * fVar268 + auVar39._4_4_ * fVar266 + auVar40._4_4_ * fVar222) *
               fVar251;
          auVar84._0_4_ =
               (auVar161._0_4_ * fVar247 + auVar39._0_4_ * fVar244 + auVar40._0_4_ * fVar220) *
               fVar350;
          auVar84._8_4_ =
               (auVar161._8_4_ * fVar285 + auVar39._8_4_ * fVar274 + auVar40._8_4_ * fVar273) *
               fVar254;
          auVar84._12_4_ =
               (auVar161._12_4_ * fVar293 + auVar39._12_4_ * fVar292 + auVar40._12_4_ * fVar241) *
               fVar264;
          auVar84._16_4_ =
               (auVar161._16_4_ * fVar334 + auVar39._16_4_ * fVar333 + auVar40._16_4_ * fVar182) *
               fVar270;
          auVar84._20_4_ =
               (auVar161._20_4_ * fVar253 + auVar39._20_4_ * fVar336 + auVar40._20_4_ * fVar245) *
               fVar271;
          auVar84._24_4_ =
               (auVar161._24_4_ * fVar179 + auVar39._24_4_ * fVar406 + auVar40._24_4_ * fVar248) *
               fVar272;
          auVar84._28_4_ = local_740._28_4_ + auVar41._28_4_ + auVar38._28_4_;
          auVar225 = vpermilps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x30)),0);
          auVar235._16_16_ = auVar225;
          auVar235._0_16_ = auVar225;
          auVar161 = vcmpps_avx(auVar235,auVar84,2);
          uVar324 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar280._4_4_ = uVar324;
          auVar280._0_4_ = uVar324;
          auVar280._8_4_ = uVar324;
          auVar280._12_4_ = uVar324;
          auVar280._16_4_ = uVar324;
          auVar280._20_4_ = uVar324;
          auVar280._24_4_ = uVar324;
          auVar280._28_4_ = uVar324;
          auVar38 = vcmpps_avx(auVar84,auVar280,2);
          auVar161 = vandps_avx(auVar38,auVar161);
          auVar225 = vpackssdw_avx(auVar161._0_16_,auVar161._16_16_);
          auVar204 = vpand_avx(auVar204,auVar225);
          auVar225 = vpmovsxwd_avx(auVar204);
          auVar226 = vpshufd_avx(auVar204,0xee);
          auVar226 = vpmovsxwd_avx(auVar226);
          auVar234._16_16_ = auVar226;
          auVar234._0_16_ = auVar225;
          if ((((((((auVar234 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar234 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar234 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar234 >> 0x7f,0) == '\0') &&
                (auVar234 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar226 >> 0x3f,0) == '\0') &&
              (auVar234 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar226[0xf]) goto LAB_012942ba;
          auVar161 = vcmpps_avx(ZEXT832(0) << 0x20,auVar322,4);
          auVar225 = vpackssdw_avx(auVar161._0_16_,auVar161._16_16_);
          auVar204 = vpand_avx(auVar204,auVar225);
          auVar225 = vpmovsxwd_avx(auVar204);
          auVar204 = vpunpckhwd_avx(auVar204,auVar204);
          auVar237 = ZEXT1664(auVar204);
          auVar302._16_16_ = auVar204;
          auVar302._0_16_ = auVar225;
          auVar172 = ZEXT3264(CONCAT824(uStack_548,
                                        CONCAT816(uStack_550,CONCAT88(uStack_558,local_560))));
          auVar358 = ZEXT3264(local_5a0);
          auVar344 = ZEXT3264(local_5c0);
          if ((((((((auVar302 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar302 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar302 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar302 >> 0x7f,0) != '\0') ||
                (auVar302 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar204 >> 0x3f,0) != '\0') ||
              (auVar302 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar204[0xf] < '\0') {
            auVar236._0_4_ = auVar194._0_4_ * fVar350;
            auVar236._4_4_ = auVar194._4_4_ * fVar251;
            auVar236._8_4_ = auVar194._8_4_ * fVar254;
            auVar236._12_4_ = auVar194._12_4_ * fVar264;
            auVar236._16_4_ = auVar194._16_4_ * fVar270;
            auVar236._20_4_ = auVar194._20_4_ * fVar271;
            auVar236._24_4_ = auVar194._24_4_ * fVar272;
            auVar236._28_4_ = 0;
            auVar85._4_4_ = auVar260._4_4_ * fVar251;
            auVar85._0_4_ = auVar260._0_4_ * fVar350;
            auVar85._8_4_ = auVar260._8_4_ * fVar254;
            auVar85._12_4_ = auVar260._12_4_ * fVar264;
            auVar85._16_4_ = auVar260._16_4_ * fVar270;
            auVar85._20_4_ = auVar260._20_4_ * fVar271;
            auVar85._24_4_ = auVar260._24_4_ * fVar272;
            auVar85._28_4_ = auVar42._28_4_ + auVar282._28_4_;
            auVar281._8_4_ = 0x3f800000;
            auVar281._0_8_ = &DAT_3f8000003f800000;
            auVar281._12_4_ = 0x3f800000;
            auVar281._16_4_ = 0x3f800000;
            auVar281._20_4_ = 0x3f800000;
            auVar281._24_4_ = 0x3f800000;
            auVar281._28_4_ = 0x3f800000;
            auVar161 = vsubps_avx(auVar281,auVar236);
            auVar161 = vblendvps_avx(auVar161,auVar236,auVar43);
            auVar358 = ZEXT3264(auVar161);
            auVar161 = vsubps_avx(auVar281,auVar85);
            auVar237 = ZEXT3264(auVar161);
            _local_380 = vblendvps_avx(auVar161,auVar85,auVar43);
            auVar172 = ZEXT3264(auVar302);
            auVar344 = ZEXT3264(auVar84);
          }
        }
        auVar397 = ZEXT3264(_local_680);
        local_5a0 = auVar358._0_32_;
        local_5c0 = auVar344._0_32_;
        auVar282 = auVar172._0_32_;
        auVar161 = local_5c0;
        auVar38 = local_5a0;
        if ((((((((auVar282 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar282 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar282 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar282 >> 0x7f,0) == '\0') &&
              (auVar172 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar282 >> 0xbf,0) == '\0') &&
            (auVar172 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar172[0x1f]) {
          bVar154 = false;
        }
        else {
          auVar39 = vsubps_avx(local_7e0,auVar164);
          fVar244 = auVar164._0_4_ + auVar358._0_4_ * auVar39._0_4_;
          fVar247 = auVar164._4_4_ + auVar358._4_4_ * auVar39._4_4_;
          fVar251 = auVar164._8_4_ + auVar358._8_4_ * auVar39._8_4_;
          fVar254 = auVar164._12_4_ + auVar358._12_4_ * auVar39._12_4_;
          fVar264 = auVar164._16_4_ + auVar358._16_4_ * auVar39._16_4_;
          fVar266 = auVar164._20_4_ + auVar358._20_4_ * auVar39._20_4_;
          fVar268 = auVar164._24_4_ + auVar358._24_4_ * auVar39._24_4_;
          fVar270 = auVar39._28_4_ + 0.0;
          fVar350 = *(float *)((long)local_6b8->ray_space + k * 4 + -0x10);
          auVar86._4_4_ = (fVar247 + fVar247) * fVar350;
          auVar86._0_4_ = (fVar244 + fVar244) * fVar350;
          auVar86._8_4_ = (fVar251 + fVar251) * fVar350;
          auVar86._12_4_ = (fVar254 + fVar254) * fVar350;
          auVar86._16_4_ = (fVar264 + fVar264) * fVar350;
          auVar86._20_4_ = (fVar266 + fVar266) * fVar350;
          auVar86._24_4_ = (fVar268 + fVar268) * fVar350;
          auVar86._28_4_ = fVar270 + fVar270;
          auVar39 = vcmpps_avx(local_5c0,auVar86,6);
          auVar40 = auVar282 & auVar39;
          if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar40 >> 0x7f,0) != '\0') ||
                (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar40 >> 0xbf,0) != '\0') ||
              (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar40[0x1f] < '\0') {
            local_200 = vandps_avx(auVar39,auVar282);
            local_2a0._0_4_ = (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0;
            local_2a0._4_4_ = (float)local_380._4_4_ + (float)local_380._4_4_ + -1.0;
            fStack_298 = (float)uStack_378 + (float)uStack_378 + -1.0;
            fStack_294 = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
            fStack_290 = (float)uStack_370 + (float)uStack_370 + -1.0;
            fStack_28c = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
            fStack_288 = (float)uStack_368 + (float)uStack_368 + -1.0;
            fStack_284 = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
            local_260 = 0;
            uStack_248 = uStack_6c8;
            uStack_238 = local_4d0._8_8_;
            local_4e0._8_8_ = auVar407._8_8_;
            uStack_228 = local_4e0._8_8_;
            uStack_218 = local_4f0._8_8_;
            local_380._4_4_ = local_2a0._4_4_;
            local_380._0_4_ = local_2a0._0_4_;
            uStack_378._0_4_ = fStack_298;
            uStack_378._4_4_ = fStack_294;
            uStack_370._0_4_ = fStack_290;
            uStack_370._4_4_ = fStack_28c;
            auVar189 = _local_380;
            uStack_368._0_4_ = fStack_288;
            uStack_368._4_4_ = fStack_284;
            auVar282 = _local_380;
            if ((pGVar34->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              _local_380 = auVar282;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar154 = true, pGVar34->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar207._0_4_ = 1.0 / (float)(int)uVar33;
                auVar207._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar204 = vshufps_avx(auVar207,auVar207,0);
                local_1e0[0] = auVar204._0_4_ * (auVar358._0_4_ + 0.0);
                local_1e0[1] = auVar204._4_4_ * (auVar358._4_4_ + 1.0);
                local_1e0[2] = auVar204._8_4_ * (auVar358._8_4_ + 2.0);
                local_1e0[3] = auVar204._12_4_ * (auVar358._12_4_ + 3.0);
                fStack_1d0 = auVar204._0_4_ * (auVar358._16_4_ + 4.0);
                fStack_1cc = auVar204._4_4_ * (auVar358._20_4_ + 5.0);
                fStack_1c8 = auVar204._8_4_ * (auVar358._24_4_ + 6.0);
                fStack_1c4 = auVar358._28_4_ + 7.0;
                uStack_370 = auVar189._16_8_;
                uStack_368 = auVar282._24_8_;
                local_1c0 = local_380;
                uStack_1b8 = uStack_378;
                uStack_1b0 = uStack_370;
                uStack_1a8 = uStack_368;
                local_1a0 = local_5c0;
                iVar147 = vmovmskps_avx(local_200);
                uVar156 = CONCAT44((int)((ulong)lVar155 >> 0x20),iVar147);
                uVar149 = 0;
                if (uVar156 != 0) {
                  for (; (uVar156 >> uVar149 & 1) == 0; uVar149 = uVar149 + 1) {
                  }
                }
                bVar154 = iVar147 != 0;
                if (bVar154) {
                  _local_760 = vshufps_avx(ZEXT416(uVar150),ZEXT416(uVar150),0);
                  _auStack_750 = auVar37._16_16_;
                  _local_5e0 = vshufps_avx(ZEXT416(uVar32),ZEXT416(uVar32),0);
                  auStack_5d0 = auVar258._16_16_;
                  _auStack_650 = auVar232._16_16_;
                  uStack_658 = local_4d0._8_8_;
                  local_660 = (undefined1  [8])local_4d0._0_8_;
                  uStack_778 = local_4f0._8_8_;
                  local_780 = (undefined1  [8])local_4f0._0_8_;
                  local_7a0 = (float)*local_6c0;
                  fStack_79c = (float)((ulong)*local_6c0 >> 0x20);
                  fStack_798 = (float)local_6c0[1];
                  fStack_794 = (float)((ulong)local_6c0[1] >> 0x20);
                  fStack_838 = auVar407._8_4_;
                  fStack_834 = auVar407._12_4_;
                  _local_320 = *pauVar9;
                  local_2c0 = local_5a0;
                  local_280 = local_5c0;
                  local_25c = uVar33;
                  local_250 = local_6d0;
                  local_240 = local_4d0._0_8_;
                  local_230 = auVar407._0_8_;
                  local_220 = local_4f0._0_8_;
                  do {
                    uVar324 = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_400 = local_1e0[uVar149];
                    local_3f0 = *(undefined4 *)((long)&local_1c0 + uVar149 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a0 + uVar149 * 4);
                    fVar250 = 1.0 - local_400;
                    fVar240 = local_400 * 3.0;
                    auVar204 = ZEXT416((uint)((fVar250 * -2.0 * local_400 + local_400 * local_400) *
                                             0.5));
                    auVar204 = vshufps_avx(auVar204,auVar204,0);
                    auVar225 = ZEXT416((uint)(((fVar250 + fVar250) * (fVar240 + 2.0) +
                                              fVar250 * fVar250 * -3.0) * 0.5));
                    auVar225 = vshufps_avx(auVar225,auVar225,0);
                    auVar226 = ZEXT416((uint)(((local_400 + local_400) * (fVar240 + -5.0) +
                                              local_400 * fVar240) * 0.5));
                    auVar226 = vshufps_avx(auVar226,auVar226,0);
                    local_6b0.context = context->user;
                    auVar227 = ZEXT416((uint)((local_400 * (fVar250 + fVar250) - fVar250 * fVar250)
                                             * 0.5));
                    auVar227 = vshufps_avx(auVar227,auVar227,0);
                    auVar208._0_4_ =
                         auVar227._0_4_ * (float)local_6d0._0_4_ +
                         auVar226._0_4_ * (float)local_660._0_4_ +
                         auVar204._0_4_ * (float)local_780._0_4_ + auVar225._0_4_ * local_840;
                    auVar208._4_4_ =
                         auVar227._4_4_ * (float)local_6d0._4_4_ +
                         auVar226._4_4_ * (float)local_660._4_4_ +
                         auVar204._4_4_ * (float)local_780._4_4_ + auVar225._4_4_ * fStack_83c;
                    auVar208._8_4_ =
                         auVar227._8_4_ * (float)uStack_6c8 +
                         auVar226._8_4_ * (float)uStack_658 +
                         auVar204._8_4_ * (float)uStack_778 + auVar225._8_4_ * fStack_838;
                    auVar208._12_4_ =
                         auVar227._12_4_ * uStack_6c8._4_4_ +
                         auVar226._12_4_ * uStack_658._4_4_ +
                         auVar204._12_4_ * uStack_778._4_4_ + auVar225._12_4_ * fStack_834;
                    local_430 = (RTCHitN  [16])vshufps_avx(auVar208,auVar208,0);
                    local_420 = vshufps_avx(auVar208,auVar208,0x55);
                    auVar237 = ZEXT1664(local_420);
                    local_410 = vshufps_avx(auVar208,auVar208,0xaa);
                    local_3e0 = local_5e0;
                    uStack_3d8 = uStack_5d8;
                    local_3d0 = local_760;
                    uStack_3c8 = uStack_758;
                    vcmpps_avx(auVar198._0_32_,auVar198._0_32_,0xf);
                    uStack_3bc = (local_6b0.context)->instID[0];
                    local_3c0 = uStack_3bc;
                    uStack_3b8 = uStack_3bc;
                    uStack_3b4 = uStack_3bc;
                    uStack_3b0 = (local_6b0.context)->instPrimID[0];
                    uStack_3ac = uStack_3b0;
                    uStack_3a8 = uStack_3b0;
                    uStack_3a4 = uStack_3b0;
                    local_860 = CONCAT44(fStack_79c,local_7a0);
                    uStack_858 = CONCAT44(fStack_794,fStack_798);
                    local_6b0.valid = (int *)&local_860;
                    local_6b0.geometryUserPtr = pGVar34->userPtr;
                    local_6b0.hit = local_430;
                    local_6b0.N = 4;
                    local_7c0._0_8_ = uVar156;
                    local_7e0._0_8_ = uVar149;
                    local_740._0_4_ = uVar324;
                    local_6b0.ray = (RTCRayN *)ray;
                    fStack_3fc = local_400;
                    fStack_3f8 = local_400;
                    fStack_3f4 = local_400;
                    uStack_3ec = local_3f0;
                    uStack_3e8 = local_3f0;
                    uStack_3e4 = local_3f0;
                    if (pGVar34->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar237 = ZEXT1664(local_420);
                      (*pGVar34->occlusionFilterN)(&local_6b0);
                      auVar397 = ZEXT3264(_local_680);
                      auVar344 = ZEXT3264(local_5c0);
                      auVar358 = ZEXT3264(local_5a0);
                      auVar198 = ZEXT1664(ZEXT816(0) << 0x40);
                      uVar156 = local_7c0._0_8_;
                      uVar149 = local_7e0._0_8_;
                      uVar324 = local_740._0_4_;
                      fVar366 = (float)local_720._0_4_;
                      fVar373 = (float)local_720._4_4_;
                      fVar374 = fStack_718;
                      fVar375 = fStack_714;
                      fVar221 = fStack_710;
                      fVar239 = fStack_70c;
                      fVar238 = fStack_708;
                      fVar243 = fStack_704;
                    }
                    auVar135._8_8_ = uStack_858;
                    auVar135._0_8_ = local_860;
                    if (auVar135 == (undefined1  [16])0x0) {
                      auVar204 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar204 = auVar204 ^ _DAT_01febe20;
                      fVar201 = (float)local_700._0_4_;
                      fVar297 = (float)local_700._4_4_;
                      fVar306 = fStack_6f8;
                      fVar308 = fStack_6f4;
                      fVar240 = fStack_6f0;
                      fVar250 = fStack_6ec;
                      fVar242 = fStack_6e8;
                    }
                    else {
                      p_Var36 = context->args->filter;
                      if ((p_Var36 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar34->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar237 = ZEXT1664(auVar237._0_16_);
                        (*p_Var36)(&local_6b0);
                        auVar397 = ZEXT3264(_local_680);
                        auVar344 = ZEXT3264(local_5c0);
                        auVar358 = ZEXT3264(local_5a0);
                        auVar198 = ZEXT1664(ZEXT816(0) << 0x40);
                        uVar156 = local_7c0._0_8_;
                        uVar149 = local_7e0._0_8_;
                        uVar324 = local_740._0_4_;
                        fVar366 = (float)local_720._0_4_;
                        fVar373 = (float)local_720._4_4_;
                        fVar374 = fStack_718;
                        fVar375 = fStack_714;
                        fVar221 = fStack_710;
                        fVar239 = fStack_70c;
                        fVar238 = fStack_708;
                        fVar243 = fStack_704;
                      }
                      auVar136._8_8_ = uStack_858;
                      auVar136._0_8_ = local_860;
                      auVar225 = vpcmpeqd_avx((undefined1  [16])0x0,auVar136);
                      auVar204 = auVar225 ^ _DAT_01febe20;
                      auVar209._8_4_ = 0xff800000;
                      auVar209._0_8_ = 0xff800000ff800000;
                      auVar209._12_4_ = 0xff800000;
                      auVar225 = vblendvps_avx(auVar209,*(undefined1 (*) [16])(local_6b0.ray + 0x80)
                                               ,auVar225);
                      *(undefined1 (*) [16])(local_6b0.ray + 0x80) = auVar225;
                      fVar201 = (float)local_700._0_4_;
                      fVar297 = (float)local_700._4_4_;
                      fVar306 = fStack_6f8;
                      fVar308 = fStack_6f4;
                      fVar240 = fStack_6f0;
                      fVar250 = fStack_6ec;
                      fVar242 = fStack_6e8;
                    }
                    auVar188._8_8_ = 0x100000001;
                    auVar188._0_8_ = 0x100000001;
                    auVar161 = auVar344._0_32_;
                    auVar38 = auVar358._0_32_;
                    if ((auVar188 & auVar204) != (undefined1  [16])0x0) break;
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar324;
                    uVar156 = uVar156 ^ 1L << (uVar149 & 0x3f);
                    uVar149 = 0;
                    if (uVar156 != 0) {
                      for (; (uVar156 >> uVar149 & 1) == 0; uVar149 = uVar149 + 1) {
                      }
                    }
                    bVar154 = uVar156 != 0;
                  } while (bVar154);
                }
              }
              goto LAB_0129339d;
            }
          }
          bVar154 = false;
        }
LAB_0129339d:
        local_5a0 = auVar38;
        local_5c0 = auVar161;
        auVar204 = local_820._0_16_;
      }
      auVar198 = ZEXT1664(auVar204);
      if (8 < (int)uVar33) {
        _local_320 = vpshufd_avx(ZEXT416(uVar33),0);
        auVar204 = vshufps_avx(auVar204,auVar204,0);
        register0x00001210 = auVar204;
        _local_340 = auVar204;
        auVar204 = vpermilps_avx(_local_800,0);
        local_360._16_16_ = auVar204;
        local_360._0_16_ = auVar204;
        auVar160._0_4_ = 1.0 / (float)local_480._0_4_;
        auVar160._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar204 = vshufps_avx(auVar160,auVar160,0);
        register0x00001210 = auVar204;
        _local_100 = auVar204;
        local_2d0 = vshufps_avx(ZEXT416((uint)local_848),ZEXT416((uint)local_848),0);
        local_5f0 = vshufps_avx(ZEXT416((uint)local_5f0._0_4_),ZEXT416((uint)local_5f0._0_4_),0);
        auVar172 = ZEXT1664(local_5f0);
        lVar151 = 8;
        fVar350 = (float)local_640._0_4_;
        fVar244 = (float)local_640._4_4_;
        fVar247 = fStack_638;
        fVar251 = fStack_634;
        fVar254 = fStack_630;
        fVar264 = fStack_62c;
        fVar266 = fStack_628;
        do {
          pauVar10 = (undefined1 (*) [28])(catmullrom_basis0 + lVar151 * 4 + lVar152);
          fVar268 = *(float *)*pauVar10;
          fVar270 = *(float *)(*pauVar10 + 4);
          fVar271 = *(float *)(*pauVar10 + 8);
          fVar272 = *(float *)(*pauVar10 + 0xc);
          fVar274 = *(float *)(*pauVar10 + 0x10);
          fVar285 = *(float *)(*pauVar10 + 0x14);
          fVar287 = *(float *)(*pauVar10 + 0x18);
          auVar145 = *pauVar10;
          pauVar10 = (undefined1 (*) [28])(lVar152 + 0x22307f0 + lVar151 * 4);
          fVar289 = *(float *)*pauVar10;
          fVar291 = *(float *)(*pauVar10 + 4);
          fVar292 = *(float *)(*pauVar10 + 8);
          fVar293 = *(float *)(*pauVar10 + 0xc);
          fVar332 = *(float *)(*pauVar10 + 0x10);
          fVar246 = *(float *)(*pauVar10 + 0x14);
          fVar364 = *(float *)(*pauVar10 + 0x18);
          auVar144 = *pauVar10;
          pfVar1 = (float *)(lVar152 + 0x2230c74 + lVar151 * 4);
          fVar333 = *pfVar1;
          fVar334 = pfVar1[1];
          fVar249 = pfVar1[2];
          fVar365 = pfVar1[3];
          fVar335 = pfVar1[4];
          fVar336 = pfVar1[5];
          fVar253 = pfVar1[6];
          pauVar10 = (undefined1 (*) [28])(lVar152 + 0x22310f8 + lVar151 * 4);
          fVar200 = *(float *)*pauVar10;
          fVar404 = *(float *)(*pauVar10 + 4);
          fVar405 = *(float *)(*pauVar10 + 8);
          fVar406 = *(float *)(*pauVar10 + 0xc);
          fVar179 = *(float *)(*pauVar10 + 0x10);
          fVar180 = *(float *)(*pauVar10 + 0x14);
          fVar181 = *(float *)(*pauVar10 + 0x18);
          auVar142 = *pauVar10;
          fVar222 = auVar237._28_4_;
          fVar220 = fVar222 + *(float *)pauVar10[1];
          fVar245 = auVar397._0_4_;
          fVar248 = auVar397._4_4_;
          fVar252 = auVar397._8_4_;
          fVar295 = auVar397._12_4_;
          fVar173 = auVar397._16_4_;
          fVar175 = auVar397._20_4_;
          fVar177 = auVar397._24_4_;
          fStack_864 = fVar222 + fVar222 + auVar172._28_4_;
          fVar273 = fVar222 + fVar220;
          local_7c0._0_4_ =
               (float)local_460._0_4_ * fVar268 +
               fVar245 * fVar289 +
               (float)local_620._0_4_ * fVar333 + (float)local_540._0_4_ * fVar200;
          local_7c0._4_4_ =
               (float)local_460._4_4_ * fVar270 +
               fVar248 * fVar291 +
               (float)local_620._4_4_ * fVar334 + (float)local_540._4_4_ * fVar404;
          local_7c0._8_4_ =
               fStack_458 * fVar271 +
               fVar252 * fVar292 + fStack_618 * fVar249 + fStack_538 * fVar405;
          local_7c0._12_4_ =
               fStack_454 * fVar272 +
               fVar295 * fVar293 + fStack_614 * fVar365 + fStack_534 * fVar406;
          local_7c0._16_4_ =
               fStack_450 * fVar274 +
               fVar173 * fVar332 + fStack_610 * fVar335 + fStack_530 * fVar179;
          local_7c0._20_4_ =
               fStack_44c * fVar285 +
               fVar175 * fVar246 + fStack_60c * fVar336 + fStack_52c * fVar180;
          local_7c0._24_4_ =
               fStack_448 * fVar287 +
               fVar177 * fVar364 + fStack_608 * fVar253 + fStack_528 * fVar181;
          local_7c0._28_4_ = fVar220 + fStack_864;
          local_820._0_4_ =
               (float)local_120._0_4_ * fVar268 +
               fVar201 * fVar289 + fVar350 * fVar333 + fVar366 * fVar200;
          local_820._4_4_ =
               (float)local_120._4_4_ * fVar270 +
               fVar297 * fVar291 + fVar244 * fVar334 + fVar373 * fVar404;
          local_820._8_4_ =
               fStack_118 * fVar271 + fVar306 * fVar292 + fVar247 * fVar249 + fVar374 * fVar405;
          local_820._12_4_ =
               fStack_114 * fVar272 + fVar308 * fVar293 + fVar251 * fVar365 + fVar375 * fVar406;
          local_820._16_4_ =
               fStack_110 * fVar274 + fVar240 * fVar332 + fVar254 * fVar335 + fVar221 * fVar179;
          local_820._20_4_ =
               fStack_10c * fVar285 + fVar250 * fVar246 + fVar264 * fVar336 + fVar239 * fVar180;
          local_820._24_4_ =
               fStack_108 * fVar287 + fVar242 * fVar364 + fVar266 * fVar253 + fVar238 * fVar181;
          local_820._28_4_ = fStack_864 + fVar222 + fVar222 + auVar198._28_4_;
          local_880._0_4_ =
               (float)local_c0._0_4_ * fVar268 +
               fVar289 * (float)local_160._0_4_ +
               (float)local_a0._0_4_ * fVar333 + fVar200 * (float)local_140._0_4_;
          local_880._4_4_ =
               (float)local_c0._4_4_ * fVar270 +
               fVar291 * (float)local_160._4_4_ +
               (float)local_a0._4_4_ * fVar334 + fVar404 * (float)local_140._4_4_;
          fStack_878 = fStack_b8 * fVar271 +
                       fVar292 * fStack_158 + fStack_98 * fVar249 + fVar405 * fStack_138;
          fStack_874 = fStack_b4 * fVar272 +
                       fVar293 * fStack_154 + fStack_94 * fVar365 + fVar406 * fStack_134;
          fStack_870 = fStack_b0 * fVar274 +
                       fVar332 * fStack_150 + fStack_90 * fVar335 + fVar179 * fStack_130;
          fStack_86c = fStack_ac * fVar285 +
                       fVar246 * fStack_14c + fStack_8c * fVar336 + fVar180 * fStack_12c;
          fStack_868 = fStack_a8 * fVar287 +
                       fVar364 * fStack_148 + fStack_88 * fVar253 + fVar181 * fStack_128;
          fStack_864 = fStack_864 + fVar273;
          pauVar11 = (undefined1 (*) [32])(catmullrom_basis1 + lVar151 * 4 + lVar152);
          auVar189 = *(undefined1 (*) [24])*pauVar11;
          pfVar1 = (float *)(lVar152 + 0x2232c10 + lVar151 * 4);
          fVar289 = *pfVar1;
          fVar291 = pfVar1[1];
          fVar292 = pfVar1[2];
          fVar293 = pfVar1[3];
          fVar332 = pfVar1[4];
          fVar246 = pfVar1[5];
          fVar364 = pfVar1[6];
          auVar161 = *(undefined1 (*) [32])(lVar152 + 0x2233094 + lVar151 * 4);
          auVar172 = ZEXT3264(auVar161);
          pfVar2 = (float *)(lVar152 + 0x2233518 + lVar151 * 4);
          fVar200 = *pfVar2;
          fVar404 = pfVar2[1];
          fVar405 = pfVar2[2];
          fVar406 = pfVar2[3];
          fVar179 = pfVar2[4];
          fVar180 = pfVar2[5];
          fVar181 = pfVar2[6];
          fVar268 = auVar161._0_4_;
          fVar270 = auVar161._4_4_;
          fVar271 = auVar161._8_4_;
          fVar272 = auVar161._12_4_;
          fVar274 = auVar161._16_4_;
          fVar285 = auVar161._20_4_;
          fVar287 = auVar161._24_4_;
          fVar220 = fStack_604 + fStack_604 + fVar273;
          local_800._0_4_ = auVar189._0_4_;
          local_800._4_4_ = auVar189._4_4_;
          auStack_7f8._0_4_ = auVar189._8_4_;
          auStack_7f8._4_4_ = auVar189._12_4_;
          fStack_7f0 = auVar189._16_4_;
          fStack_7ec = auVar189._20_4_;
          fStack_7e8 = (float)*(undefined8 *)(*pauVar11 + 0x18);
          auVar303._0_4_ =
               (float)local_460._0_4_ * (float)local_800._0_4_ +
               fVar245 * fVar289 +
               (float)local_620._0_4_ * fVar268 + (float)local_540._0_4_ * fVar200;
          auVar303._4_4_ =
               (float)local_460._4_4_ * (float)local_800._4_4_ +
               fVar248 * fVar291 +
               (float)local_620._4_4_ * fVar270 + (float)local_540._4_4_ * fVar404;
          auVar303._8_4_ =
               fStack_458 * (float)auStack_7f8._0_4_ +
               fVar252 * fVar292 + fStack_618 * fVar271 + fStack_538 * fVar405;
          auVar303._12_4_ =
               fStack_454 * (float)auStack_7f8._4_4_ +
               fVar295 * fVar293 + fStack_614 * fVar272 + fStack_534 * fVar406;
          auVar303._16_4_ =
               fStack_450 * fStack_7f0 +
               fVar173 * fVar332 + fStack_610 * fVar274 + fStack_530 * fVar179;
          auVar303._20_4_ =
               fStack_44c * fStack_7ec +
               fVar175 * fVar246 + fStack_60c * fVar285 + fStack_52c * fVar180;
          auVar303._24_4_ =
               fStack_448 * fStack_7e8 +
               fVar177 * fVar364 + fStack_608 * fVar287 + fStack_528 * fVar181;
          auVar303._28_4_ = fStack_604 + pfVar2[7] + fVar220;
          auVar283._0_4_ =
               (float)local_120._0_4_ * (float)local_800._0_4_ +
               fVar201 * fVar289 + fVar350 * fVar268 + fVar366 * fVar200;
          auVar283._4_4_ =
               (float)local_120._4_4_ * (float)local_800._4_4_ +
               fVar297 * fVar291 + fVar244 * fVar270 + fVar373 * fVar404;
          auVar283._8_4_ =
               fStack_118 * (float)auStack_7f8._0_4_ +
               fVar306 * fVar292 + fVar247 * fVar271 + fVar374 * fVar405;
          auVar283._12_4_ =
               fStack_114 * (float)auStack_7f8._4_4_ +
               fVar308 * fVar293 + fVar251 * fVar272 + fVar375 * fVar406;
          auVar283._16_4_ =
               fStack_110 * fStack_7f0 + fVar240 * fVar332 + fVar254 * fVar274 + fVar221 * fVar179;
          auVar283._20_4_ =
               fStack_10c * fStack_7ec + fVar250 * fVar246 + fVar264 * fVar285 + fVar239 * fVar180;
          auVar283._24_4_ =
               fStack_108 * fStack_7e8 + fVar242 * fVar364 + fVar266 * fVar287 + fVar238 * fVar181;
          auVar283._28_4_ = fVar220 + fStack_604 + fStack_604 + auVar397._28_4_;
          auVar323._0_4_ =
               fVar289 * (float)local_160._0_4_ +
               (float)local_a0._0_4_ * fVar268 + fVar200 * (float)local_140._0_4_ +
               (float)local_800._0_4_ * (float)local_c0._0_4_;
          auVar323._4_4_ =
               fVar291 * (float)local_160._4_4_ +
               (float)local_a0._4_4_ * fVar270 + fVar404 * (float)local_140._4_4_ +
               (float)local_800._4_4_ * (float)local_c0._4_4_;
          auVar323._8_4_ =
               fVar292 * fStack_158 + fStack_98 * fVar271 + fVar405 * fStack_138 +
               (float)auStack_7f8._0_4_ * fStack_b8;
          auVar323._12_4_ =
               fVar293 * fStack_154 + fStack_94 * fVar272 + fVar406 * fStack_134 +
               (float)auStack_7f8._4_4_ * fStack_b4;
          auVar323._16_4_ =
               fVar332 * fStack_150 + fStack_90 * fVar274 + fVar179 * fStack_130 +
               fStack_7f0 * fStack_b0;
          auVar323._20_4_ =
               fVar246 * fStack_14c + fStack_8c * fVar285 + fVar180 * fStack_12c +
               fStack_7ec * fStack_ac;
          auVar323._24_4_ =
               fVar364 * fStack_148 + fStack_88 * fVar287 + fVar181 * fStack_128 +
               fStack_7e8 * fStack_a8;
          auVar323._28_4_ = fStack_604 + fStack_604 + pfVar2[7] + fVar220;
          auVar38 = vsubps_avx(auVar303,local_7c0);
          auVar282 = vsubps_avx(auVar283,local_820);
          auVar237 = ZEXT3264(auVar282);
          fVar254 = auVar38._0_4_;
          fVar264 = auVar38._4_4_;
          auVar87._4_4_ = fVar264 * local_820._4_4_;
          auVar87._0_4_ = fVar254 * local_820._0_4_;
          fVar266 = auVar38._8_4_;
          auVar87._8_4_ = fVar266 * local_820._8_4_;
          fVar222 = auVar38._12_4_;
          auVar87._12_4_ = fVar222 * local_820._12_4_;
          fVar273 = auVar38._16_4_;
          auVar87._16_4_ = fVar273 * local_820._16_4_;
          fVar241 = auVar38._20_4_;
          auVar87._20_4_ = fVar241 * local_820._20_4_;
          fVar182 = auVar38._24_4_;
          auVar87._24_4_ = fVar182 * local_820._24_4_;
          auVar87._28_4_ = fVar220;
          fVar240 = auVar282._0_4_;
          fVar250 = auVar282._4_4_;
          auVar88._4_4_ = local_7c0._4_4_ * fVar250;
          auVar88._0_4_ = (float)local_7c0._0_4_ * fVar240;
          fVar242 = auVar282._8_4_;
          auVar88._8_4_ = local_7c0._8_4_ * fVar242;
          fVar350 = auVar282._12_4_;
          auVar88._12_4_ = local_7c0._12_4_ * fVar350;
          fVar244 = auVar282._16_4_;
          auVar88._16_4_ = local_7c0._16_4_ * fVar244;
          fVar247 = auVar282._20_4_;
          auVar88._20_4_ = local_7c0._20_4_ * fVar247;
          fVar251 = auVar282._24_4_;
          auVar88._24_4_ = local_7c0._24_4_ * fVar251;
          auVar88._28_4_ = auVar283._28_4_;
          auVar39 = vsubps_avx(auVar87,auVar88);
          auVar198 = ZEXT3264(_local_880);
          auVar37 = vmaxps_avx(_local_880,auVar323);
          auVar89._4_4_ = auVar37._4_4_ * auVar37._4_4_ * (fVar264 * fVar264 + fVar250 * fVar250);
          auVar89._0_4_ = auVar37._0_4_ * auVar37._0_4_ * (fVar254 * fVar254 + fVar240 * fVar240);
          auVar89._8_4_ = auVar37._8_4_ * auVar37._8_4_ * (fVar266 * fVar266 + fVar242 * fVar242);
          auVar89._12_4_ = auVar37._12_4_ * auVar37._12_4_ * (fVar222 * fVar222 + fVar350 * fVar350)
          ;
          auVar89._16_4_ = auVar37._16_4_ * auVar37._16_4_ * (fVar273 * fVar273 + fVar244 * fVar244)
          ;
          auVar89._20_4_ = auVar37._20_4_ * auVar37._20_4_ * (fVar241 * fVar241 + fVar247 * fVar247)
          ;
          auVar89._24_4_ = auVar37._24_4_ * auVar37._24_4_ * (fVar182 * fVar182 + fVar251 * fVar251)
          ;
          auVar89._28_4_ = auVar303._28_4_ + auVar283._28_4_;
          auVar90._4_4_ = auVar39._4_4_ * auVar39._4_4_;
          auVar90._0_4_ = auVar39._0_4_ * auVar39._0_4_;
          auVar90._8_4_ = auVar39._8_4_ * auVar39._8_4_;
          auVar90._12_4_ = auVar39._12_4_ * auVar39._12_4_;
          auVar90._16_4_ = auVar39._16_4_ * auVar39._16_4_;
          auVar90._20_4_ = auVar39._20_4_ * auVar39._20_4_;
          auVar90._24_4_ = auVar39._24_4_ * auVar39._24_4_;
          auVar90._28_4_ = auVar39._28_4_;
          auVar37 = vcmpps_avx(auVar90,auVar89,2);
          local_260 = (uint)lVar151;
          auVar225 = vpshufd_avx(ZEXT416(local_260),0);
          auVar204 = vpor_avx(auVar225,_DAT_01ff0cf0);
          auVar225 = vpor_avx(auVar225,_DAT_02020ea0);
          auVar204 = vpcmpgtd_avx(_local_320,auVar204);
          auVar225 = vpcmpgtd_avx(_local_320,auVar225);
          auVar261._16_16_ = auVar225;
          auVar261._0_16_ = auVar204;
          auVar39 = auVar261 & auVar37;
          fVar350 = (float)local_640._0_4_;
          fVar244 = (float)local_640._4_4_;
          fVar247 = fStack_638;
          fVar251 = fStack_634;
          fVar254 = fStack_630;
          fVar264 = fStack_62c;
          fVar266 = fStack_628;
          if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar39 >> 0x7f,0) == '\0') &&
                (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar39 >> 0xbf,0) == '\0') &&
              (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar39[0x1f]) {
            auVar397 = ZEXT3264(auVar397._0_32_);
            _local_800 = *pauVar11;
          }
          else {
            local_7a0 = (float)local_800._0_4_ * (float)local_180._0_4_ +
                        fVar289 * (float)local_300._0_4_ +
                        (float)local_e0._0_4_ * fVar268 + (float)local_520._0_4_ * fVar200;
            fStack_79c = (float)local_800._4_4_ * (float)local_180._4_4_ +
                         fVar291 * (float)local_300._4_4_ +
                         (float)local_e0._4_4_ * fVar270 + (float)local_520._4_4_ * fVar404;
            fStack_798 = (float)auStack_7f8._0_4_ * fStack_178 +
                         fVar292 * fStack_2f8 + fStack_d8 * fVar271 + fStack_518 * fVar405;
            fStack_794 = (float)auStack_7f8._4_4_ * fStack_174 +
                         fVar293 * fStack_2f4 + fStack_d4 * fVar272 + fStack_514 * fVar406;
            fStack_790 = fStack_7f0 * fStack_170 +
                         fVar332 * fStack_2f0 + fStack_d0 * fVar274 + fStack_510 * fVar179;
            fStack_78c = fStack_7ec * fStack_16c +
                         fVar246 * fStack_2ec + fStack_cc * fVar285 + fStack_50c * fVar180;
            fStack_788 = fStack_7e8 * fStack_168 +
                         fVar364 * fStack_2e8 + fStack_c8 * fVar287 + fStack_508 * fVar181;
            fStack_784 = local_7c0._28_4_ + auVar161._28_4_ + fStack_864 + 0.0;
            local_660._0_4_ = auVar144._0_4_;
            local_660._4_4_ = auVar144._4_4_;
            uStack_658._0_4_ = auVar144._8_4_;
            uStack_658._4_4_ = auVar144._12_4_;
            auStack_650._0_4_ = auVar144._16_4_;
            auStack_650._4_4_ = auVar144._20_4_;
            fStack_648 = auVar144._24_4_;
            local_780._0_4_ = auVar142._0_4_;
            local_780._4_4_ = auVar142._4_4_;
            uStack_778._0_4_ = auVar142._8_4_;
            uStack_778._4_4_ = auVar142._12_4_;
            fStack_770 = auVar142._16_4_;
            fStack_76c = auVar142._20_4_;
            fStack_768 = auVar142._24_4_;
            fVar297 = (float)local_520._0_4_ * (float)local_780._0_4_;
            fVar306 = (float)local_520._4_4_ * (float)local_780._4_4_;
            fVar308 = fStack_518 * (float)uStack_778;
            fVar310 = fStack_514 * uStack_778._4_4_;
            fVar311 = fStack_510 * fStack_770;
            fVar312 = fStack_50c * fStack_76c;
            fVar313 = fStack_508 * fStack_768;
            pfVar2 = (float *)(lVar152 + 0x2231e84 + lVar151 * 4);
            fVar240 = *pfVar2;
            fVar250 = pfVar2[1];
            fVar242 = pfVar2[2];
            fVar268 = pfVar2[3];
            fVar270 = pfVar2[4];
            fVar271 = pfVar2[5];
            fVar272 = pfVar2[6];
            pfVar3 = (float *)(lVar152 + 0x2232308 + lVar151 * 4);
            fVar274 = *pfVar3;
            fVar285 = pfVar3[1];
            fVar287 = pfVar3[2];
            fVar289 = pfVar3[3];
            fVar291 = pfVar3[4];
            fVar292 = pfVar3[5];
            fVar293 = pfVar3[6];
            fVar314 = pfVar1[7] + 0.0;
            pfVar4 = (float *)(lVar152 + 0x2231a00 + lVar151 * 4);
            fVar332 = *pfVar4;
            fVar246 = pfVar4[1];
            fVar364 = pfVar4[2];
            fVar200 = pfVar4[3];
            fVar404 = pfVar4[4];
            fVar405 = pfVar4[5];
            fVar406 = pfVar4[6];
            fVar182 = pfVar2[7] + pfVar3[7];
            fVar201 = pfVar3[7] + fVar314;
            fVar314 = pfVar1[7] + fStack_104 + fVar314;
            pfVar1 = (float *)(lVar152 + 0x223157c + lVar151 * 4);
            fVar179 = *pfVar1;
            fVar180 = pfVar1[1];
            fVar181 = pfVar1[2];
            fVar220 = pfVar1[3];
            fVar222 = pfVar1[4];
            fVar273 = pfVar1[5];
            fVar241 = pfVar1[6];
            local_780._4_4_ =
                 fVar180 * (float)local_460._4_4_ +
                 fVar248 * fVar246 +
                 (float)local_620._4_4_ * fVar250 + (float)local_540._4_4_ * fVar285;
            local_780._0_4_ =
                 fVar179 * (float)local_460._0_4_ +
                 fVar245 * fVar332 +
                 (float)local_620._0_4_ * fVar240 + (float)local_540._0_4_ * fVar274;
            uStack_778._0_4_ =
                 fVar181 * fStack_458 +
                 fVar252 * fVar364 + fStack_618 * fVar242 + fStack_538 * fVar287;
            uStack_778._4_4_ =
                 fVar220 * fStack_454 +
                 fVar295 * fVar200 + fStack_614 * fVar268 + fStack_534 * fVar289;
            fStack_770 = fVar222 * fStack_450 +
                         fVar173 * fVar404 + fStack_610 * fVar270 + fStack_530 * fVar291;
            fStack_76c = fVar273 * fStack_44c +
                         fVar175 * fVar405 + fStack_60c * fVar271 + fStack_52c * fVar292;
            fStack_768 = fVar241 * fStack_448 +
                         fVar177 * fVar406 + fStack_608 * fVar272 + fStack_528 * fVar293;
            fStack_764 = fVar182 + fVar201;
            auVar195._0_4_ =
                 (float)local_120._0_4_ * fVar179 +
                 (float)local_640._0_4_ * fVar240 + fVar366 * fVar274 +
                 (float)local_700._0_4_ * fVar332;
            auVar195._4_4_ =
                 (float)local_120._4_4_ * fVar180 +
                 (float)local_640._4_4_ * fVar250 + fVar373 * fVar285 +
                 (float)local_700._4_4_ * fVar246;
            auVar195._8_4_ =
                 fStack_118 * fVar181 +
                 fStack_638 * fVar242 + fVar374 * fVar287 + fStack_6f8 * fVar364;
            auVar195._12_4_ =
                 fStack_114 * fVar220 +
                 fStack_634 * fVar268 + fVar375 * fVar289 + fStack_6f4 * fVar200;
            auVar195._16_4_ =
                 fStack_110 * fVar222 +
                 fStack_630 * fVar270 + fVar221 * fVar291 + fStack_6f0 * fVar404;
            auVar195._20_4_ =
                 fStack_10c * fVar273 +
                 fStack_62c * fVar271 + fVar239 * fVar292 + fStack_6ec * fVar405;
            auVar195._24_4_ =
                 fStack_108 * fVar241 +
                 fStack_628 * fVar272 + fVar238 * fVar293 + fStack_6e8 * fVar406;
            auVar195._28_4_ = fVar201 + fVar314;
            auVar388._0_4_ =
                 fVar332 * (float)local_300._0_4_ +
                 (float)local_e0._0_4_ * fVar240 + (float)local_520._0_4_ * fVar274 +
                 fVar179 * (float)local_180._0_4_;
            auVar388._4_4_ =
                 fVar246 * (float)local_300._4_4_ +
                 (float)local_e0._4_4_ * fVar250 + (float)local_520._4_4_ * fVar285 +
                 fVar180 * (float)local_180._4_4_;
            auVar388._8_4_ =
                 fVar364 * fStack_2f8 + fStack_d8 * fVar242 + fStack_518 * fVar287 +
                 fVar181 * fStack_178;
            auVar388._12_4_ =
                 fVar200 * fStack_2f4 + fStack_d4 * fVar268 + fStack_514 * fVar289 +
                 fVar220 * fStack_174;
            auVar388._16_4_ =
                 fVar404 * fStack_2f0 + fStack_d0 * fVar270 + fStack_510 * fVar291 +
                 fVar222 * fStack_170;
            auVar388._20_4_ =
                 fVar405 * fStack_2ec + fStack_cc * fVar271 + fStack_50c * fVar292 +
                 fVar273 * fStack_16c;
            auVar388._24_4_ =
                 fVar406 * fStack_2e8 + fStack_c8 * fVar272 + fStack_508 * fVar293 +
                 fVar241 * fStack_168;
            auVar388._28_4_ = pfVar4[7] + fVar182 + fVar314;
            pfVar1 = (float *)(lVar152 + 0x22342a4 + lVar151 * 4);
            fVar240 = *pfVar1;
            fVar250 = pfVar1[1];
            fVar242 = pfVar1[2];
            fVar268 = pfVar1[3];
            fVar270 = pfVar1[4];
            fVar271 = pfVar1[5];
            fVar272 = pfVar1[6];
            pfVar2 = (float *)(lVar152 + 0x2234728 + lVar151 * 4);
            fVar274 = *pfVar2;
            fVar285 = pfVar2[1];
            fVar287 = pfVar2[2];
            fVar289 = pfVar2[3];
            fVar291 = pfVar2[4];
            fVar292 = pfVar2[5];
            fVar293 = pfVar2[6];
            pfVar3 = (float *)(lVar152 + 0x2233e20 + lVar151 * 4);
            fVar332 = *pfVar3;
            fVar246 = pfVar3[1];
            fVar364 = pfVar3[2];
            fVar200 = pfVar3[3];
            fVar404 = pfVar3[4];
            fVar405 = pfVar3[5];
            fVar406 = pfVar3[6];
            pfVar4 = (float *)(lVar152 + 0x223399c + lVar151 * 4);
            fVar179 = *pfVar4;
            fVar180 = pfVar4[1];
            fVar181 = pfVar4[2];
            fVar220 = pfVar4[3];
            fVar222 = pfVar4[4];
            fVar273 = pfVar4[5];
            fVar241 = pfVar4[6];
            auVar342._0_4_ =
                 fVar179 * (float)local_460._0_4_ +
                 fVar332 * (float)local_680._0_4_ +
                 (float)local_620._0_4_ * fVar240 + (float)local_540._0_4_ * fVar274;
            auVar342._4_4_ =
                 fVar180 * (float)local_460._4_4_ +
                 fVar246 * (float)local_680._4_4_ +
                 (float)local_620._4_4_ * fVar250 + (float)local_540._4_4_ * fVar285;
            auVar342._8_4_ =
                 fVar181 * fStack_458 +
                 fVar364 * fStack_678 + fStack_618 * fVar242 + fStack_538 * fVar287;
            auVar342._12_4_ =
                 fVar220 * fStack_454 +
                 fVar200 * fStack_674 + fStack_614 * fVar268 + fStack_534 * fVar289;
            auVar342._16_4_ =
                 fVar222 * fStack_450 +
                 fVar404 * fStack_670 + fStack_610 * fVar270 + fStack_530 * fVar291;
            auVar342._20_4_ =
                 fVar273 * fStack_44c +
                 fVar405 * fStack_66c + fStack_60c * fVar271 + fStack_52c * fVar292;
            auVar342._24_4_ =
                 fVar241 * fStack_448 +
                 fVar406 * fStack_668 + fStack_608 * fVar272 + fStack_528 * fVar293;
            auVar342._28_4_ = fStack_524 + fStack_524 + fStack_104 + fStack_524;
            auVar383._0_4_ =
                 fVar179 * (float)local_120._0_4_ +
                 (float)local_700._0_4_ * fVar332 +
                 (float)local_640._0_4_ * fVar240 + fVar366 * fVar274;
            auVar383._4_4_ =
                 fVar180 * (float)local_120._4_4_ +
                 (float)local_700._4_4_ * fVar246 +
                 (float)local_640._4_4_ * fVar250 + fVar373 * fVar285;
            auVar383._8_4_ =
                 fVar181 * fStack_118 +
                 fStack_6f8 * fVar364 + fStack_638 * fVar242 + fVar374 * fVar287;
            auVar383._12_4_ =
                 fVar220 * fStack_114 +
                 fStack_6f4 * fVar200 + fStack_634 * fVar268 + fVar375 * fVar289;
            auVar383._16_4_ =
                 fVar222 * fStack_110 +
                 fStack_6f0 * fVar404 + fStack_630 * fVar270 + fVar221 * fVar291;
            auVar383._20_4_ =
                 fVar273 * fStack_10c +
                 fStack_6ec * fVar405 + fStack_62c * fVar271 + fVar239 * fVar292;
            auVar383._24_4_ =
                 fVar241 * fStack_108 +
                 fStack_6e8 * fVar406 + fStack_628 * fVar272 + fVar238 * fVar293;
            auVar383._28_4_ = fStack_524 + fStack_524 + fVar243 + fStack_524;
            auVar284._8_4_ = 0x7fffffff;
            auVar284._0_8_ = 0x7fffffff7fffffff;
            auVar284._12_4_ = 0x7fffffff;
            auVar284._16_4_ = 0x7fffffff;
            auVar284._20_4_ = 0x7fffffff;
            auVar284._24_4_ = 0x7fffffff;
            auVar284._28_4_ = 0x7fffffff;
            auVar161 = vandps_avx(_local_780,auVar284);
            auVar39 = vandps_avx(auVar195,auVar284);
            auVar39 = vmaxps_avx(auVar161,auVar39);
            auVar161 = vandps_avx(auVar388,auVar284);
            auVar39 = vmaxps_avx(auVar39,auVar161);
            auVar39 = vcmpps_avx(auVar39,_local_340,1);
            auVar40 = vblendvps_avx(_local_780,auVar38,auVar39);
            auVar169._0_4_ =
                 fVar179 * (float)local_180._0_4_ +
                 fVar332 * (float)local_300._0_4_ +
                 (float)local_520._0_4_ * fVar274 + (float)local_e0._0_4_ * fVar240;
            auVar169._4_4_ =
                 fVar180 * (float)local_180._4_4_ +
                 fVar246 * (float)local_300._4_4_ +
                 (float)local_520._4_4_ * fVar285 + (float)local_e0._4_4_ * fVar250;
            auVar169._8_4_ =
                 fVar181 * fStack_178 +
                 fVar364 * fStack_2f8 + fStack_518 * fVar287 + fStack_d8 * fVar242;
            auVar169._12_4_ =
                 fVar220 * fStack_174 +
                 fVar200 * fStack_2f4 + fStack_514 * fVar289 + fStack_d4 * fVar268;
            auVar169._16_4_ =
                 fVar222 * fStack_170 +
                 fVar404 * fStack_2f0 + fStack_510 * fVar291 + fStack_d0 * fVar270;
            auVar169._20_4_ =
                 fVar273 * fStack_16c +
                 fVar405 * fStack_2ec + fStack_50c * fVar292 + fStack_cc * fVar271;
            auVar169._24_4_ =
                 fVar241 * fStack_168 +
                 fVar406 * fStack_2e8 + fStack_508 * fVar293 + fStack_c8 * fVar272;
            auVar169._28_4_ = auVar161._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar41 = vblendvps_avx(auVar195,auVar282,auVar39);
            auVar161 = vandps_avx(auVar342,auVar284);
            auVar39 = vandps_avx(auVar383,auVar284);
            auVar42 = vmaxps_avx(auVar161,auVar39);
            auVar161 = vandps_avx(auVar169,auVar284);
            auVar161 = vmaxps_avx(auVar42,auVar161);
            local_760._0_4_ = auVar145._0_4_;
            local_760._4_4_ = auVar145._4_4_;
            uStack_758._0_4_ = auVar145._8_4_;
            uStack_758._4_4_ = auVar145._12_4_;
            auStack_750._0_4_ = auVar145._16_4_;
            auStack_750._4_4_ = auVar145._20_4_;
            fStack_748 = auVar145._24_4_;
            auVar39 = vcmpps_avx(auVar161,_local_340,1);
            auVar161 = vblendvps_avx(auVar342,auVar38,auVar39);
            auVar170._0_4_ =
                 (float)local_180._0_4_ * (float)local_760._0_4_ +
                 (float)local_300._0_4_ * (float)local_660._0_4_ +
                 (float)local_e0._0_4_ * fVar333 + fVar297;
            auVar170._4_4_ =
                 (float)local_180._4_4_ * (float)local_760._4_4_ +
                 (float)local_300._4_4_ * (float)local_660._4_4_ +
                 (float)local_e0._4_4_ * fVar334 + fVar306;
            auVar170._8_4_ =
                 fStack_178 * (float)uStack_758 +
                 fStack_2f8 * (float)uStack_658 + fStack_d8 * fVar249 + fVar308;
            auVar170._12_4_ =
                 fStack_174 * uStack_758._4_4_ +
                 fStack_2f4 * uStack_658._4_4_ + fStack_d4 * fVar365 + fVar310;
            auVar170._16_4_ =
                 fStack_170 * (float)auStack_750._0_4_ +
                 fStack_2f0 * (float)auStack_650._0_4_ + fStack_d0 * fVar335 + fVar311;
            auVar170._20_4_ =
                 fStack_16c * (float)auStack_750._4_4_ +
                 fStack_2ec * (float)auStack_650._4_4_ + fStack_cc * fVar336 + fVar312;
            auVar170._24_4_ =
                 fStack_168 * fStack_748 + fStack_2e8 * fStack_648 + fStack_c8 * fVar253 + fVar313;
            auVar170._28_4_ = auVar42._28_4_ + fStack_784 + fStack_864 + 0.0;
            auVar39 = vblendvps_avx(auVar383,auVar282,auVar39);
            fVar222 = auVar40._0_4_;
            fVar273 = auVar40._4_4_;
            fVar241 = auVar40._8_4_;
            fVar182 = auVar40._12_4_;
            fVar245 = auVar40._16_4_;
            fVar248 = auVar40._20_4_;
            fVar252 = auVar40._24_4_;
            fVar366 = auVar40._28_4_;
            fVar291 = auVar161._0_4_;
            fVar293 = auVar161._4_4_;
            fVar246 = auVar161._8_4_;
            fVar333 = auVar161._12_4_;
            fVar249 = auVar161._16_4_;
            fVar335 = auVar161._20_4_;
            fVar253 = auVar161._24_4_;
            fVar221 = auVar41._0_4_;
            fVar238 = auVar41._4_4_;
            fVar240 = auVar41._8_4_;
            fVar242 = auVar41._12_4_;
            fVar270 = auVar41._16_4_;
            fVar272 = auVar41._20_4_;
            fVar285 = auVar41._24_4_;
            auVar356._0_4_ = fVar221 * fVar221 + fVar222 * fVar222;
            auVar356._4_4_ = fVar238 * fVar238 + fVar273 * fVar273;
            auVar356._8_4_ = fVar240 * fVar240 + fVar241 * fVar241;
            auVar356._12_4_ = fVar242 * fVar242 + fVar182 * fVar182;
            auVar356._16_4_ = fVar270 * fVar270 + fVar245 * fVar245;
            auVar356._20_4_ = fVar272 * fVar272 + fVar248 * fVar248;
            auVar356._24_4_ = fVar285 * fVar285 + fVar252 * fVar252;
            auVar356._28_4_ = auVar38._28_4_ + fStack_504;
            auVar38 = vrsqrtps_avx(auVar356);
            fVar239 = auVar38._0_4_;
            fVar243 = auVar38._4_4_;
            auVar91._4_4_ = fVar243 * 1.5;
            auVar91._0_4_ = fVar239 * 1.5;
            fVar250 = auVar38._8_4_;
            auVar91._8_4_ = fVar250 * 1.5;
            fVar268 = auVar38._12_4_;
            auVar91._12_4_ = fVar268 * 1.5;
            fVar271 = auVar38._16_4_;
            auVar91._16_4_ = fVar271 * 1.5;
            fVar274 = auVar38._20_4_;
            auVar91._20_4_ = fVar274 * 1.5;
            fVar287 = auVar38._24_4_;
            auVar91._24_4_ = fVar287 * 1.5;
            auVar91._28_4_ = auVar383._28_4_;
            auVar92._4_4_ = fVar243 * fVar243 * fVar243 * auVar356._4_4_ * 0.5;
            auVar92._0_4_ = fVar239 * fVar239 * fVar239 * auVar356._0_4_ * 0.5;
            auVar92._8_4_ = fVar250 * fVar250 * fVar250 * auVar356._8_4_ * 0.5;
            auVar92._12_4_ = fVar268 * fVar268 * fVar268 * auVar356._12_4_ * 0.5;
            auVar92._16_4_ = fVar271 * fVar271 * fVar271 * auVar356._16_4_ * 0.5;
            auVar92._20_4_ = fVar274 * fVar274 * fVar274 * auVar356._20_4_ * 0.5;
            auVar92._24_4_ = fVar287 * fVar287 * fVar287 * auVar356._24_4_ * 0.5;
            auVar92._28_4_ = auVar356._28_4_;
            auVar40 = vsubps_avx(auVar91,auVar92);
            fVar404 = auVar40._0_4_;
            fVar405 = auVar40._4_4_;
            fVar406 = auVar40._8_4_;
            fVar179 = auVar40._12_4_;
            fVar180 = auVar40._16_4_;
            fVar181 = auVar40._20_4_;
            fVar220 = auVar40._24_4_;
            fVar239 = auVar39._0_4_;
            fVar243 = auVar39._4_4_;
            fVar250 = auVar39._8_4_;
            fVar268 = auVar39._12_4_;
            fVar271 = auVar39._16_4_;
            fVar274 = auVar39._20_4_;
            fVar287 = auVar39._24_4_;
            auVar331._0_4_ = fVar239 * fVar239 + fVar291 * fVar291;
            auVar331._4_4_ = fVar243 * fVar243 + fVar293 * fVar293;
            auVar331._8_4_ = fVar250 * fVar250 + fVar246 * fVar246;
            auVar331._12_4_ = fVar268 * fVar268 + fVar333 * fVar333;
            auVar331._16_4_ = fVar271 * fVar271 + fVar249 * fVar249;
            auVar331._20_4_ = fVar274 * fVar274 + fVar335 * fVar335;
            auVar331._24_4_ = fVar287 * fVar287 + fVar253 * fVar253;
            auVar331._28_4_ = auVar38._28_4_ + auVar161._28_4_;
            auVar161 = vrsqrtps_avx(auVar331);
            fVar289 = auVar161._0_4_;
            fVar292 = auVar161._4_4_;
            auVar93._4_4_ = fVar292 * 1.5;
            auVar93._0_4_ = fVar289 * 1.5;
            fVar332 = auVar161._8_4_;
            auVar93._8_4_ = fVar332 * 1.5;
            fVar364 = auVar161._12_4_;
            auVar93._12_4_ = fVar364 * 1.5;
            fVar334 = auVar161._16_4_;
            auVar93._16_4_ = fVar334 * 1.5;
            fVar365 = auVar161._20_4_;
            auVar93._20_4_ = fVar365 * 1.5;
            fVar336 = auVar161._24_4_;
            auVar93._24_4_ = fVar336 * 1.5;
            auVar93._28_4_ = auVar383._28_4_;
            auVar94._4_4_ = fVar292 * fVar292 * fVar292 * auVar331._4_4_ * 0.5;
            auVar94._0_4_ = fVar289 * fVar289 * fVar289 * auVar331._0_4_ * 0.5;
            auVar94._8_4_ = fVar332 * fVar332 * fVar332 * auVar331._8_4_ * 0.5;
            auVar94._12_4_ = fVar364 * fVar364 * fVar364 * auVar331._12_4_ * 0.5;
            auVar94._16_4_ = fVar334 * fVar334 * fVar334 * auVar331._16_4_ * 0.5;
            auVar94._20_4_ = fVar365 * fVar365 * fVar365 * auVar331._20_4_ * 0.5;
            auVar94._24_4_ = fVar336 * fVar336 * fVar336 * auVar331._24_4_ * 0.5;
            auVar94._28_4_ = auVar331._28_4_;
            auVar38 = vsubps_avx(auVar93,auVar94);
            fVar292 = auVar38._0_4_;
            fVar332 = auVar38._4_4_;
            fVar364 = auVar38._8_4_;
            fVar334 = auVar38._12_4_;
            fVar365 = auVar38._16_4_;
            fVar336 = auVar38._20_4_;
            fVar200 = auVar38._24_4_;
            fVar221 = (float)local_880._0_4_ * fVar404 * fVar221;
            fVar238 = (float)local_880._4_4_ * fVar405 * fVar238;
            auVar95._4_4_ = fVar238;
            auVar95._0_4_ = fVar221;
            fVar240 = fStack_878 * fVar406 * fVar240;
            auVar95._8_4_ = fVar240;
            fVar242 = fStack_874 * fVar179 * fVar242;
            auVar95._12_4_ = fVar242;
            fVar270 = fStack_870 * fVar180 * fVar270;
            auVar95._16_4_ = fVar270;
            fVar272 = fStack_86c * fVar181 * fVar272;
            auVar95._20_4_ = fVar272;
            fVar285 = fStack_868 * fVar220 * fVar285;
            auVar95._24_4_ = fVar285;
            auVar95._28_4_ = auVar161._28_4_;
            local_760._4_4_ = fVar238 + local_7c0._4_4_;
            local_760._0_4_ = fVar221 + (float)local_7c0._0_4_;
            uStack_758._0_4_ = fVar240 + local_7c0._8_4_;
            uStack_758._4_4_ = fVar242 + local_7c0._12_4_;
            auStack_750._0_4_ = fVar270 + local_7c0._16_4_;
            auStack_750._4_4_ = fVar272 + local_7c0._20_4_;
            fStack_748 = fVar285 + local_7c0._24_4_;
            fStack_744 = auVar161._28_4_ + local_7c0._28_4_;
            fVar270 = (float)local_880._0_4_ * fVar404 * -fVar222;
            fVar272 = (float)local_880._4_4_ * fVar405 * -fVar273;
            auVar96._4_4_ = fVar272;
            auVar96._0_4_ = fVar270;
            fVar285 = fStack_878 * fVar406 * -fVar241;
            auVar96._8_4_ = fVar285;
            fVar289 = fStack_874 * fVar179 * -fVar182;
            auVar96._12_4_ = fVar289;
            fStack_830 = fStack_870 * fVar180 * -fVar245;
            auVar96._16_4_ = fStack_830;
            fStack_82c = fStack_86c * fVar181 * -fVar248;
            auVar96._20_4_ = fStack_82c;
            fStack_828 = fStack_868 * fVar220 * -fVar252;
            auVar96._24_4_ = fStack_828;
            auVar96._28_4_ = -fVar366;
            fStack_830 = local_820._16_4_ + fStack_830;
            fStack_82c = local_820._20_4_ + fStack_82c;
            fStack_828 = local_820._24_4_ + fStack_828;
            fStack_824 = local_820._28_4_ + -fVar366;
            fVar221 = fVar404 * 0.0 * (float)local_880._0_4_;
            fVar238 = fVar405 * 0.0 * (float)local_880._4_4_;
            auVar97._4_4_ = fVar238;
            auVar97._0_4_ = fVar221;
            fVar240 = fVar406 * 0.0 * fStack_878;
            auVar97._8_4_ = fVar240;
            fVar242 = fVar179 * 0.0 * fStack_874;
            auVar97._12_4_ = fVar242;
            fVar404 = fVar180 * 0.0 * fStack_870;
            auVar97._16_4_ = fVar404;
            fVar405 = fVar181 * 0.0 * fStack_86c;
            auVar97._20_4_ = fVar405;
            fVar406 = fVar220 * 0.0 * fStack_868;
            auVar97._24_4_ = fVar406;
            auVar97._28_4_ = fVar366;
            auVar43 = vsubps_avx(local_7c0,auVar95);
            auVar409._0_4_ = fVar221 + auVar170._0_4_;
            auVar409._4_4_ = fVar238 + auVar170._4_4_;
            auVar409._8_4_ = fVar240 + auVar170._8_4_;
            auVar409._12_4_ = fVar242 + auVar170._12_4_;
            auVar409._16_4_ = fVar404 + auVar170._16_4_;
            auVar409._20_4_ = fVar405 + auVar170._20_4_;
            auVar409._24_4_ = fVar406 + auVar170._24_4_;
            auVar409._28_4_ = fVar366 + auVar170._28_4_;
            fVar221 = auVar323._0_4_ * fVar292 * fVar239;
            fVar239 = auVar323._4_4_ * fVar332 * fVar243;
            auVar98._4_4_ = fVar239;
            auVar98._0_4_ = fVar221;
            fVar238 = auVar323._8_4_ * fVar364 * fVar250;
            auVar98._8_4_ = fVar238;
            fVar243 = auVar323._12_4_ * fVar334 * fVar268;
            auVar98._12_4_ = fVar243;
            fVar240 = auVar323._16_4_ * fVar365 * fVar271;
            auVar98._16_4_ = fVar240;
            fVar250 = auVar323._20_4_ * fVar336 * fVar274;
            auVar98._20_4_ = fVar250;
            fVar242 = auVar323._24_4_ * fVar200 * fVar287;
            auVar98._24_4_ = fVar242;
            auVar98._28_4_ = fStack_864;
            auVar163 = vsubps_avx(local_820,auVar96);
            auVar389._0_4_ = auVar303._0_4_ + fVar221;
            auVar389._4_4_ = auVar303._4_4_ + fVar239;
            auVar389._8_4_ = auVar303._8_4_ + fVar238;
            auVar389._12_4_ = auVar303._12_4_ + fVar243;
            auVar389._16_4_ = auVar303._16_4_ + fVar240;
            auVar389._20_4_ = auVar303._20_4_ + fVar250;
            auVar389._24_4_ = auVar303._24_4_ + fVar242;
            auVar389._28_4_ = auVar303._28_4_ + fStack_864;
            fVar221 = fVar292 * -fVar291 * auVar323._0_4_;
            fVar239 = fVar332 * -fVar293 * auVar323._4_4_;
            auVar99._4_4_ = fVar239;
            auVar99._0_4_ = fVar221;
            fVar238 = fVar364 * -fVar246 * auVar323._8_4_;
            auVar99._8_4_ = fVar238;
            fVar243 = fVar334 * -fVar333 * auVar323._12_4_;
            auVar99._12_4_ = fVar243;
            fVar240 = fVar365 * -fVar249 * auVar323._16_4_;
            auVar99._16_4_ = fVar240;
            fVar250 = fVar336 * -fVar335 * auVar323._20_4_;
            auVar99._20_4_ = fVar250;
            fVar242 = fVar200 * -fVar253 * auVar323._24_4_;
            auVar99._24_4_ = fVar242;
            auVar99._28_4_ = local_7c0._28_4_;
            auVar190 = vsubps_avx(auVar170,auVar97);
            auVar262._0_4_ = auVar283._0_4_ + fVar221;
            auVar262._4_4_ = auVar283._4_4_ + fVar239;
            auVar262._8_4_ = auVar283._8_4_ + fVar238;
            auVar262._12_4_ = auVar283._12_4_ + fVar243;
            auVar262._16_4_ = auVar283._16_4_ + fVar240;
            auVar262._20_4_ = auVar283._20_4_ + fVar250;
            auVar262._24_4_ = auVar283._24_4_ + fVar242;
            auVar262._28_4_ = auVar283._28_4_ + local_7c0._28_4_;
            fVar221 = fVar292 * 0.0 * auVar323._0_4_;
            fVar239 = fVar332 * 0.0 * auVar323._4_4_;
            auVar100._4_4_ = fVar239;
            auVar100._0_4_ = fVar221;
            fVar238 = fVar364 * 0.0 * auVar323._8_4_;
            auVar100._8_4_ = fVar238;
            fVar243 = fVar334 * 0.0 * auVar323._12_4_;
            auVar100._12_4_ = fVar243;
            fVar240 = fVar365 * 0.0 * auVar323._16_4_;
            auVar100._16_4_ = fVar240;
            fVar250 = fVar336 * 0.0 * auVar323._20_4_;
            auVar100._20_4_ = fVar250;
            fVar242 = fVar200 * 0.0 * auVar323._24_4_;
            auVar100._24_4_ = fVar242;
            auVar100._28_4_ = auVar170._28_4_;
            auVar161 = vsubps_avx(auVar303,auVar98);
            auVar141._4_4_ = fStack_79c;
            auVar141._0_4_ = local_7a0;
            auVar141._8_4_ = fStack_798;
            auVar141._12_4_ = fStack_794;
            auVar141._16_4_ = fStack_790;
            auVar141._20_4_ = fStack_78c;
            auVar141._24_4_ = fStack_788;
            auVar141._28_4_ = fStack_784;
            auVar343._0_4_ = local_7a0 + fVar221;
            auVar343._4_4_ = fStack_79c + fVar239;
            auVar343._8_4_ = fStack_798 + fVar238;
            auVar343._12_4_ = fStack_794 + fVar243;
            auVar343._16_4_ = fStack_790 + fVar240;
            auVar343._20_4_ = fStack_78c + fVar250;
            auVar343._24_4_ = fStack_788 + fVar242;
            auVar343._28_4_ = fStack_784 + auVar170._28_4_;
            auVar39 = vsubps_avx(auVar283,auVar99);
            auVar40 = vsubps_avx(auVar141,auVar100);
            auVar41 = vsubps_avx(auVar262,auVar163);
            auVar42 = vsubps_avx(auVar343,auVar190);
            auVar101._4_4_ = auVar190._4_4_ * auVar41._4_4_;
            auVar101._0_4_ = auVar190._0_4_ * auVar41._0_4_;
            auVar101._8_4_ = auVar190._8_4_ * auVar41._8_4_;
            auVar101._12_4_ = auVar190._12_4_ * auVar41._12_4_;
            auVar101._16_4_ = auVar190._16_4_ * auVar41._16_4_;
            auVar101._20_4_ = auVar190._20_4_ * auVar41._20_4_;
            auVar101._24_4_ = auVar190._24_4_ * auVar41._24_4_;
            auVar101._28_4_ = auVar383._28_4_;
            auVar102._4_4_ = auVar163._4_4_ * auVar42._4_4_;
            auVar102._0_4_ = auVar163._0_4_ * auVar42._0_4_;
            auVar102._8_4_ = auVar163._8_4_ * auVar42._8_4_;
            auVar102._12_4_ = auVar163._12_4_ * auVar42._12_4_;
            auVar102._16_4_ = auVar163._16_4_ * auVar42._16_4_;
            auVar102._20_4_ = auVar163._20_4_ * auVar42._20_4_;
            auVar102._24_4_ = auVar163._24_4_ * auVar42._24_4_;
            auVar102._28_4_ = fStack_784;
            auVar45 = vsubps_avx(auVar102,auVar101);
            auVar103._4_4_ = auVar43._4_4_ * auVar42._4_4_;
            auVar103._0_4_ = auVar43._0_4_ * auVar42._0_4_;
            auVar103._8_4_ = auVar43._8_4_ * auVar42._8_4_;
            auVar103._12_4_ = auVar43._12_4_ * auVar42._12_4_;
            auVar103._16_4_ = auVar43._16_4_ * auVar42._16_4_;
            auVar103._20_4_ = auVar43._20_4_ * auVar42._20_4_;
            auVar103._24_4_ = auVar43._24_4_ * auVar42._24_4_;
            auVar103._28_4_ = auVar42._28_4_;
            auVar42 = vsubps_avx(auVar389,auVar43);
            auVar104._4_4_ = auVar190._4_4_ * auVar42._4_4_;
            auVar104._0_4_ = auVar190._0_4_ * auVar42._0_4_;
            auVar104._8_4_ = auVar190._8_4_ * auVar42._8_4_;
            auVar104._12_4_ = auVar190._12_4_ * auVar42._12_4_;
            auVar104._16_4_ = auVar190._16_4_ * auVar42._16_4_;
            auVar104._20_4_ = auVar190._20_4_ * auVar42._20_4_;
            auVar104._24_4_ = auVar190._24_4_ * auVar42._24_4_;
            auVar104._28_4_ = auVar38._28_4_;
            auVar46 = vsubps_avx(auVar104,auVar103);
            auVar105._4_4_ = auVar163._4_4_ * auVar42._4_4_;
            auVar105._0_4_ = auVar163._0_4_ * auVar42._0_4_;
            auVar105._8_4_ = auVar163._8_4_ * auVar42._8_4_;
            auVar105._12_4_ = auVar163._12_4_ * auVar42._12_4_;
            auVar105._16_4_ = auVar163._16_4_ * auVar42._16_4_;
            auVar105._20_4_ = auVar163._20_4_ * auVar42._20_4_;
            auVar105._24_4_ = auVar163._24_4_ * auVar42._24_4_;
            auVar105._28_4_ = auVar38._28_4_;
            auVar106._4_4_ = auVar43._4_4_ * auVar41._4_4_;
            auVar106._0_4_ = auVar43._0_4_ * auVar41._0_4_;
            auVar106._8_4_ = auVar43._8_4_ * auVar41._8_4_;
            auVar106._12_4_ = auVar43._12_4_ * auVar41._12_4_;
            auVar106._16_4_ = auVar43._16_4_ * auVar41._16_4_;
            auVar106._20_4_ = auVar43._20_4_ * auVar41._20_4_;
            auVar106._24_4_ = auVar43._24_4_ * auVar41._24_4_;
            auVar106._28_4_ = auVar41._28_4_;
            auVar38 = vsubps_avx(auVar106,auVar105);
            auVar196._0_4_ = auVar45._0_4_ * 0.0 + auVar38._0_4_ + auVar46._0_4_ * 0.0;
            auVar196._4_4_ = auVar45._4_4_ * 0.0 + auVar38._4_4_ + auVar46._4_4_ * 0.0;
            auVar196._8_4_ = auVar45._8_4_ * 0.0 + auVar38._8_4_ + auVar46._8_4_ * 0.0;
            auVar196._12_4_ = auVar45._12_4_ * 0.0 + auVar38._12_4_ + auVar46._12_4_ * 0.0;
            auVar196._16_4_ = auVar45._16_4_ * 0.0 + auVar38._16_4_ + auVar46._16_4_ * 0.0;
            auVar196._20_4_ = auVar45._20_4_ * 0.0 + auVar38._20_4_ + auVar46._20_4_ * 0.0;
            auVar196._24_4_ = auVar45._24_4_ * 0.0 + auVar38._24_4_ + auVar46._24_4_ * 0.0;
            auVar196._28_4_ = auVar45._28_4_ + auVar38._28_4_ + auVar46._28_4_;
            auVar162 = vcmpps_avx(auVar196,ZEXT832(0) << 0x20,2);
            auVar161 = vblendvps_avx(auVar161,_local_760,auVar162);
            auVar237 = ZEXT3264(auVar161);
            auVar138._4_4_ = local_820._4_4_ + fVar272;
            auVar138._0_4_ = local_820._0_4_ + fVar270;
            auVar138._8_4_ = local_820._8_4_ + fVar285;
            auVar138._12_4_ = local_820._12_4_ + fVar289;
            auVar138._16_4_ = fStack_830;
            auVar138._20_4_ = fStack_82c;
            auVar138._24_4_ = fStack_828;
            auVar138._28_4_ = fStack_824;
            auVar38 = vblendvps_avx(auVar39,auVar138,auVar162);
            auVar39 = vblendvps_avx(auVar40,auVar409,auVar162);
            auVar40 = vblendvps_avx(auVar43,auVar389,auVar162);
            auVar41 = vblendvps_avx(auVar163,auVar262,auVar162);
            auVar42 = vblendvps_avx(auVar190,auVar343,auVar162);
            auVar43 = vblendvps_avx(auVar389,auVar43,auVar162);
            auVar45 = vblendvps_avx(auVar262,auVar163,auVar162);
            auVar46 = vblendvps_avx(auVar343,auVar190,auVar162);
            local_820 = vandps_avx(auVar37,auVar261);
            auVar43 = vsubps_avx(auVar43,auVar161);
            auVar191 = vsubps_avx(auVar45,auVar38);
            auVar46 = vsubps_avx(auVar46,auVar39);
            auVar192 = vsubps_avx(auVar38,auVar41);
            fVar221 = auVar191._0_4_;
            fVar306 = auVar39._0_4_;
            fVar268 = auVar191._4_4_;
            fVar308 = auVar39._4_4_;
            auVar107._4_4_ = fVar308 * fVar268;
            auVar107._0_4_ = fVar306 * fVar221;
            fVar289 = auVar191._8_4_;
            fVar295 = auVar39._8_4_;
            auVar107._8_4_ = fVar295 * fVar289;
            fVar333 = auVar191._12_4_;
            fVar173 = auVar39._12_4_;
            auVar107._12_4_ = fVar173 * fVar333;
            fVar200 = auVar191._16_4_;
            fVar175 = auVar39._16_4_;
            auVar107._16_4_ = fVar175 * fVar200;
            fVar220 = auVar191._20_4_;
            fVar177 = auVar39._20_4_;
            auVar107._20_4_ = fVar177 * fVar220;
            fVar252 = auVar191._24_4_;
            fVar310 = auVar39._24_4_;
            auVar107._24_4_ = fVar310 * fVar252;
            auVar107._28_4_ = auVar45._28_4_;
            fVar239 = auVar38._0_4_;
            fVar311 = auVar46._0_4_;
            fVar270 = auVar38._4_4_;
            fVar312 = auVar46._4_4_;
            auVar108._4_4_ = fVar312 * fVar270;
            auVar108._0_4_ = fVar311 * fVar239;
            fVar291 = auVar38._8_4_;
            fVar313 = auVar46._8_4_;
            auVar108._8_4_ = fVar313 * fVar291;
            fVar334 = auVar38._12_4_;
            fVar314 = auVar46._12_4_;
            auVar108._12_4_ = fVar314 * fVar334;
            fVar404 = auVar38._16_4_;
            fVar202 = auVar46._16_4_;
            auVar108._16_4_ = fVar202 * fVar404;
            fVar222 = auVar38._20_4_;
            fVar214 = auVar46._20_4_;
            auVar108._20_4_ = fVar214 * fVar222;
            fVar366 = auVar38._24_4_;
            fVar215 = auVar46._24_4_;
            uVar324 = auVar163._28_4_;
            auVar108._24_4_ = fVar215 * fVar366;
            auVar108._28_4_ = uVar324;
            auVar45 = vsubps_avx(auVar108,auVar107);
            fVar238 = auVar161._0_4_;
            fVar271 = auVar161._4_4_;
            auVar109._4_4_ = fVar312 * fVar271;
            auVar109._0_4_ = fVar311 * fVar238;
            fVar292 = auVar161._8_4_;
            auVar109._8_4_ = fVar313 * fVar292;
            fVar249 = auVar161._12_4_;
            auVar109._12_4_ = fVar314 * fVar249;
            fVar405 = auVar161._16_4_;
            auVar109._16_4_ = fVar202 * fVar405;
            fVar273 = auVar161._20_4_;
            auVar109._20_4_ = fVar214 * fVar273;
            fVar373 = auVar161._24_4_;
            auVar109._24_4_ = fVar215 * fVar373;
            auVar109._28_4_ = uVar324;
            fVar243 = auVar43._0_4_;
            fVar272 = auVar43._4_4_;
            auVar110._4_4_ = fVar308 * fVar272;
            auVar110._0_4_ = fVar306 * fVar243;
            fVar293 = auVar43._8_4_;
            auVar110._8_4_ = fVar295 * fVar293;
            fVar365 = auVar43._12_4_;
            auVar110._12_4_ = fVar173 * fVar365;
            fVar406 = auVar43._16_4_;
            auVar110._16_4_ = fVar175 * fVar406;
            fVar241 = auVar43._20_4_;
            auVar110._20_4_ = fVar177 * fVar241;
            fVar374 = auVar43._24_4_;
            auVar110._24_4_ = fVar310 * fVar374;
            auVar110._28_4_ = auVar389._28_4_;
            auVar163 = vsubps_avx(auVar110,auVar109);
            auVar111._4_4_ = fVar270 * fVar272;
            auVar111._0_4_ = fVar239 * fVar243;
            auVar111._8_4_ = fVar291 * fVar293;
            auVar111._12_4_ = fVar334 * fVar365;
            auVar111._16_4_ = fVar404 * fVar406;
            auVar111._20_4_ = fVar222 * fVar241;
            auVar111._24_4_ = fVar366 * fVar374;
            auVar111._28_4_ = uVar324;
            auVar112._4_4_ = fVar271 * fVar268;
            auVar112._0_4_ = fVar238 * fVar221;
            auVar112._8_4_ = fVar292 * fVar289;
            auVar112._12_4_ = fVar249 * fVar333;
            auVar112._16_4_ = fVar405 * fVar200;
            auVar112._20_4_ = fVar273 * fVar220;
            auVar112._24_4_ = fVar373 * fVar252;
            auVar112._28_4_ = auVar190._28_4_;
            auVar190 = vsubps_avx(auVar112,auVar111);
            auVar210 = vsubps_avx(auVar39,auVar42);
            fVar250 = auVar190._28_4_ + auVar163._28_4_;
            auVar357._0_4_ = auVar190._0_4_ + auVar163._0_4_ * 0.0 + auVar45._0_4_ * 0.0;
            auVar357._4_4_ = auVar190._4_4_ + auVar163._4_4_ * 0.0 + auVar45._4_4_ * 0.0;
            auVar357._8_4_ = auVar190._8_4_ + auVar163._8_4_ * 0.0 + auVar45._8_4_ * 0.0;
            auVar357._12_4_ = auVar190._12_4_ + auVar163._12_4_ * 0.0 + auVar45._12_4_ * 0.0;
            auVar357._16_4_ = auVar190._16_4_ + auVar163._16_4_ * 0.0 + auVar45._16_4_ * 0.0;
            auVar357._20_4_ = auVar190._20_4_ + auVar163._20_4_ * 0.0 + auVar45._20_4_ * 0.0;
            auVar357._24_4_ = auVar190._24_4_ + auVar163._24_4_ * 0.0 + auVar45._24_4_ * 0.0;
            auVar357._28_4_ = fVar250 + auVar45._28_4_;
            fVar240 = auVar192._0_4_;
            fVar274 = auVar192._4_4_;
            auVar113._4_4_ = auVar42._4_4_ * fVar274;
            auVar113._0_4_ = auVar42._0_4_ * fVar240;
            fVar332 = auVar192._8_4_;
            auVar113._8_4_ = auVar42._8_4_ * fVar332;
            fVar335 = auVar192._12_4_;
            auVar113._12_4_ = auVar42._12_4_ * fVar335;
            fVar179 = auVar192._16_4_;
            auVar113._16_4_ = auVar42._16_4_ * fVar179;
            fVar182 = auVar192._20_4_;
            auVar113._20_4_ = auVar42._20_4_ * fVar182;
            fVar375 = auVar192._24_4_;
            auVar113._24_4_ = auVar42._24_4_ * fVar375;
            auVar113._28_4_ = fVar250;
            fVar250 = auVar210._0_4_;
            fVar285 = auVar210._4_4_;
            auVar114._4_4_ = auVar41._4_4_ * fVar285;
            auVar114._0_4_ = auVar41._0_4_ * fVar250;
            fVar246 = auVar210._8_4_;
            auVar114._8_4_ = auVar41._8_4_ * fVar246;
            fVar336 = auVar210._12_4_;
            auVar114._12_4_ = auVar41._12_4_ * fVar336;
            fVar180 = auVar210._16_4_;
            auVar114._16_4_ = auVar41._16_4_ * fVar180;
            fVar245 = auVar210._20_4_;
            auVar114._20_4_ = auVar41._20_4_ * fVar245;
            fVar201 = auVar210._24_4_;
            auVar114._24_4_ = auVar41._24_4_ * fVar201;
            auVar114._28_4_ = auVar190._28_4_;
            auVar163 = vsubps_avx(auVar114,auVar113);
            auVar190 = vsubps_avx(auVar161,auVar40);
            fVar242 = auVar190._0_4_;
            fVar287 = auVar190._4_4_;
            auVar115._4_4_ = auVar42._4_4_ * fVar287;
            auVar115._0_4_ = auVar42._0_4_ * fVar242;
            fVar364 = auVar190._8_4_;
            auVar115._8_4_ = auVar42._8_4_ * fVar364;
            fVar253 = auVar190._12_4_;
            auVar115._12_4_ = auVar42._12_4_ * fVar253;
            fVar181 = auVar190._16_4_;
            auVar115._16_4_ = auVar42._16_4_ * fVar181;
            fVar248 = auVar190._20_4_;
            auVar115._20_4_ = auVar42._20_4_ * fVar248;
            fVar297 = auVar190._24_4_;
            auVar115._24_4_ = auVar42._24_4_ * fVar297;
            auVar115._28_4_ = auVar42._28_4_;
            auVar116._4_4_ = fVar285 * auVar40._4_4_;
            auVar116._0_4_ = fVar250 * auVar40._0_4_;
            auVar116._8_4_ = fVar246 * auVar40._8_4_;
            auVar116._12_4_ = fVar336 * auVar40._12_4_;
            auVar116._16_4_ = fVar180 * auVar40._16_4_;
            auVar116._20_4_ = fVar245 * auVar40._20_4_;
            auVar116._24_4_ = fVar201 * auVar40._24_4_;
            auVar116._28_4_ = auVar45._28_4_;
            auVar42 = vsubps_avx(auVar115,auVar116);
            auVar117._4_4_ = auVar41._4_4_ * fVar287;
            auVar117._0_4_ = auVar41._0_4_ * fVar242;
            auVar117._8_4_ = auVar41._8_4_ * fVar364;
            auVar117._12_4_ = auVar41._12_4_ * fVar253;
            auVar117._16_4_ = auVar41._16_4_ * fVar181;
            auVar117._20_4_ = auVar41._20_4_ * fVar248;
            auVar117._24_4_ = auVar41._24_4_ * fVar297;
            auVar117._28_4_ = auVar41._28_4_;
            auVar118._4_4_ = fVar274 * auVar40._4_4_;
            auVar118._0_4_ = fVar240 * auVar40._0_4_;
            auVar118._8_4_ = fVar332 * auVar40._8_4_;
            auVar118._12_4_ = fVar335 * auVar40._12_4_;
            auVar118._16_4_ = fVar179 * auVar40._16_4_;
            auVar118._20_4_ = fVar182 * auVar40._20_4_;
            auVar118._24_4_ = fVar375 * auVar40._24_4_;
            auVar118._28_4_ = auVar40._28_4_;
            auVar40 = vsubps_avx(auVar118,auVar117);
            auVar171._0_4_ = auVar163._0_4_ * 0.0 + auVar40._0_4_ + auVar42._0_4_ * 0.0;
            auVar171._4_4_ = auVar163._4_4_ * 0.0 + auVar40._4_4_ + auVar42._4_4_ * 0.0;
            auVar171._8_4_ = auVar163._8_4_ * 0.0 + auVar40._8_4_ + auVar42._8_4_ * 0.0;
            auVar171._12_4_ = auVar163._12_4_ * 0.0 + auVar40._12_4_ + auVar42._12_4_ * 0.0;
            auVar171._16_4_ = auVar163._16_4_ * 0.0 + auVar40._16_4_ + auVar42._16_4_ * 0.0;
            auVar171._20_4_ = auVar163._20_4_ * 0.0 + auVar40._20_4_ + auVar42._20_4_ * 0.0;
            auVar171._24_4_ = auVar163._24_4_ * 0.0 + auVar40._24_4_ + auVar42._24_4_ * 0.0;
            auVar171._28_4_ = auVar42._28_4_ + auVar40._28_4_ + auVar42._28_4_;
            auVar172 = ZEXT3264(auVar171);
            auVar40 = vmaxps_avx(auVar357,auVar171);
            auVar40 = vcmpps_avx(auVar40,ZEXT432(0) << 0x20,2);
            auVar41 = local_820 & auVar40;
            if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar41 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar41 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar41 >> 0x7f,0) == '\0') &&
                  (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar41 >> 0xbf,0) == '\0') &&
                (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar41[0x1f]) {
LAB_01294269:
              auVar198 = ZEXT3264(CONCAT824(uStack_548,
                                            CONCAT816(uStack_550,CONCAT88(uStack_558,local_560))));
            }
            else {
              auVar41 = vandps_avx(auVar40,local_820);
              auVar119._4_4_ = fVar285 * fVar268;
              auVar119._0_4_ = fVar250 * fVar221;
              auVar119._8_4_ = fVar246 * fVar289;
              auVar119._12_4_ = fVar336 * fVar333;
              auVar119._16_4_ = fVar180 * fVar200;
              auVar119._20_4_ = fVar245 * fVar220;
              auVar119._24_4_ = fVar201 * fVar252;
              auVar119._28_4_ = local_820._28_4_;
              auVar120._4_4_ = fVar274 * fVar312;
              auVar120._0_4_ = fVar240 * fVar311;
              auVar120._8_4_ = fVar332 * fVar313;
              auVar120._12_4_ = fVar335 * fVar314;
              auVar120._16_4_ = fVar179 * fVar202;
              auVar120._20_4_ = fVar182 * fVar214;
              auVar120._24_4_ = fVar375 * fVar215;
              auVar120._28_4_ = auVar40._28_4_;
              auVar42 = vsubps_avx(auVar120,auVar119);
              auVar121._4_4_ = fVar287 * fVar312;
              auVar121._0_4_ = fVar242 * fVar311;
              auVar121._8_4_ = fVar364 * fVar313;
              auVar121._12_4_ = fVar253 * fVar314;
              auVar121._16_4_ = fVar181 * fVar202;
              auVar121._20_4_ = fVar248 * fVar214;
              auVar121._24_4_ = fVar297 * fVar215;
              auVar121._28_4_ = auVar46._28_4_;
              auVar122._4_4_ = fVar285 * fVar272;
              auVar122._0_4_ = fVar250 * fVar243;
              auVar122._8_4_ = fVar246 * fVar293;
              auVar122._12_4_ = fVar336 * fVar365;
              auVar122._16_4_ = fVar180 * fVar406;
              auVar122._20_4_ = fVar245 * fVar241;
              auVar122._24_4_ = fVar201 * fVar374;
              auVar122._28_4_ = auVar210._28_4_;
              auVar45 = vsubps_avx(auVar122,auVar121);
              auVar123._4_4_ = fVar274 * fVar272;
              auVar123._0_4_ = fVar240 * fVar243;
              auVar123._8_4_ = fVar332 * fVar293;
              auVar123._12_4_ = fVar335 * fVar365;
              auVar123._16_4_ = fVar179 * fVar406;
              auVar123._20_4_ = fVar182 * fVar241;
              auVar123._24_4_ = fVar375 * fVar374;
              auVar123._28_4_ = auVar43._28_4_;
              auVar124._4_4_ = fVar287 * fVar268;
              auVar124._0_4_ = fVar242 * fVar221;
              auVar124._8_4_ = fVar364 * fVar289;
              auVar124._12_4_ = fVar253 * fVar333;
              auVar124._16_4_ = fVar181 * fVar200;
              auVar124._20_4_ = fVar248 * fVar220;
              auVar124._24_4_ = fVar297 * fVar252;
              auVar124._28_4_ = auVar191._28_4_;
              auVar46 = vsubps_avx(auVar124,auVar123);
              auVar197._0_4_ = auVar42._0_4_ * 0.0 + auVar46._0_4_ + auVar45._0_4_ * 0.0;
              auVar197._4_4_ = auVar42._4_4_ * 0.0 + auVar46._4_4_ + auVar45._4_4_ * 0.0;
              auVar197._8_4_ = auVar42._8_4_ * 0.0 + auVar46._8_4_ + auVar45._8_4_ * 0.0;
              auVar197._12_4_ = auVar42._12_4_ * 0.0 + auVar46._12_4_ + auVar45._12_4_ * 0.0;
              auVar197._16_4_ = auVar42._16_4_ * 0.0 + auVar46._16_4_ + auVar45._16_4_ * 0.0;
              auVar197._20_4_ = auVar42._20_4_ * 0.0 + auVar46._20_4_ + auVar45._20_4_ * 0.0;
              auVar197._24_4_ = auVar42._24_4_ * 0.0 + auVar46._24_4_ + auVar45._24_4_ * 0.0;
              auVar197._28_4_ = auVar191._28_4_ + auVar46._28_4_ + auVar43._28_4_;
              auVar40 = vrcpps_avx(auVar197);
              fVar221 = auVar40._0_4_;
              fVar243 = auVar40._4_4_;
              auVar125._4_4_ = auVar197._4_4_ * fVar243;
              auVar125._0_4_ = auVar197._0_4_ * fVar221;
              fVar240 = auVar40._8_4_;
              auVar125._8_4_ = auVar197._8_4_ * fVar240;
              fVar250 = auVar40._12_4_;
              auVar125._12_4_ = auVar197._12_4_ * fVar250;
              fVar242 = auVar40._16_4_;
              auVar125._16_4_ = auVar197._16_4_ * fVar242;
              fVar268 = auVar40._20_4_;
              auVar125._20_4_ = auVar197._20_4_ * fVar268;
              fVar272 = auVar40._24_4_;
              auVar125._24_4_ = auVar197._24_4_ * fVar272;
              auVar125._28_4_ = auVar210._28_4_;
              auVar384._8_4_ = 0x3f800000;
              auVar384._0_8_ = &DAT_3f8000003f800000;
              auVar384._12_4_ = 0x3f800000;
              auVar384._16_4_ = 0x3f800000;
              auVar384._20_4_ = 0x3f800000;
              auVar384._24_4_ = 0x3f800000;
              auVar384._28_4_ = 0x3f800000;
              auVar40 = vsubps_avx(auVar384,auVar125);
              fVar221 = auVar40._0_4_ * fVar221 + fVar221;
              fVar243 = auVar40._4_4_ * fVar243 + fVar243;
              fVar240 = auVar40._8_4_ * fVar240 + fVar240;
              fVar250 = auVar40._12_4_ * fVar250 + fVar250;
              fVar242 = auVar40._16_4_ * fVar242 + fVar242;
              fVar268 = auVar40._20_4_ * fVar268 + fVar268;
              fVar272 = auVar40._24_4_ * fVar272 + fVar272;
              auVar126._4_4_ =
                   (fVar271 * auVar42._4_4_ + auVar45._4_4_ * fVar270 + auVar46._4_4_ * fVar308) *
                   fVar243;
              auVar126._0_4_ =
                   (fVar238 * auVar42._0_4_ + auVar45._0_4_ * fVar239 + auVar46._0_4_ * fVar306) *
                   fVar221;
              auVar126._8_4_ =
                   (fVar292 * auVar42._8_4_ + auVar45._8_4_ * fVar291 + auVar46._8_4_ * fVar295) *
                   fVar240;
              auVar126._12_4_ =
                   (fVar249 * auVar42._12_4_ + auVar45._12_4_ * fVar334 + auVar46._12_4_ * fVar173)
                   * fVar250;
              auVar126._16_4_ =
                   (fVar405 * auVar42._16_4_ + auVar45._16_4_ * fVar404 + auVar46._16_4_ * fVar175)
                   * fVar242;
              auVar126._20_4_ =
                   (fVar273 * auVar42._20_4_ + auVar45._20_4_ * fVar222 + auVar46._20_4_ * fVar177)
                   * fVar268;
              auVar126._24_4_ =
                   (fVar373 * auVar42._24_4_ + auVar45._24_4_ * fVar366 + auVar46._24_4_ * fVar310)
                   * fVar272;
              auVar126._28_4_ = auVar161._28_4_ + auVar38._28_4_ + auVar39._28_4_;
              auVar237 = ZEXT3264(auVar126);
              uVar324 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar263._4_4_ = uVar324;
              auVar263._0_4_ = uVar324;
              auVar263._8_4_ = uVar324;
              auVar263._12_4_ = uVar324;
              auVar263._16_4_ = uVar324;
              auVar263._20_4_ = uVar324;
              auVar263._24_4_ = uVar324;
              auVar263._28_4_ = uVar324;
              auVar161 = vcmpps_avx(local_360,auVar126,2);
              auVar38 = vcmpps_avx(auVar126,auVar263,2);
              auVar161 = vandps_avx(auVar161,auVar38);
              auVar38 = auVar41 & auVar161;
              if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar38 >> 0x7f,0) == '\0') &&
                    (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar38 >> 0xbf,0) == '\0') &&
                  (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar38[0x1f]) goto LAB_01294269;
              auVar161 = vandps_avx(auVar41,auVar161);
              auVar38 = vcmpps_avx(ZEXT432(0) << 0x20,auVar197,4);
              auVar39 = auVar161 & auVar38;
              auVar198 = ZEXT3264(CONCAT824(uStack_548,
                                            CONCAT816(uStack_550,CONCAT88(uStack_558,local_560))));
              if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar39 >> 0x7f,0) != '\0') ||
                    (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar39 >> 0xbf,0) != '\0') ||
                  (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar39[0x1f] < '\0') {
                auVar161 = vandps_avx(auVar38,auVar161);
                auVar198 = ZEXT3264(auVar161);
                auVar127._4_4_ = auVar357._4_4_ * fVar243;
                auVar127._0_4_ = auVar357._0_4_ * fVar221;
                auVar127._8_4_ = auVar357._8_4_ * fVar240;
                auVar127._12_4_ = auVar357._12_4_ * fVar250;
                auVar127._16_4_ = auVar357._16_4_ * fVar242;
                auVar127._20_4_ = auVar357._20_4_ * fVar268;
                auVar127._24_4_ = auVar357._24_4_ * fVar272;
                auVar127._28_4_ = local_4c0._28_4_;
                auVar128._4_4_ = auVar171._4_4_ * fVar243;
                auVar128._0_4_ = auVar171._0_4_ * fVar221;
                auVar128._8_4_ = auVar171._8_4_ * fVar240;
                auVar128._12_4_ = auVar171._12_4_ * fVar250;
                auVar128._16_4_ = auVar171._16_4_ * fVar242;
                auVar128._20_4_ = auVar171._20_4_ * fVar268;
                auVar128._24_4_ = auVar171._24_4_ * fVar272;
                auVar128._28_4_ = auVar171._28_4_;
                auVar304._8_4_ = 0x3f800000;
                auVar304._0_8_ = &DAT_3f8000003f800000;
                auVar304._12_4_ = 0x3f800000;
                auVar304._16_4_ = 0x3f800000;
                auVar304._20_4_ = 0x3f800000;
                auVar304._24_4_ = 0x3f800000;
                auVar304._28_4_ = 0x3f800000;
                auVar161 = vsubps_avx(auVar304,auVar127);
                local_4a0 = vblendvps_avx(auVar161,auVar127,auVar162);
                auVar161 = vsubps_avx(auVar304,auVar128);
                _local_3a0 = vblendvps_avx(auVar161,auVar128,auVar162);
                auVar172 = ZEXT3264(_local_3a0);
                local_4c0 = auVar126;
              }
            }
            auVar161 = auVar198._0_32_;
            auVar397 = ZEXT3264(_local_680);
            fVar366 = (float)local_720._0_4_;
            fVar373 = (float)local_720._4_4_;
            fVar374 = fStack_718;
            fVar375 = fStack_714;
            fVar221 = fStack_710;
            fVar239 = fStack_70c;
            fVar238 = fStack_708;
            fVar243 = fStack_704;
            _local_800 = auVar323;
            local_480 = auVar282;
            if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar161 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar161 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar161 >> 0x7f,0) != '\0') ||
                  (auVar198 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar161 >> 0xbf,0) != '\0') ||
                (auVar198 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar198[0x1f] < '\0') {
              auVar38 = vsubps_avx(auVar323,_local_880);
              local_880._0_4_ = (float)local_880._0_4_ + local_4a0._0_4_ * auVar38._0_4_;
              local_880._4_4_ = (float)local_880._4_4_ + local_4a0._4_4_ * auVar38._4_4_;
              fStack_878 = fStack_878 + local_4a0._8_4_ * auVar38._8_4_;
              fStack_874 = fStack_874 + local_4a0._12_4_ * auVar38._12_4_;
              fStack_870 = fStack_870 + local_4a0._16_4_ * auVar38._16_4_;
              fStack_86c = fStack_86c + local_4a0._20_4_ * auVar38._20_4_;
              fStack_868 = fStack_868 + local_4a0._24_4_ * auVar38._24_4_;
              fStack_864 = fStack_864 + auVar38._28_4_;
              fVar240 = *(float *)((long)local_6b8->ray_space + k * 4 + -0x10);
              auVar129._4_4_ = ((float)local_880._4_4_ + (float)local_880._4_4_) * fVar240;
              auVar129._0_4_ = ((float)local_880._0_4_ + (float)local_880._0_4_) * fVar240;
              auVar129._8_4_ = (fStack_878 + fStack_878) * fVar240;
              auVar129._12_4_ = (fStack_874 + fStack_874) * fVar240;
              auVar129._16_4_ = (fStack_870 + fStack_870) * fVar240;
              auVar129._20_4_ = (fStack_86c + fStack_86c) * fVar240;
              auVar129._24_4_ = (fStack_868 + fStack_868) * fVar240;
              auVar129._28_4_ = fStack_864 + fStack_864;
              auVar38 = vcmpps_avx(local_4c0,auVar129,6);
              auVar172 = ZEXT3264(auVar38);
              auVar282 = auVar161 & auVar38;
              if ((((((((auVar282 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar282 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar282 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar282 >> 0x7f,0) != '\0') ||
                    (auVar282 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar282 >> 0xbf,0) != '\0') ||
                  (auVar282 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar282[0x1f] < '\0') {
                local_200 = vandps_avx(auVar38,auVar161);
                auVar172 = ZEXT3264(local_200);
                auVar186._0_8_ =
                     CONCAT44((float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0,
                              (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0);
                auVar186._8_4_ = (float)uStack_398 + (float)uStack_398 + -1.0;
                auVar186._12_4_ = uStack_398._4_4_ + uStack_398._4_4_ + -1.0;
                auVar189._16_4_ = (float)uStack_390 + (float)uStack_390 + -1.0;
                auVar189._0_16_ = auVar186;
                auVar189._20_4_ = uStack_390._4_4_ + uStack_390._4_4_ + -1.0;
                fStack_288 = (float)uStack_388 + (float)uStack_388 + -1.0;
                _local_2a0 = auVar189;
                fStack_284 = uStack_388._4_4_ + uStack_388._4_4_ + -1.0;
                auVar198 = ZEXT3264(_local_2a0);
                local_250 = local_6d0;
                uStack_248 = uStack_6c8;
                local_240 = local_4d0._0_8_;
                uStack_238 = local_4d0._8_8_;
                local_230 = local_4e0._0_8_;
                uStack_228 = local_4e0._8_8_;
                local_220 = local_4f0._0_8_;
                uStack_218 = local_4f0._8_8_;
                local_7e0._0_8_ = (context->scene->geometries).items[local_848].ptr;
                _local_3a0 = _local_2a0;
                if ((((Geometry *)local_7e0._0_8_)->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  pRVar148 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar148 = context->args;
                  if ((pRVar148->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar148 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar148 >> 8),1),
                     ((Geometry *)local_7e0._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_7e0._8_24_ = auVar303._8_24_;
                    auVar204 = vshufps_avx(ZEXT416((uint)(float)(int)local_260),
                                           ZEXT416((uint)(float)(int)local_260),0);
                    local_1e0[0] = (auVar204._0_4_ + local_4a0._0_4_ + 0.0) * (float)local_100._0_4_
                    ;
                    local_1e0[1] = (auVar204._4_4_ + local_4a0._4_4_ + 1.0) * (float)local_100._4_4_
                    ;
                    local_1e0[2] = (auVar204._8_4_ + local_4a0._8_4_ + 2.0) * fStack_f8;
                    local_1e0[3] = (auVar204._12_4_ + local_4a0._12_4_ + 3.0) * fStack_f4;
                    fStack_1d0 = (auVar204._0_4_ + local_4a0._16_4_ + 4.0) * fStack_f0;
                    fStack_1cc = (auVar204._4_4_ + local_4a0._20_4_ + 5.0) * fStack_ec;
                    fStack_1c8 = (auVar204._8_4_ + local_4a0._24_4_ + 6.0) * fStack_e8;
                    fStack_1c4 = auVar204._12_4_ + (float)local_4a0._28_4_ + 7.0;
                    uStack_398 = auVar186._8_8_;
                    uStack_390 = auVar189._16_8_;
                    uStack_388 = local_2a0._24_8_;
                    local_1c0 = auVar186._0_8_;
                    uStack_1b8 = uStack_398;
                    uStack_1b0 = uStack_390;
                    uStack_1a8 = uStack_388;
                    auVar198 = ZEXT3264(local_4c0);
                    local_1a0 = local_4c0;
                    iVar147 = vmovmskps_avx(local_200);
                    uVar149 = CONCAT44((int)((ulong)pRVar148 >> 0x20),iVar147);
                    local_800 = (undefined1  [8])0x0;
                    if (uVar149 != 0) {
                      for (; (uVar149 >> (long)local_800 & 1) == 0;
                          local_800 = (undefined1  [8])((long)local_800 + 1)) {
                      }
                    }
                    _auStack_7f8 = auVar323._8_24_;
                    local_820._0_8_ = uVar149;
                    local_740._4_28_ = auVar283._4_28_;
                    local_740._0_4_ = (int)CONCAT71((int7)(uVar149 >> 8),iVar147 != 0);
                    if (iVar147 != 0) {
                      _local_760 = local_4d0;
                      auStack_5d0 = auVar37._16_16_;
                      _local_5e0 = local_4e0;
                      _auStack_650 = auVar225;
                      _local_660 = local_4f0;
                      local_840 = (float)*local_6c0;
                      fStack_83c = (float)((ulong)*local_6c0 >> 0x20);
                      fStack_838 = (float)local_6c0[1];
                      fStack_834 = (float)((ulong)local_6c0[1] >> 0x20);
                      local_2c0 = local_4a0;
                      local_280 = local_4c0;
                      local_25c = uVar33;
                      do {
                        local_7c0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_400 = local_1e0[(long)local_800];
                        local_3f0 = *(undefined4 *)((long)&local_1c0 + (long)local_800 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_1a0 + (long)local_800 * 4);
                        fVar239 = 1.0 - local_400;
                        fVar221 = local_400 * 3.0;
                        auVar204 = ZEXT416((uint)((fVar239 * -2.0 * local_400 +
                                                  local_400 * local_400) * 0.5));
                        auVar204 = vshufps_avx(auVar204,auVar204,0);
                        auVar225 = ZEXT416((uint)(((fVar239 + fVar239) * (fVar221 + 2.0) +
                                                  fVar239 * fVar239 * -3.0) * 0.5));
                        auVar225 = vshufps_avx(auVar225,auVar225,0);
                        auVar226 = ZEXT416((uint)(((local_400 + local_400) * (fVar221 + -5.0) +
                                                  local_400 * fVar221) * 0.5));
                        auVar226 = vshufps_avx(auVar226,auVar226,0);
                        local_6b0.context = context->user;
                        auVar227 = ZEXT416((uint)((local_400 * (fVar239 + fVar239) -
                                                  fVar239 * fVar239) * 0.5));
                        auVar227 = vshufps_avx(auVar227,auVar227,0);
                        auVar205._0_4_ =
                             auVar227._0_4_ * (float)local_6d0._0_4_ +
                             auVar226._0_4_ * (float)local_760._0_4_ +
                             auVar204._0_4_ * (float)local_660._0_4_ +
                             auVar225._0_4_ * (float)local_5e0._0_4_;
                        auVar205._4_4_ =
                             auVar227._4_4_ * (float)local_6d0._4_4_ +
                             auVar226._4_4_ * (float)local_760._4_4_ +
                             auVar204._4_4_ * (float)local_660._4_4_ +
                             auVar225._4_4_ * (float)local_5e0._4_4_;
                        auVar205._8_4_ =
                             auVar227._8_4_ * (float)uStack_6c8 +
                             auVar226._8_4_ * (float)uStack_758 +
                             auVar204._8_4_ * (float)uStack_658 + auVar225._8_4_ * (float)uStack_5d8
                        ;
                        auVar205._12_4_ =
                             auVar227._12_4_ * uStack_6c8._4_4_ +
                             auVar226._12_4_ * uStack_758._4_4_ +
                             auVar204._12_4_ * uStack_658._4_4_ + auVar225._12_4_ * uStack_5d8._4_4_
                        ;
                        local_430 = (RTCHitN  [16])vshufps_avx(auVar205,auVar205,0);
                        local_420 = vshufps_avx(auVar205,auVar205,0x55);
                        auVar237 = ZEXT1664(local_420);
                        local_410 = vshufps_avx(auVar205,auVar205,0xaa);
                        local_3e0 = local_5f0._0_8_;
                        uStack_3d8 = local_5f0._8_8_;
                        local_3d0 = local_2d0._0_8_;
                        uStack_3c8 = local_2d0._8_8_;
                        vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                        uStack_3bc = (local_6b0.context)->instID[0];
                        local_3c0 = uStack_3bc;
                        uStack_3b8 = uStack_3bc;
                        uStack_3b4 = uStack_3bc;
                        uStack_3b0 = (local_6b0.context)->instPrimID[0];
                        uStack_3ac = uStack_3b0;
                        uStack_3a8 = uStack_3b0;
                        uStack_3a4 = uStack_3b0;
                        local_860 = CONCAT44(fStack_83c,local_840);
                        uStack_858 = CONCAT44(fStack_834,fStack_838);
                        local_6b0.valid = (int *)&local_860;
                        local_6b0.geometryUserPtr = *(void **)(local_7e0._0_8_ + 0x18);
                        local_6b0.hit = local_430;
                        local_6b0.N = 4;
                        local_6b0.ray = (RTCRayN *)ray;
                        fStack_3fc = local_400;
                        fStack_3f8 = local_400;
                        fStack_3f4 = local_400;
                        uStack_3ec = local_3f0;
                        uStack_3e8 = local_3f0;
                        uStack_3e4 = local_3f0;
                        if (*(code **)(local_7e0._0_8_ + 0x48) != (code *)0x0) {
                          auVar237 = ZEXT1664(local_420);
                          (**(code **)(local_7e0._0_8_ + 0x48))(&local_6b0);
                        }
                        auVar133._8_8_ = uStack_858;
                        auVar133._0_8_ = local_860;
                        if (auVar133 == (undefined1  [16])0x0) {
                          auVar204 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar204 = auVar204 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var36 = context->args->filter;
                          if ((p_Var36 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)(local_7e0._0_8_ + 0x3e) & 0x40) != 0)))) {
                            auVar237 = ZEXT1664(auVar237._0_16_);
                            (*p_Var36)(&local_6b0);
                          }
                          auVar134._8_8_ = uStack_858;
                          auVar134._0_8_ = local_860;
                          auVar225 = vpcmpeqd_avx((undefined1  [16])0x0,auVar134);
                          auVar204 = auVar225 ^ _DAT_01febe20;
                          auVar206._8_4_ = 0xff800000;
                          auVar206._0_8_ = 0xff800000ff800000;
                          auVar206._12_4_ = 0xff800000;
                          auVar225 = vblendvps_avx(auVar206,*(undefined1 (*) [16])
                                                             (local_6b0.ray + 0x80),auVar225);
                          *(undefined1 (*) [16])(local_6b0.ray + 0x80) = auVar225;
                        }
                        auVar172 = ZEXT1664(auVar204);
                        auVar187._8_8_ = 0x100000001;
                        auVar187._0_8_ = 0x100000001;
                        auVar198 = ZEXT1664(auVar187);
                        if ((auVar187 & auVar204) != (undefined1  [16])0x0) break;
                        auVar172 = ZEXT464((uint)local_7c0._0_4_);
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_7c0._0_4_;
                        uVar149 = local_820._0_8_ ^ 1L << ((ulong)local_800 & 0x3f);
                        lVar157 = 0;
                        if (uVar149 != 0) {
                          for (; (uVar149 >> lVar157 & 1) == 0; lVar157 = lVar157 + 1) {
                          }
                        }
                        local_800 = (undefined1  [8])lVar157;
                        local_820._0_8_ = uVar149;
                        local_740._0_4_ = (int)CONCAT71((int7)(uVar149 >> 8),uVar149 != 0);
                      } while (uVar149 != 0);
                    }
                    pRVar148 = (RTCIntersectArguments *)(ulong)(local_740[0] & 1);
                    auVar397 = ZEXT3264(_local_680);
                    fVar350 = (float)local_640._0_4_;
                    fVar244 = (float)local_640._4_4_;
                    fVar247 = fStack_638;
                    fVar251 = fStack_634;
                    fVar254 = fStack_630;
                    fVar264 = fStack_62c;
                    fVar266 = fStack_628;
                    fVar366 = (float)local_720._0_4_;
                    fVar373 = (float)local_720._4_4_;
                    fVar374 = fStack_718;
                    fVar375 = fStack_714;
                    fVar221 = fStack_710;
                    fVar239 = fStack_70c;
                    fVar238 = fStack_708;
                    fVar243 = fStack_704;
                  }
                }
                bVar154 = (bool)(bVar154 | (byte)pRVar148);
              }
            }
          }
          lVar151 = lVar151 + 8;
          fVar201 = (float)local_700._0_4_;
          fVar297 = (float)local_700._4_4_;
          fVar306 = fStack_6f8;
          fVar308 = fStack_6f4;
          fVar240 = fStack_6f0;
          fVar250 = fStack_6ec;
          fVar242 = fStack_6e8;
        } while ((int)lVar151 < (int)uVar33);
      }
      if (bVar154 != false) {
        return local_88d;
      }
      uVar324 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar168._4_4_ = uVar324;
      auVar168._0_4_ = uVar324;
      auVar168._8_4_ = uVar324;
      auVar168._12_4_ = uVar324;
      auVar168._16_4_ = uVar324;
      auVar168._20_4_ = uVar324;
      auVar168._24_4_ = uVar324;
      auVar168._28_4_ = uVar324;
      auVar161 = vcmpps_avx(local_80,auVar168,2);
      uVar150 = vmovmskps_avx(auVar161);
      uVar146 = uVar146 & uVar146 + 0xff & uVar150;
      local_88d = uVar146 != 0;
    } while (local_88d);
  }
  return local_88d;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }